

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Primitive PVar23;
  Geometry *pGVar24;
  __int_type_conflict _Var25;
  long lVar26;
  long lVar27;
  long lVar28;
  RTCFilterFunctionN p_Var29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  bool bVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  bool bVar86;
  bool bVar87;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  uint uVar92;
  long lVar94;
  long lVar95;
  long lVar96;
  ulong uVar97;
  undefined1 auVar98 [8];
  float t1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar152;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar178;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar179;
  float fVar208;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar206;
  float fVar207;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar212;
  float fVar235;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar233;
  float fVar234;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar239;
  float fVar259;
  float fVar260;
  undefined1 auVar240 [16];
  float fVar261;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar258 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar268 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  vfloat4 b0;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar338;
  float fVar339;
  float fVar351;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar350;
  float fVar352;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  float fVar356;
  float fVar366;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  float fVar364;
  float fVar365;
  float in_register_0000151c;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar367;
  float fVar368;
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  float fVar375;
  float fVar376;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  float fVar377;
  float fVar378;
  undefined1 auVar374 [32];
  float fVar384;
  float fVar385;
  vfloat4 a0;
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  float in_register_0000159c;
  undefined1 auVar383 [32];
  float fVar386;
  float fVar394;
  float fVar395;
  undefined1 auVar387 [16];
  float fVar396;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  float in_register_000015dc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_4e9;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  int local_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 auStack_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 auStack_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 auStack_418 [16];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float fStack_3c0;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 auStack_3a8 [16];
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  ulong local_2e0;
  Precalculations *local_2d8;
  Primitive *local_2d0;
  RTCFilterFunctionNArguments local_2c8;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  uint auStack_278 [4];
  undefined8 local_268;
  undefined4 local_260;
  undefined8 local_25c;
  undefined4 local_254;
  uint local_250;
  uint local_24c;
  uint local_248;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [32];
  float afStack_198 [8];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar93;
  undefined1 auVar205 [32];
  undefined1 auVar393 [32];
  
  PVar23 = prim[1];
  uVar91 = (ulong)(byte)PVar23;
  lVar96 = uVar91 * 0x25;
  fVar179 = *(float *)(prim + lVar96 + 0x12);
  auVar138 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar96 + 6));
  auVar123._0_4_ = fVar179 * auVar138._0_4_;
  auVar123._4_4_ = fVar179 * auVar138._4_4_;
  auVar123._8_4_ = fVar179 * auVar138._8_4_;
  auVar123._12_4_ = fVar179 * auVar138._12_4_;
  auVar240._0_4_ = fVar179 * (ray->dir).field_0.m128[0];
  auVar240._4_4_ = fVar179 * (ray->dir).field_0.m128[1];
  auVar240._8_4_ = fVar179 * (ray->dir).field_0.m128[2];
  auVar240._12_4_ = fVar179 * (ray->dir).field_0.m128[3];
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 10)));
  auVar115._16_16_ = auVar186;
  auVar115._0_16_ = auVar138;
  lVar1 = uVar91 * 5;
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar172._16_16_ = auVar186;
  auVar172._0_16_ = auVar138;
  auVar30 = vcvtdq2ps_avx(auVar172);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 10)));
  auVar198._16_16_ = auVar186;
  auVar198._0_16_ = auVar138;
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 6)));
  auVar31 = vcvtdq2ps_avx(auVar198);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 10)));
  auVar199._16_16_ = auVar186;
  auVar199._0_16_ = auVar138;
  lVar95 = (ulong)(byte)PVar23 * 0x10;
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar95 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar199);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar95 + 10)));
  auVar273._16_16_ = auVar186;
  auVar273._0_16_ = auVar138;
  auVar33 = vcvtdq2ps_avx(auVar273);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar95 + uVar91 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar95 + uVar91 + 10)));
  auVar284._16_16_ = auVar186;
  auVar284._0_16_ = auVar138;
  auVar34 = vcvtdq2ps_avx(auVar284);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 10)));
  auVar305._16_16_ = auVar186;
  auVar305._0_16_ = auVar138;
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 10)));
  auVar35 = vcvtdq2ps_avx(auVar305);
  auVar322._16_16_ = auVar186;
  auVar322._0_16_ = auVar138;
  auVar36 = vcvtdq2ps_avx(auVar322);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 10)));
  auVar333._16_16_ = auVar186;
  auVar333._0_16_ = auVar138;
  auVar37 = vcvtdq2ps_avx(auVar333);
  auVar138 = vshufps_avx(auVar240,auVar240,0);
  auVar186 = vshufps_avx(auVar240,auVar240,0x55);
  auVar38 = vshufps_avx(auVar240,auVar240,0xaa);
  fVar179 = auVar38._0_4_;
  fVar152 = auVar38._4_4_;
  fVar206 = auVar38._8_4_;
  fVar178 = auVar38._12_4_;
  fVar207 = auVar186._0_4_;
  fVar368 = auVar186._4_4_;
  fVar208 = auVar186._8_4_;
  fVar377 = auVar186._12_4_;
  fVar209 = auVar138._0_4_;
  fVar210 = auVar138._4_4_;
  fVar211 = auVar138._8_4_;
  fVar212 = auVar138._12_4_;
  auVar360._0_4_ = fVar209 * auVar115._0_4_ + fVar207 * auVar30._0_4_ + fVar179 * auVar31._0_4_;
  auVar360._4_4_ = fVar210 * auVar115._4_4_ + fVar368 * auVar30._4_4_ + fVar152 * auVar31._4_4_;
  auVar360._8_4_ = fVar211 * auVar115._8_4_ + fVar208 * auVar30._8_4_ + fVar206 * auVar31._8_4_;
  auVar360._12_4_ = fVar212 * auVar115._12_4_ + fVar377 * auVar30._12_4_ + fVar178 * auVar31._12_4_;
  auVar360._16_4_ = fVar209 * auVar115._16_4_ + fVar207 * auVar30._16_4_ + fVar179 * auVar31._16_4_;
  auVar360._20_4_ = fVar210 * auVar115._20_4_ + fVar368 * auVar30._20_4_ + fVar152 * auVar31._20_4_;
  auVar360._24_4_ = fVar211 * auVar115._24_4_ + fVar208 * auVar30._24_4_ + fVar206 * auVar31._24_4_;
  auVar360._28_4_ = fVar377 + in_register_000015dc + in_register_0000151c;
  auVar345._0_4_ = fVar209 * auVar32._0_4_ + fVar207 * auVar33._0_4_ + fVar179 * auVar34._0_4_;
  auVar345._4_4_ = fVar210 * auVar32._4_4_ + fVar368 * auVar33._4_4_ + fVar152 * auVar34._4_4_;
  auVar345._8_4_ = fVar211 * auVar32._8_4_ + fVar208 * auVar33._8_4_ + fVar206 * auVar34._8_4_;
  auVar345._12_4_ = fVar212 * auVar32._12_4_ + fVar377 * auVar33._12_4_ + fVar178 * auVar34._12_4_;
  auVar345._16_4_ = fVar209 * auVar32._16_4_ + fVar207 * auVar33._16_4_ + fVar179 * auVar34._16_4_;
  auVar345._20_4_ = fVar210 * auVar32._20_4_ + fVar368 * auVar33._20_4_ + fVar152 * auVar34._20_4_;
  auVar345._24_4_ = fVar211 * auVar32._24_4_ + fVar208 * auVar33._24_4_ + fVar206 * auVar34._24_4_;
  auVar345._28_4_ = fVar377 + in_register_000015dc + in_register_0000159c;
  auVar258._0_4_ = fVar209 * auVar35._0_4_ + fVar207 * auVar36._0_4_ + auVar37._0_4_ * fVar179;
  auVar258._4_4_ = fVar210 * auVar35._4_4_ + fVar368 * auVar36._4_4_ + auVar37._4_4_ * fVar152;
  auVar258._8_4_ = fVar211 * auVar35._8_4_ + fVar208 * auVar36._8_4_ + auVar37._8_4_ * fVar206;
  auVar258._12_4_ = fVar212 * auVar35._12_4_ + fVar377 * auVar36._12_4_ + auVar37._12_4_ * fVar178;
  auVar258._16_4_ = fVar209 * auVar35._16_4_ + fVar207 * auVar36._16_4_ + auVar37._16_4_ * fVar179;
  auVar258._20_4_ = fVar210 * auVar35._20_4_ + fVar368 * auVar36._20_4_ + auVar37._20_4_ * fVar152;
  auVar258._24_4_ = fVar211 * auVar35._24_4_ + fVar208 * auVar36._24_4_ + auVar37._24_4_ * fVar206;
  auVar258._28_4_ = fVar212 + fVar377 + fVar178;
  auVar138 = vshufps_avx(auVar123,auVar123,0);
  auVar186 = vshufps_avx(auVar123,auVar123,0x55);
  auVar38 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar152 = auVar38._0_4_;
  fVar206 = auVar38._4_4_;
  fVar178 = auVar38._8_4_;
  fVar207 = auVar38._12_4_;
  fVar210 = auVar186._0_4_;
  fVar211 = auVar186._4_4_;
  fVar212 = auVar186._8_4_;
  fVar233 = auVar186._12_4_;
  fVar368 = auVar138._0_4_;
  fVar208 = auVar138._4_4_;
  fVar377 = auVar138._8_4_;
  fVar209 = auVar138._12_4_;
  fVar179 = auVar115._28_4_;
  auVar173._0_4_ = fVar368 * auVar115._0_4_ + fVar210 * auVar30._0_4_ + fVar152 * auVar31._0_4_;
  auVar173._4_4_ = fVar208 * auVar115._4_4_ + fVar211 * auVar30._4_4_ + fVar206 * auVar31._4_4_;
  auVar173._8_4_ = fVar377 * auVar115._8_4_ + fVar212 * auVar30._8_4_ + fVar178 * auVar31._8_4_;
  auVar173._12_4_ = fVar209 * auVar115._12_4_ + fVar233 * auVar30._12_4_ + fVar207 * auVar31._12_4_;
  auVar173._16_4_ = fVar368 * auVar115._16_4_ + fVar210 * auVar30._16_4_ + fVar152 * auVar31._16_4_;
  auVar173._20_4_ = fVar208 * auVar115._20_4_ + fVar211 * auVar30._20_4_ + fVar206 * auVar31._20_4_;
  auVar173._24_4_ = fVar377 * auVar115._24_4_ + fVar212 * auVar30._24_4_ + fVar178 * auVar31._24_4_;
  auVar173._28_4_ = fVar179 + auVar30._28_4_ + auVar31._28_4_;
  auVar147._0_4_ = fVar368 * auVar32._0_4_ + fVar210 * auVar33._0_4_ + fVar152 * auVar34._0_4_;
  auVar147._4_4_ = fVar208 * auVar32._4_4_ + fVar211 * auVar33._4_4_ + fVar206 * auVar34._4_4_;
  auVar147._8_4_ = fVar377 * auVar32._8_4_ + fVar212 * auVar33._8_4_ + fVar178 * auVar34._8_4_;
  auVar147._12_4_ = fVar209 * auVar32._12_4_ + fVar233 * auVar33._12_4_ + fVar207 * auVar34._12_4_;
  auVar147._16_4_ = fVar368 * auVar32._16_4_ + fVar210 * auVar33._16_4_ + fVar152 * auVar34._16_4_;
  auVar147._20_4_ = fVar208 * auVar32._20_4_ + fVar211 * auVar33._20_4_ + fVar206 * auVar34._20_4_;
  auVar147._24_4_ = fVar377 * auVar32._24_4_ + fVar212 * auVar33._24_4_ + fVar178 * auVar34._24_4_;
  auVar147._28_4_ = fVar179 + auVar31._28_4_ + auVar34._28_4_;
  auVar116._0_4_ = fVar368 * auVar35._0_4_ + fVar210 * auVar36._0_4_ + auVar37._0_4_ * fVar152;
  auVar116._4_4_ = fVar208 * auVar35._4_4_ + fVar211 * auVar36._4_4_ + auVar37._4_4_ * fVar206;
  auVar116._8_4_ = fVar377 * auVar35._8_4_ + fVar212 * auVar36._8_4_ + auVar37._8_4_ * fVar178;
  auVar116._12_4_ = fVar209 * auVar35._12_4_ + fVar233 * auVar36._12_4_ + auVar37._12_4_ * fVar207;
  auVar116._16_4_ = fVar368 * auVar35._16_4_ + fVar210 * auVar36._16_4_ + auVar37._16_4_ * fVar152;
  auVar116._20_4_ = fVar208 * auVar35._20_4_ + fVar211 * auVar36._20_4_ + auVar37._20_4_ * fVar206;
  auVar116._24_4_ = fVar377 * auVar35._24_4_ + fVar212 * auVar36._24_4_ + auVar37._24_4_ * fVar178;
  auVar116._28_4_ = fVar179 + auVar33._28_4_ + fVar207;
  auVar200._8_4_ = 0x7fffffff;
  auVar200._0_8_ = 0x7fffffff7fffffff;
  auVar200._12_4_ = 0x7fffffff;
  auVar200._16_4_ = 0x7fffffff;
  auVar200._20_4_ = 0x7fffffff;
  auVar200._24_4_ = 0x7fffffff;
  auVar200._28_4_ = 0x7fffffff;
  auVar229._8_4_ = 0x219392ef;
  auVar229._0_8_ = 0x219392ef219392ef;
  auVar229._12_4_ = 0x219392ef;
  auVar229._16_4_ = 0x219392ef;
  auVar229._20_4_ = 0x219392ef;
  auVar229._24_4_ = 0x219392ef;
  auVar229._28_4_ = 0x219392ef;
  auVar115 = vandps_avx(auVar360,auVar200);
  auVar115 = vcmpps_avx(auVar115,auVar229,1);
  auVar30 = vblendvps_avx(auVar360,auVar229,auVar115);
  auVar115 = vandps_avx(auVar345,auVar200);
  auVar115 = vcmpps_avx(auVar115,auVar229,1);
  auVar31 = vblendvps_avx(auVar345,auVar229,auVar115);
  auVar115 = vandps_avx(auVar258,auVar200);
  auVar115 = vcmpps_avx(auVar115,auVar229,1);
  auVar115 = vblendvps_avx(auVar258,auVar229,auVar115);
  auVar32 = vrcpps_avx(auVar30);
  fVar179 = auVar32._0_4_;
  fVar206 = auVar32._4_4_;
  auVar33._4_4_ = auVar30._4_4_ * fVar206;
  auVar33._0_4_ = auVar30._0_4_ * fVar179;
  fVar207 = auVar32._8_4_;
  auVar33._8_4_ = auVar30._8_4_ * fVar207;
  fVar208 = auVar32._12_4_;
  auVar33._12_4_ = auVar30._12_4_ * fVar208;
  fVar209 = auVar32._16_4_;
  auVar33._16_4_ = auVar30._16_4_ * fVar209;
  fVar210 = auVar32._20_4_;
  auVar33._20_4_ = auVar30._20_4_ * fVar210;
  fVar211 = auVar32._24_4_;
  auVar33._24_4_ = auVar30._24_4_ * fVar211;
  auVar33._28_4_ = 0x219392ef;
  auVar306._8_4_ = 0x3f800000;
  auVar306._0_8_ = &DAT_3f8000003f800000;
  auVar306._12_4_ = 0x3f800000;
  auVar306._16_4_ = 0x3f800000;
  auVar306._20_4_ = 0x3f800000;
  auVar306._24_4_ = 0x3f800000;
  auVar306._28_4_ = 0x3f800000;
  auVar34 = vsubps_avx(auVar306,auVar33);
  fVar179 = fVar179 + fVar179 * auVar34._0_4_;
  fVar206 = fVar206 + fVar206 * auVar34._4_4_;
  fVar207 = fVar207 + fVar207 * auVar34._8_4_;
  fVar208 = fVar208 + fVar208 * auVar34._12_4_;
  fVar209 = fVar209 + fVar209 * auVar34._16_4_;
  fVar210 = fVar210 + fVar210 * auVar34._20_4_;
  fVar211 = fVar211 + fVar211 * auVar34._24_4_;
  auVar33 = vrcpps_avx(auVar31);
  fVar212 = auVar33._0_4_;
  fVar233 = auVar33._4_4_;
  auVar35._4_4_ = fVar233 * auVar31._4_4_;
  auVar35._0_4_ = fVar212 * auVar31._0_4_;
  fVar234 = auVar33._8_4_;
  auVar35._8_4_ = fVar234 * auVar31._8_4_;
  fVar235 = auVar33._12_4_;
  auVar35._12_4_ = fVar235 * auVar31._12_4_;
  fVar236 = auVar33._16_4_;
  auVar35._16_4_ = fVar236 * auVar31._16_4_;
  fVar237 = auVar33._20_4_;
  auVar35._20_4_ = fVar237 * auVar31._20_4_;
  fVar238 = auVar33._24_4_;
  auVar35._24_4_ = fVar238 * auVar31._24_4_;
  auVar35._28_4_ = auVar30._28_4_;
  auVar31 = vsubps_avx(auVar306,auVar35);
  fVar212 = fVar212 + fVar212 * auVar31._0_4_;
  fVar233 = fVar233 + fVar233 * auVar31._4_4_;
  fVar234 = fVar234 + fVar234 * auVar31._8_4_;
  fVar235 = fVar235 + fVar235 * auVar31._12_4_;
  fVar236 = fVar236 + fVar236 * auVar31._16_4_;
  fVar237 = fVar237 + fVar237 * auVar31._20_4_;
  fVar238 = fVar238 + fVar238 * auVar31._24_4_;
  auVar30 = vrcpps_avx(auVar115);
  fVar239 = auVar30._0_4_;
  fVar259 = auVar30._4_4_;
  auVar36._4_4_ = fVar259 * auVar115._4_4_;
  auVar36._0_4_ = fVar239 * auVar115._0_4_;
  fVar260 = auVar30._8_4_;
  auVar36._8_4_ = fVar260 * auVar115._8_4_;
  fVar261 = auVar30._12_4_;
  auVar36._12_4_ = fVar261 * auVar115._12_4_;
  fVar262 = auVar30._16_4_;
  auVar36._16_4_ = fVar262 * auVar115._16_4_;
  fVar263 = auVar30._20_4_;
  auVar36._20_4_ = fVar263 * auVar115._20_4_;
  fVar264 = auVar30._24_4_;
  auVar36._24_4_ = fVar264 * auVar115._24_4_;
  auVar36._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(auVar306,auVar36);
  fVar239 = fVar239 + fVar239 * auVar115._0_4_;
  fVar259 = fVar259 + fVar259 * auVar115._4_4_;
  fVar260 = fVar260 + fVar260 * auVar115._8_4_;
  fVar261 = fVar261 + fVar261 * auVar115._12_4_;
  fVar262 = fVar262 + fVar262 * auVar115._16_4_;
  fVar263 = fVar263 + fVar263 * auVar115._20_4_;
  fVar264 = fVar264 + fVar264 * auVar115._24_4_;
  auVar138 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar96 + 0x16)) *
                           *(float *)(prim + lVar96 + 0x1a)));
  auVar160 = vshufps_avx(auVar138,auVar138,0);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar138 = vpmovsxwd_avx(auVar138);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar91 * 7 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar186);
  auVar285._16_16_ = auVar186;
  auVar285._0_16_ = auVar138;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar138 = vpmovsxwd_avx(auVar38);
  auVar115 = vcvtdq2ps_avx(auVar285);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 0xe);
  auVar186 = vpmovsxwd_avx(auVar256);
  auVar307._16_16_ = auVar186;
  auVar307._0_16_ = auVar138;
  auVar30 = vcvtdq2ps_avx(auVar307);
  auVar30 = vsubps_avx(auVar30,auVar115);
  fVar152 = auVar160._0_4_;
  fVar178 = auVar160._4_4_;
  fVar368 = auVar160._8_4_;
  fVar377 = auVar160._12_4_;
  auVar286._0_4_ = auVar30._0_4_ * fVar152 + auVar115._0_4_;
  auVar286._4_4_ = auVar30._4_4_ * fVar178 + auVar115._4_4_;
  auVar286._8_4_ = auVar30._8_4_ * fVar368 + auVar115._8_4_;
  auVar286._12_4_ = auVar30._12_4_ * fVar377 + auVar115._12_4_;
  auVar286._16_4_ = auVar30._16_4_ * fVar152 + auVar115._16_4_;
  auVar286._20_4_ = auVar30._20_4_ * fVar178 + auVar115._20_4_;
  auVar286._24_4_ = auVar30._24_4_ * fVar368 + auVar115._24_4_;
  auVar286._28_4_ = auVar30._28_4_ + auVar115._28_4_;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar138 = vpmovsxwd_avx(auVar160);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar91 * 9 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar137);
  auVar308._16_16_ = auVar186;
  auVar308._0_16_ = auVar138;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 6);
  auVar138 = vpmovsxwd_avx(auVar194);
  auVar115 = vcvtdq2ps_avx(auVar308);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 0xe);
  auVar186 = vpmovsxwd_avx(auVar113);
  auVar323._16_16_ = auVar186;
  auVar323._0_16_ = auVar138;
  auVar30 = vcvtdq2ps_avx(auVar323);
  auVar30 = vsubps_avx(auVar30,auVar115);
  auVar309._0_4_ = auVar115._0_4_ + auVar30._0_4_ * fVar152;
  auVar309._4_4_ = auVar115._4_4_ + auVar30._4_4_ * fVar178;
  auVar309._8_4_ = auVar115._8_4_ + auVar30._8_4_ * fVar368;
  auVar309._12_4_ = auVar115._12_4_ + auVar30._12_4_ * fVar377;
  auVar309._16_4_ = auVar115._16_4_ + auVar30._16_4_ * fVar152;
  auVar309._20_4_ = auVar115._20_4_ + auVar30._20_4_ * fVar178;
  auVar309._24_4_ = auVar115._24_4_ + auVar30._24_4_ * fVar368;
  auVar309._28_4_ = auVar115._28_4_ + auVar30._28_4_;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 6);
  auVar138 = vpmovsxwd_avx(auVar165);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar10);
  auVar324._16_16_ = auVar186;
  auVar324._0_16_ = auVar138;
  uVar97 = (ulong)(uint)((int)lVar1 << 2);
  lVar96 = uVar91 * 2 + uVar97;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar138 = vpmovsxwd_avx(auVar11);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar280);
  auVar115 = vcvtdq2ps_avx(auVar324);
  auVar334._16_16_ = auVar186;
  auVar334._0_16_ = auVar138;
  auVar30 = vcvtdq2ps_avx(auVar334);
  auVar30 = vsubps_avx(auVar30,auVar115);
  auVar325._0_4_ = auVar115._0_4_ + auVar30._0_4_ * fVar152;
  auVar325._4_4_ = auVar115._4_4_ + auVar30._4_4_ * fVar178;
  auVar325._8_4_ = auVar115._8_4_ + auVar30._8_4_ * fVar368;
  auVar325._12_4_ = auVar115._12_4_ + auVar30._12_4_ * fVar377;
  auVar325._16_4_ = auVar115._16_4_ + auVar30._16_4_ * fVar152;
  auVar325._20_4_ = auVar115._20_4_ + auVar30._20_4_ * fVar178;
  auVar325._24_4_ = auVar115._24_4_ + auVar30._24_4_ * fVar368;
  auVar325._28_4_ = auVar115._28_4_ + auVar30._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar97 + 6);
  auVar138 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar97 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar13);
  auVar335._16_16_ = auVar186;
  auVar335._0_16_ = auVar138;
  auVar115 = vcvtdq2ps_avx(auVar335);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 6);
  auVar138 = vpmovsxwd_avx(auVar161);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar14);
  auVar346._16_16_ = auVar186;
  auVar346._0_16_ = auVar138;
  auVar30 = vcvtdq2ps_avx(auVar346);
  auVar30 = vsubps_avx(auVar30,auVar115);
  auVar336._0_4_ = auVar115._0_4_ + auVar30._0_4_ * fVar152;
  auVar336._4_4_ = auVar115._4_4_ + auVar30._4_4_ * fVar178;
  auVar336._8_4_ = auVar115._8_4_ + auVar30._8_4_ * fVar368;
  auVar336._12_4_ = auVar115._12_4_ + auVar30._12_4_ * fVar377;
  auVar336._16_4_ = auVar115._16_4_ + auVar30._16_4_ * fVar152;
  auVar336._20_4_ = auVar115._20_4_ + auVar30._20_4_ * fVar178;
  auVar336._24_4_ = auVar115._24_4_ + auVar30._24_4_ * fVar368;
  auVar336._28_4_ = auVar115._28_4_ + auVar30._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 6);
  auVar138 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 0xe);
  auVar186 = vpmovsxwd_avx(auVar16);
  auVar347._16_16_ = auVar186;
  auVar347._0_16_ = auVar138;
  lVar96 = uVar91 + (ulong)(byte)PVar23 * 0x20;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar138 = vpmovsxwd_avx(auVar17);
  auVar115 = vcvtdq2ps_avx(auVar347);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar18);
  auVar361._16_16_ = auVar186;
  auVar361._0_16_ = auVar138;
  auVar30 = vcvtdq2ps_avx(auVar361);
  auVar30 = vsubps_avx(auVar30,auVar115);
  lVar96 = (ulong)(byte)PVar23 * 0x20 - uVar91;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar138 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar20);
  auVar348._0_4_ = auVar115._0_4_ + auVar30._0_4_ * fVar152;
  auVar348._4_4_ = auVar115._4_4_ + auVar30._4_4_ * fVar178;
  auVar348._8_4_ = auVar115._8_4_ + auVar30._8_4_ * fVar368;
  auVar348._12_4_ = auVar115._12_4_ + auVar30._12_4_ * fVar377;
  auVar348._16_4_ = auVar115._16_4_ + auVar30._16_4_ * fVar152;
  auVar348._20_4_ = auVar115._20_4_ + auVar30._20_4_ * fVar178;
  auVar348._24_4_ = auVar115._24_4_ + auVar30._24_4_ * fVar368;
  auVar348._28_4_ = auVar115._28_4_ + auVar30._28_4_;
  auVar362._16_16_ = auVar186;
  auVar362._0_16_ = auVar138;
  auVar115 = vcvtdq2ps_avx(auVar362);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 6);
  auVar138 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar22);
  auVar372._16_16_ = auVar186;
  auVar372._0_16_ = auVar138;
  auVar30 = vcvtdq2ps_avx(auVar372);
  auVar30 = vsubps_avx(auVar30,auVar115);
  auVar363._0_4_ = auVar115._0_4_ + auVar30._0_4_ * fVar152;
  auVar363._4_4_ = auVar115._4_4_ + auVar30._4_4_ * fVar178;
  auVar363._8_4_ = auVar115._8_4_ + auVar30._8_4_ * fVar368;
  auVar363._12_4_ = auVar115._12_4_ + auVar30._12_4_ * fVar377;
  auVar363._16_4_ = auVar115._16_4_ + auVar30._16_4_ * fVar152;
  auVar363._20_4_ = auVar115._20_4_ + auVar30._20_4_ * fVar178;
  auVar363._24_4_ = auVar115._24_4_ + auVar30._24_4_ * fVar368;
  auVar363._28_4_ = auVar115._28_4_ + fVar377;
  auVar115 = vsubps_avx(auVar286,auVar173);
  auVar265._0_4_ = fVar179 * auVar115._0_4_;
  auVar265._4_4_ = fVar206 * auVar115._4_4_;
  auVar265._8_4_ = fVar207 * auVar115._8_4_;
  auVar265._12_4_ = fVar208 * auVar115._12_4_;
  auVar37._16_4_ = fVar209 * auVar115._16_4_;
  auVar37._0_16_ = auVar265;
  auVar37._20_4_ = fVar210 * auVar115._20_4_;
  auVar37._24_4_ = fVar211 * auVar115._24_4_;
  auVar37._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(auVar309,auVar173);
  auVar180._0_4_ = fVar179 * auVar115._0_4_;
  auVar180._4_4_ = fVar206 * auVar115._4_4_;
  auVar180._8_4_ = fVar207 * auVar115._8_4_;
  auVar180._12_4_ = fVar208 * auVar115._12_4_;
  auVar39._16_4_ = fVar209 * auVar115._16_4_;
  auVar39._0_16_ = auVar180;
  auVar39._20_4_ = fVar210 * auVar115._20_4_;
  auVar39._24_4_ = fVar211 * auVar115._24_4_;
  auVar39._28_4_ = auVar32._28_4_ + auVar34._28_4_;
  auVar115 = vsubps_avx(auVar325,auVar147);
  auVar153._0_4_ = fVar212 * auVar115._0_4_;
  auVar153._4_4_ = fVar233 * auVar115._4_4_;
  auVar153._8_4_ = fVar234 * auVar115._8_4_;
  auVar153._12_4_ = fVar235 * auVar115._12_4_;
  auVar32._16_4_ = fVar236 * auVar115._16_4_;
  auVar32._0_16_ = auVar153;
  auVar32._20_4_ = fVar237 * auVar115._20_4_;
  auVar32._24_4_ = fVar238 * auVar115._24_4_;
  auVar32._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(auVar336,auVar147);
  auVar213._0_4_ = fVar212 * auVar115._0_4_;
  auVar213._4_4_ = fVar233 * auVar115._4_4_;
  auVar213._8_4_ = fVar234 * auVar115._8_4_;
  auVar213._12_4_ = fVar235 * auVar115._12_4_;
  auVar34._16_4_ = fVar236 * auVar115._16_4_;
  auVar34._0_16_ = auVar213;
  auVar34._20_4_ = fVar237 * auVar115._20_4_;
  auVar34._24_4_ = fVar238 * auVar115._24_4_;
  auVar34._28_4_ = auVar33._28_4_ + auVar31._28_4_;
  auVar115 = vsubps_avx(auVar348,auVar116);
  auVar124._0_4_ = fVar239 * auVar115._0_4_;
  auVar124._4_4_ = fVar259 * auVar115._4_4_;
  auVar124._8_4_ = fVar260 * auVar115._8_4_;
  auVar124._12_4_ = fVar261 * auVar115._12_4_;
  auVar31._16_4_ = fVar262 * auVar115._16_4_;
  auVar31._0_16_ = auVar124;
  auVar31._20_4_ = fVar263 * auVar115._20_4_;
  auVar31._24_4_ = fVar264 * auVar115._24_4_;
  auVar31._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(auVar363,auVar116);
  auVar99._0_4_ = fVar239 * auVar115._0_4_;
  auVar99._4_4_ = fVar259 * auVar115._4_4_;
  auVar99._8_4_ = fVar260 * auVar115._8_4_;
  auVar99._12_4_ = fVar261 * auVar115._12_4_;
  auVar40._16_4_ = fVar262 * auVar115._16_4_;
  auVar40._0_16_ = auVar99;
  auVar40._20_4_ = fVar263 * auVar115._20_4_;
  auVar40._24_4_ = fVar264 * auVar115._24_4_;
  auVar40._28_4_ = auVar115._28_4_;
  auVar138 = vpminsd_avx(auVar37._16_16_,auVar39._16_16_);
  auVar186 = vpminsd_avx(auVar265,auVar180);
  auVar310._16_16_ = auVar138;
  auVar310._0_16_ = auVar186;
  auVar138 = vpminsd_avx(auVar32._16_16_,auVar34._16_16_);
  auVar186 = vpminsd_avx(auVar153,auVar213);
  auVar349._16_16_ = auVar138;
  auVar349._0_16_ = auVar186;
  auVar115 = vmaxps_avx(auVar310,auVar349);
  auVar138 = vpminsd_avx(auVar31._16_16_,auVar40._16_16_);
  auVar186 = vpminsd_avx(auVar124,auVar99);
  auVar373._16_16_ = auVar138;
  auVar373._0_16_ = auVar186;
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar383._4_4_ = uVar7;
  auVar383._0_4_ = uVar7;
  auVar383._8_4_ = uVar7;
  auVar383._12_4_ = uVar7;
  auVar383._16_4_ = uVar7;
  auVar383._20_4_ = uVar7;
  auVar383._24_4_ = uVar7;
  auVar383._28_4_ = uVar7;
  auVar30 = vmaxps_avx(auVar373,auVar383);
  auVar115 = vmaxps_avx(auVar115,auVar30);
  local_178._4_4_ = auVar115._4_4_ * 0.99999964;
  local_178._0_4_ = auVar115._0_4_ * 0.99999964;
  local_178._8_4_ = auVar115._8_4_ * 0.99999964;
  local_178._12_4_ = auVar115._12_4_ * 0.99999964;
  local_178._16_4_ = auVar115._16_4_ * 0.99999964;
  local_178._20_4_ = auVar115._20_4_ * 0.99999964;
  local_178._24_4_ = auVar115._24_4_ * 0.99999964;
  local_178._28_4_ = auVar115._28_4_;
  auVar138 = vpmaxsd_avx(auVar37._16_16_,auVar39._16_16_);
  auVar186 = vpmaxsd_avx(auVar265,auVar180);
  auVar201._16_16_ = auVar138;
  auVar201._0_16_ = auVar186;
  auVar138 = vpmaxsd_avx(auVar32._16_16_,auVar34._16_16_);
  auVar186 = vpmaxsd_avx(auVar153,auVar213);
  auVar174._16_16_ = auVar138;
  auVar174._0_16_ = auVar186;
  auVar115 = vminps_avx(auVar201,auVar174);
  auVar138 = vpmaxsd_avx(auVar31._16_16_,auVar40._16_16_);
  auVar186 = vpmaxsd_avx(auVar124,auVar99);
  auVar117._16_16_ = auVar138;
  auVar117._0_16_ = auVar186;
  fVar179 = ray->tfar;
  auVar148._4_4_ = fVar179;
  auVar148._0_4_ = fVar179;
  auVar148._8_4_ = fVar179;
  auVar148._12_4_ = fVar179;
  auVar148._16_4_ = fVar179;
  auVar148._20_4_ = fVar179;
  auVar148._24_4_ = fVar179;
  auVar148._28_4_ = fVar179;
  auVar30 = vminps_avx(auVar117,auVar148);
  auVar115 = vminps_avx(auVar115,auVar30);
  auVar30._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar30._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar30._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar30._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar30._16_4_ = auVar115._16_4_ * 1.0000004;
  auVar30._20_4_ = auVar115._20_4_ * 1.0000004;
  auVar30._24_4_ = auVar115._24_4_ * 1.0000004;
  auVar30._28_4_ = auVar115._28_4_;
  auVar115 = vcmpps_avx(local_178,auVar30,2);
  auVar138 = vpshufd_avx(ZEXT116((byte)PVar23),0);
  auVar149._16_16_ = auVar138;
  auVar149._0_16_ = auVar138;
  auVar30 = vcvtdq2ps_avx(auVar149);
  auVar30 = vcmpps_avx(_DAT_02020f40,auVar30,1);
  auVar115 = vandps_avx(auVar115,auVar30);
  uVar88 = vmovmskps_avx(auVar115);
  local_4e9 = uVar88 != 0;
  if (uVar88 == 0) {
    return local_4e9;
  }
  auVar118._16_16_ = mm_lookupmask_ps._240_16_;
  auVar118._0_16_ = mm_lookupmask_ps._240_16_;
  uVar88 = uVar88 & 0xff;
  local_1b8 = vblendps_avx(auVar118,ZEXT832(0) << 0x20,0x80);
  local_2d8 = pre;
  local_2d0 = prim;
LAB_0120517d:
  auVar98 = (undefined1  [8])(ulong)uVar88;
  lVar96 = 0;
  if (auVar98 != (undefined1  [8])0x0) {
    for (; (uVar88 >> lVar96 & 1) == 0; lVar96 = lVar96 + 1) {
    }
  }
  uVar90 = *(uint *)(local_2d0 + 2);
  local_2e0 = (ulong)*(uint *)(local_2d0 + lVar96 * 4 + 6);
  pGVar24 = (context->scene->geometries).items[uVar90].ptr;
  fVar179 = (pGVar24->time_range).lower;
  fVar179 = pGVar24->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar179) / ((pGVar24->time_range).upper - fVar179));
  auVar138 = vroundss_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar179),9);
  auVar138 = vminss_avx(auVar138,ZEXT416((uint)(pGVar24->fnumTimeSegments + -1.0)));
  auVar138 = vmaxss_avx(ZEXT816(0) << 0x20,auVar138);
  uVar91 = (ulong)*(uint *)(*(long *)&pGVar24->field_0x58 +
                           local_2e0 *
                           pGVar24[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var25 = pGVar24[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar94 = (long)(int)auVar138._0_4_ * 0x38;
  lVar26 = *(long *)(_Var25 + lVar94);
  lVar27 = *(long *)(_Var25 + 0x10 + lVar94);
  pfVar2 = (float *)(lVar26 + lVar27 * uVar91);
  fVar152 = *pfVar2;
  fVar206 = pfVar2[1];
  fVar178 = pfVar2[2];
  fVar207 = pfVar2[3];
  lVar96 = uVar91 + 1;
  pfVar2 = (float *)(lVar26 + lVar27 * lVar96);
  lVar1 = uVar91 + 2;
  pfVar3 = (float *)(lVar26 + lVar27 * lVar1);
  lVar95 = uVar91 + 3;
  pfVar4 = (float *)(lVar26 + lVar27 * lVar95);
  fVar368 = *pfVar4;
  fVar208 = pfVar4[1];
  fVar377 = pfVar4[2];
  fVar209 = pfVar4[3];
  lVar26 = *(long *)&pGVar24[4].fnumTimeSegments;
  lVar27 = *(long *)(lVar26 + lVar94);
  lVar28 = *(long *)(lVar26 + 0x10 + lVar94);
  pfVar4 = (float *)(lVar27 + lVar28 * uVar91);
  fVar210 = *pfVar4;
  fVar211 = pfVar4[1];
  fVar212 = pfVar4[2];
  fVar233 = pfVar4[3];
  pfVar4 = (float *)(lVar27 + lVar28 * lVar96);
  pfVar5 = (float *)(lVar27 + lVar28 * lVar1);
  fVar179 = fVar179 - auVar138._0_4_;
  pfVar6 = (float *)(lVar27 + lVar28 * lVar95);
  fVar234 = *pfVar6;
  fVar235 = pfVar6[1];
  fVar236 = pfVar6[2];
  fVar237 = pfVar6[3];
  fVar261 = *pfVar3 * 0.0;
  fVar262 = pfVar3[1] * 0.0;
  fVar263 = pfVar3[2] * 0.0;
  fVar264 = pfVar3[3] * 0.0;
  fVar238 = fVar261 + fVar368 * 0.0;
  fVar239 = fVar262 + fVar208 * 0.0;
  fVar259 = fVar263 + fVar377 * 0.0;
  fVar260 = fVar264 + fVar209 * 0.0;
  fVar338 = *pfVar2 * 0.0;
  fVar350 = pfVar2[1] * 0.0;
  fVar352 = pfVar2[2] * 0.0;
  fVar354 = pfVar2[3] * 0.0;
  local_4a8._0_4_ = fVar152 + fVar338 + fVar238;
  local_4a8._4_4_ = fVar206 + fVar350 + fVar239;
  fStack_4a0 = fVar178 + fVar352 + fVar259;
  fStack_49c = fVar207 + fVar354 + fVar260;
  auVar100._0_4_ = *pfVar2 * 3.0 + fVar238;
  auVar100._4_4_ = pfVar2[1] * 3.0 + fVar239;
  auVar100._8_4_ = pfVar2[2] * 3.0 + fVar259;
  auVar100._12_4_ = pfVar2[3] * 3.0 + fVar260;
  auVar154._0_4_ = fVar152 * 3.0;
  auVar154._4_4_ = fVar206 * 3.0;
  auVar154._8_4_ = fVar178 * 3.0;
  auVar154._12_4_ = fVar207 * 3.0;
  auVar113 = vsubps_avx(auVar100,auVar154);
  fVar356 = *pfVar5 * 0.0;
  fVar364 = pfVar5[1] * 0.0;
  fVar365 = pfVar5[2] * 0.0;
  fVar366 = pfVar5[3] * 0.0;
  fVar238 = fVar356 + fVar234 * 0.0;
  fVar239 = fVar364 + fVar235 * 0.0;
  fVar259 = fVar365 + fVar236 * 0.0;
  fVar260 = fVar366 + fVar237 * 0.0;
  fVar367 = *pfVar4 * 0.0;
  fVar375 = pfVar4[1] * 0.0;
  fVar376 = pfVar4[2] * 0.0;
  fVar378 = pfVar4[3] * 0.0;
  auVar379._0_4_ = fVar367 + fVar238 + fVar210;
  auVar379._4_4_ = fVar375 + fVar239 + fVar211;
  auVar379._8_4_ = fVar376 + fVar259 + fVar212;
  auVar379._12_4_ = fVar378 + fVar260 + fVar233;
  auVar101._0_4_ = *pfVar4 * 3.0 + fVar238;
  auVar101._4_4_ = pfVar4[1] * 3.0 + fVar239;
  auVar101._8_4_ = pfVar4[2] * 3.0 + fVar259;
  auVar101._12_4_ = pfVar4[3] * 3.0 + fVar260;
  auVar266._0_4_ = fVar210 * 3.0;
  auVar266._4_4_ = fVar211 * 3.0;
  auVar266._8_4_ = fVar212 * 3.0;
  auVar266._12_4_ = fVar233 * 3.0;
  auVar256 = vsubps_avx(auVar101,auVar266);
  auVar181._0_4_ = fVar152 * 0.0;
  auVar181._4_4_ = fVar206 * 0.0;
  auVar181._8_4_ = fVar178 * 0.0;
  auVar181._12_4_ = fVar207 * 0.0;
  auVar267._0_4_ = auVar181._0_4_ + fVar338 + fVar261 + fVar368;
  auVar267._4_4_ = auVar181._4_4_ + fVar350 + fVar262 + fVar208;
  auVar267._8_4_ = auVar181._8_4_ + fVar352 + fVar263 + fVar377;
  auVar267._12_4_ = auVar181._12_4_ + fVar354 + fVar264 + fVar209;
  auVar275._0_4_ = fVar368 * 3.0;
  auVar275._4_4_ = fVar208 * 3.0;
  auVar275._8_4_ = fVar377 * 3.0;
  auVar275._12_4_ = fVar209 * 3.0;
  auVar214._0_4_ = *pfVar3 * 3.0;
  auVar214._4_4_ = pfVar3[1] * 3.0;
  auVar214._8_4_ = pfVar3[2] * 3.0;
  auVar214._12_4_ = pfVar3[3] * 3.0;
  auVar138 = vsubps_avx(auVar275,auVar214);
  auVar215._0_4_ = fVar338 + auVar138._0_4_;
  auVar215._4_4_ = fVar350 + auVar138._4_4_;
  auVar215._8_4_ = fVar352 + auVar138._8_4_;
  auVar215._12_4_ = fVar354 + auVar138._12_4_;
  auVar165 = vsubps_avx(auVar215,auVar181);
  auVar216._0_4_ = fVar210 * 0.0;
  auVar216._4_4_ = fVar211 * 0.0;
  auVar216._8_4_ = fVar212 * 0.0;
  auVar216._12_4_ = fVar233 * 0.0;
  auVar182._0_4_ = auVar216._0_4_ + fVar367 + fVar356 + fVar234;
  auVar182._4_4_ = auVar216._4_4_ + fVar375 + fVar364 + fVar235;
  auVar182._8_4_ = auVar216._8_4_ + fVar376 + fVar365 + fVar236;
  auVar182._12_4_ = auVar216._12_4_ + fVar378 + fVar366 + fVar237;
  auVar241._0_4_ = fVar234 * 3.0;
  auVar241._4_4_ = fVar235 * 3.0;
  auVar241._8_4_ = fVar236 * 3.0;
  auVar241._12_4_ = fVar237 * 3.0;
  auVar276._0_4_ = *pfVar5 * 3.0;
  auVar276._4_4_ = pfVar5[1] * 3.0;
  auVar276._8_4_ = pfVar5[2] * 3.0;
  auVar276._12_4_ = pfVar5[3] * 3.0;
  auVar138 = vsubps_avx(auVar241,auVar276);
  auVar242._0_4_ = fVar367 + auVar138._0_4_;
  auVar242._4_4_ = fVar375 + auVar138._4_4_;
  auVar242._8_4_ = fVar376 + auVar138._8_4_;
  auVar242._12_4_ = fVar378 + auVar138._12_4_;
  auVar137 = vsubps_avx(auVar242,auVar216);
  auVar138 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar186 = vshufps_avx(auVar379,auVar379,0xc9);
  fVar238 = auVar113._0_4_;
  auVar243._0_4_ = fVar238 * auVar186._0_4_;
  fVar239 = auVar113._4_4_;
  auVar243._4_4_ = fVar239 * auVar186._4_4_;
  fVar259 = auVar113._8_4_;
  auVar243._8_4_ = fVar259 * auVar186._8_4_;
  fVar260 = auVar113._12_4_;
  auVar243._12_4_ = fVar260 * auVar186._12_4_;
  auVar288._0_4_ = auVar379._0_4_ * auVar138._0_4_;
  auVar288._4_4_ = auVar379._4_4_ * auVar138._4_4_;
  auVar288._8_4_ = auVar379._8_4_ * auVar138._8_4_;
  auVar288._12_4_ = auVar379._12_4_ * auVar138._12_4_;
  auVar186 = vsubps_avx(auVar288,auVar243);
  auVar38 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar186 = vshufps_avx(auVar256,auVar256,0xc9);
  auVar289._0_4_ = auVar186._0_4_ * fVar238;
  auVar289._4_4_ = auVar186._4_4_ * fVar239;
  auVar289._8_4_ = auVar186._8_4_ * fVar259;
  auVar289._12_4_ = auVar186._12_4_ * fVar260;
  auVar102._0_4_ = auVar138._0_4_ * auVar256._0_4_;
  auVar102._4_4_ = auVar138._4_4_ * auVar256._4_4_;
  auVar102._8_4_ = auVar138._8_4_ * auVar256._8_4_;
  auVar102._12_4_ = auVar138._12_4_ * auVar256._12_4_;
  auVar138 = vsubps_avx(auVar102,auVar289);
  auVar256 = vshufps_avx(auVar138,auVar138,0xc9);
  auVar138 = vshufps_avx(auVar165,auVar165,0xc9);
  auVar186 = vshufps_avx(auVar182,auVar182,0xc9);
  fVar367 = auVar165._0_4_;
  auVar290._0_4_ = fVar367 * auVar186._0_4_;
  fVar375 = auVar165._4_4_;
  auVar290._4_4_ = fVar375 * auVar186._4_4_;
  fVar376 = auVar165._8_4_;
  auVar290._8_4_ = fVar376 * auVar186._8_4_;
  fVar378 = auVar165._12_4_;
  auVar290._12_4_ = fVar378 * auVar186._12_4_;
  auVar183._0_4_ = auVar138._0_4_ * auVar182._0_4_;
  auVar183._4_4_ = auVar138._4_4_ * auVar182._4_4_;
  auVar183._8_4_ = auVar138._8_4_ * auVar182._8_4_;
  auVar183._12_4_ = auVar138._12_4_ * auVar182._12_4_;
  auVar186 = vsubps_avx(auVar183,auVar290);
  auVar160 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar186 = vshufps_avx(auVar137,auVar137,0xc9);
  auVar291._0_4_ = fVar367 * auVar186._0_4_;
  auVar291._4_4_ = fVar375 * auVar186._4_4_;
  auVar291._8_4_ = fVar376 * auVar186._8_4_;
  auVar291._12_4_ = fVar378 * auVar186._12_4_;
  auVar217._0_4_ = auVar138._0_4_ * auVar137._0_4_;
  auVar217._4_4_ = auVar138._4_4_ * auVar137._4_4_;
  auVar217._8_4_ = auVar138._8_4_ * auVar137._8_4_;
  auVar217._12_4_ = auVar138._12_4_ * auVar137._12_4_;
  auVar138 = vdpps_avx(auVar38,auVar38,0x7f);
  auVar186 = vsubps_avx(auVar217,auVar291);
  auVar137 = vshufps_avx(auVar186,auVar186,0xc9);
  fVar206 = auVar138._0_4_;
  auVar292._4_12_ = ZEXT812(0) << 0x20;
  auVar292._0_4_ = fVar206;
  auVar186 = vrsqrtss_avx(auVar292,auVar292);
  fVar152 = auVar186._0_4_;
  auVar186 = ZEXT416((uint)(fVar152 * 1.5 - fVar206 * 0.5 * fVar152 * fVar152 * fVar152));
  auVar194 = vshufps_avx(auVar186,auVar186,0);
  fVar234 = auVar194._0_4_ * auVar38._0_4_;
  fVar235 = auVar194._4_4_ * auVar38._4_4_;
  fVar236 = auVar194._8_4_ * auVar38._8_4_;
  fVar237 = auVar194._12_4_ * auVar38._12_4_;
  auVar186 = vdpps_avx(auVar38,auVar256,0x7f);
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar103._0_4_ = auVar138._0_4_ * auVar256._0_4_;
  auVar103._4_4_ = auVar138._4_4_ * auVar256._4_4_;
  auVar103._8_4_ = auVar138._8_4_ * auVar256._8_4_;
  auVar103._12_4_ = auVar138._12_4_ * auVar256._12_4_;
  auVar138 = vshufps_avx(auVar186,auVar186,0);
  auVar244._0_4_ = auVar138._0_4_ * auVar38._0_4_;
  auVar244._4_4_ = auVar138._4_4_ * auVar38._4_4_;
  auVar244._8_4_ = auVar138._8_4_ * auVar38._8_4_;
  auVar244._12_4_ = auVar138._12_4_ * auVar38._12_4_;
  auVar10 = vsubps_avx(auVar103,auVar244);
  auVar138 = vrcpss_avx(auVar292,auVar292);
  auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - fVar206 * auVar138._0_4_)));
  auVar38 = vshufps_avx(auVar138,auVar138,0);
  auVar138 = vdpps_avx(auVar160,auVar160,0x7f);
  fVar261 = auVar138._0_4_;
  auVar293._4_12_ = ZEXT812(0) << 0x20;
  auVar293._0_4_ = fVar261;
  auVar186 = vrsqrtss_avx(auVar293,auVar293);
  fVar210 = auVar186._0_4_;
  auVar186 = vdpps_avx(auVar160,auVar137,0x7f);
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar387._0_4_ = auVar137._0_4_ * auVar138._0_4_;
  auVar387._4_4_ = auVar137._4_4_ * auVar138._4_4_;
  auVar387._8_4_ = auVar137._8_4_ * auVar138._8_4_;
  auVar387._12_4_ = auVar137._12_4_ * auVar138._12_4_;
  lVar27 = *(long *)(_Var25 + 0x38 + lVar94);
  lVar28 = *(long *)(_Var25 + 0x48 + lVar94);
  pfVar2 = (float *)(lVar27 + lVar28 * uVar91);
  fVar152 = *pfVar2;
  fVar206 = pfVar2[1];
  fVar178 = pfVar2[2];
  fVar207 = pfVar2[3];
  pfVar2 = (float *)(lVar27 + lVar28 * lVar96);
  pfVar3 = (float *)(lVar27 + lVar28 * lVar1);
  auVar138 = vshufps_avx(auVar186,auVar186,0);
  auVar104._0_4_ = auVar160._0_4_ * auVar138._0_4_;
  auVar104._4_4_ = auVar160._4_4_ * auVar138._4_4_;
  auVar104._8_4_ = auVar160._8_4_ * auVar138._8_4_;
  auVar104._12_4_ = auVar160._12_4_ * auVar138._12_4_;
  auVar137 = vsubps_avx(auVar387,auVar104);
  pfVar4 = (float *)(lVar27 + lVar28 * lVar95);
  fVar368 = *pfVar4;
  fVar208 = pfVar4[1];
  fVar377 = pfVar4[2];
  fVar209 = pfVar4[3];
  auVar138 = ZEXT416((uint)(fVar210 * 1.5 - fVar261 * 0.5 * fVar210 * fVar210 * fVar210));
  auVar186 = vshufps_avx(auVar138,auVar138,0);
  fVar210 = auVar186._0_4_ * auVar160._0_4_;
  fVar211 = auVar186._4_4_ * auVar160._4_4_;
  fVar212 = auVar186._8_4_ * auVar160._8_4_;
  fVar233 = auVar186._12_4_ * auVar160._12_4_;
  auVar138 = vrcpss_avx(auVar293,auVar293);
  auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - auVar138._0_4_ * fVar261)));
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar256 = vshufps_avx(_local_4a8,_local_4a8,0xff);
  auVar380._0_4_ = auVar256._0_4_ * fVar234;
  auVar380._4_4_ = auVar256._4_4_ * fVar235;
  auVar380._8_4_ = auVar256._8_4_ * fVar236;
  auVar380._12_4_ = auVar256._12_4_ * fVar237;
  auVar160 = vshufps_avx(auVar113,auVar113,0xff);
  auVar11 = vsubps_avx(_local_4a8,auVar380);
  auVar277._0_4_ =
       auVar160._0_4_ * fVar234 + auVar256._0_4_ * auVar194._0_4_ * auVar10._0_4_ * auVar38._0_4_;
  auVar277._4_4_ =
       auVar160._4_4_ * fVar235 + auVar256._4_4_ * auVar194._4_4_ * auVar10._4_4_ * auVar38._4_4_;
  auVar277._8_4_ =
       auVar160._8_4_ * fVar236 + auVar256._8_4_ * auVar194._8_4_ * auVar10._8_4_ * auVar38._8_4_;
  auVar277._12_4_ =
       auVar160._12_4_ * fVar237 +
       auVar256._12_4_ * auVar194._12_4_ * auVar10._12_4_ * auVar38._12_4_;
  auVar194 = vsubps_avx(auVar113,auVar277);
  local_4a8._0_4_ = (float)local_4a8._0_4_ + auVar380._0_4_;
  local_4a8._4_4_ = (float)local_4a8._4_4_ + auVar380._4_4_;
  fStack_4a0 = fStack_4a0 + auVar380._8_4_;
  fStack_49c = fStack_49c + auVar380._12_4_;
  auVar38 = vshufps_avx(auVar267,auVar267,0xff);
  auVar155._0_4_ = auVar38._0_4_ * fVar210;
  auVar155._4_4_ = auVar38._4_4_ * fVar211;
  auVar155._8_4_ = auVar38._8_4_ * fVar212;
  auVar155._12_4_ = auVar38._12_4_ * fVar233;
  auVar256 = vshufps_avx(auVar165,auVar165,0xff);
  auVar113 = vsubps_avx(auVar267,auVar155);
  auVar105._0_4_ =
       auVar256._0_4_ * fVar210 + auVar38._0_4_ * auVar186._0_4_ * auVar137._0_4_ * auVar138._0_4_;
  auVar105._4_4_ =
       auVar256._4_4_ * fVar211 + auVar38._4_4_ * auVar186._4_4_ * auVar137._4_4_ * auVar138._4_4_;
  auVar105._8_4_ =
       auVar256._8_4_ * fVar212 + auVar38._8_4_ * auVar186._8_4_ * auVar137._8_4_ * auVar138._8_4_;
  auVar105._12_4_ =
       auVar256._12_4_ * fVar233 +
       auVar38._12_4_ * auVar186._12_4_ * auVar137._12_4_ * auVar138._12_4_;
  auVar165 = vsubps_avx(auVar165,auVar105);
  local_448._4_4_ = auVar267._4_4_ + auVar155._4_4_;
  local_448._0_4_ = auVar267._0_4_ + auVar155._0_4_;
  fStack_440 = auVar267._8_4_ + auVar155._8_4_;
  fStack_43c = auVar267._12_4_ + auVar155._12_4_;
  fVar338 = *pfVar3 * 0.0;
  fVar350 = pfVar3[1] * 0.0;
  fVar352 = pfVar3[2] * 0.0;
  fVar354 = pfVar3[3] * 0.0;
  fVar386 = fVar338 + fVar368 * 0.0;
  fVar394 = fVar350 + fVar208 * 0.0;
  fVar395 = fVar352 + fVar377 * 0.0;
  fVar396 = fVar354 + fVar209 * 0.0;
  auVar106._0_4_ = fVar386 + *pfVar2 * 3.0;
  auVar106._4_4_ = fVar394 + pfVar2[1] * 3.0;
  auVar106._8_4_ = fVar395 + pfVar2[2] * 3.0;
  auVar106._12_4_ = fVar396 + pfVar2[3] * 3.0;
  auVar156._0_4_ = fVar152 * 3.0;
  auVar156._4_4_ = fVar206 * 3.0;
  auVar156._8_4_ = fVar178 * 3.0;
  auVar156._12_4_ = fVar207 * 3.0;
  auVar10 = vsubps_avx(auVar106,auVar156);
  lVar27 = *(long *)(lVar26 + 0x38 + lVar94);
  lVar26 = *(long *)(lVar26 + 0x48 + lVar94);
  auVar138 = *(undefined1 (*) [16])(lVar27 + lVar1 * lVar26);
  pfVar4 = (float *)(lVar27 + lVar26 * lVar95);
  fVar210 = *pfVar4;
  fVar211 = pfVar4[1];
  fVar212 = pfVar4[2];
  fVar233 = pfVar4[3];
  fVar261 = auVar138._0_4_ * 0.0;
  fVar262 = auVar138._4_4_ * 0.0;
  fVar263 = auVar138._8_4_ * 0.0;
  fVar264 = auVar138._12_4_ * 0.0;
  fVar356 = fVar261 + fVar210 * 0.0;
  fVar364 = fVar262 + fVar211 * 0.0;
  fVar365 = fVar263 + fVar212 * 0.0;
  fVar366 = fVar264 + fVar233 * 0.0;
  pfVar4 = (float *)(lVar27 + lVar96 * lVar26);
  auVar381._0_4_ = *pfVar4 * 3.0 + fVar356;
  auVar381._4_4_ = pfVar4[1] * 3.0 + fVar364;
  auVar381._8_4_ = pfVar4[2] * 3.0 + fVar365;
  auVar381._12_4_ = pfVar4[3] * 3.0 + fVar366;
  pfVar5 = (float *)(lVar27 + uVar91 * lVar26);
  fVar234 = *pfVar5;
  fVar235 = pfVar5[1];
  fVar236 = pfVar5[2];
  fVar237 = pfVar5[3];
  auVar294._0_4_ = fVar234 * 3.0;
  auVar294._4_4_ = fVar235 * 3.0;
  auVar294._8_4_ = fVar236 * 3.0;
  auVar294._12_4_ = fVar237 * 3.0;
  auVar186 = vsubps_avx(auVar381,auVar294);
  auVar295._0_4_ = fVar368 * 3.0;
  auVar295._4_4_ = fVar208 * 3.0;
  auVar295._8_4_ = fVar377 * 3.0;
  auVar295._12_4_ = fVar209 * 3.0;
  auVar357._0_4_ = *pfVar3 * 3.0;
  auVar357._4_4_ = pfVar3[1] * 3.0;
  auVar357._8_4_ = pfVar3[2] * 3.0;
  auVar357._12_4_ = pfVar3[3] * 3.0;
  auVar38 = vsubps_avx(auVar295,auVar357);
  fVar339 = *pfVar2 * 0.0;
  fVar351 = pfVar2[1] * 0.0;
  fVar353 = pfVar2[2] * 0.0;
  fVar355 = pfVar2[3] * 0.0;
  auVar296._0_4_ = fVar339 + auVar38._0_4_;
  auVar296._4_4_ = fVar351 + auVar38._4_4_;
  auVar296._8_4_ = fVar353 + auVar38._8_4_;
  auVar296._12_4_ = fVar355 + auVar38._12_4_;
  auVar358._0_4_ = fVar152 + fVar339 + fVar386;
  auVar358._4_4_ = fVar206 + fVar351 + fVar394;
  auVar358._8_4_ = fVar178 + fVar353 + fVar395;
  auVar358._12_4_ = fVar207 + fVar355 + fVar396;
  auVar327._0_4_ = fVar152 * 0.0;
  auVar327._4_4_ = fVar206 * 0.0;
  auVar327._8_4_ = fVar178 * 0.0;
  auVar327._12_4_ = fVar207 * 0.0;
  local_468._0_4_ = auVar327._0_4_ + fVar339 + fVar368 + fVar338;
  local_468._4_4_ = auVar327._4_4_ + fVar351 + fVar208 + fVar350;
  fStack_460 = auVar327._8_4_ + fVar353 + fVar377 + fVar352;
  fStack_45c = auVar327._12_4_ + fVar355 + fVar209 + fVar354;
  auVar280 = vsubps_avx(auVar296,auVar327);
  auVar125._0_4_ = fVar210 * 3.0;
  auVar125._4_4_ = fVar211 * 3.0;
  auVar125._8_4_ = fVar212 * 3.0;
  auVar125._12_4_ = fVar233 * 3.0;
  auVar218._0_4_ = auVar138._0_4_ * 3.0;
  auVar218._4_4_ = auVar138._4_4_ * 3.0;
  auVar218._8_4_ = auVar138._8_4_ * 3.0;
  auVar218._12_4_ = auVar138._12_4_ * 3.0;
  auVar138 = vsubps_avx(auVar125,auVar218);
  fVar152 = *pfVar4 * 0.0;
  fVar206 = pfVar4[1] * 0.0;
  fVar178 = pfVar4[2] * 0.0;
  fVar207 = pfVar4[3] * 0.0;
  auVar126._0_4_ = fVar152 + auVar138._0_4_;
  auVar126._4_4_ = fVar206 + auVar138._4_4_;
  auVar126._8_4_ = fVar178 + auVar138._8_4_;
  auVar126._12_4_ = fVar207 + auVar138._12_4_;
  auVar157._0_4_ = fVar234 + fVar152 + fVar356;
  auVar157._4_4_ = fVar235 + fVar206 + fVar364;
  auVar157._8_4_ = fVar236 + fVar178 + fVar365;
  auVar157._12_4_ = fVar237 + fVar207 + fVar366;
  auVar107._0_4_ = fVar234 * 0.0;
  auVar107._4_4_ = fVar235 * 0.0;
  auVar107._8_4_ = fVar236 * 0.0;
  auVar107._12_4_ = fVar237 * 0.0;
  auVar184._0_4_ = auVar107._0_4_ + fVar152 + fVar261 + fVar210;
  auVar184._4_4_ = auVar107._4_4_ + fVar206 + fVar262 + fVar211;
  auVar184._8_4_ = auVar107._8_4_ + fVar178 + fVar263 + fVar212;
  auVar184._12_4_ = auVar107._12_4_ + fVar207 + fVar264 + fVar233;
  auVar256 = vsubps_avx(auVar126,auVar107);
  auVar138 = vshufps_avx(auVar157,auVar157,0xc9);
  fVar209 = auVar10._0_4_;
  auVar127._0_4_ = fVar209 * auVar138._0_4_;
  fVar210 = auVar10._4_4_;
  auVar127._4_4_ = fVar210 * auVar138._4_4_;
  fVar211 = auVar10._8_4_;
  auVar127._8_4_ = fVar211 * auVar138._8_4_;
  fVar212 = auVar10._12_4_;
  auVar127._12_4_ = fVar212 * auVar138._12_4_;
  auVar138 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar158._0_4_ = auVar138._0_4_ * auVar157._0_4_;
  auVar158._4_4_ = auVar138._4_4_ * auVar157._4_4_;
  auVar158._8_4_ = auVar138._8_4_ * auVar157._8_4_;
  auVar158._12_4_ = auVar138._12_4_ * auVar157._12_4_;
  auVar38 = vsubps_avx(auVar158,auVar127);
  auVar159._0_4_ = auVar186._0_4_ * auVar138._0_4_;
  auVar159._4_4_ = auVar186._4_4_ * auVar138._4_4_;
  auVar159._8_4_ = auVar186._8_4_ * auVar138._8_4_;
  auVar159._12_4_ = auVar186._12_4_ * auVar138._12_4_;
  auVar138 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar219._0_4_ = fVar209 * auVar138._0_4_;
  auVar219._4_4_ = fVar210 * auVar138._4_4_;
  auVar219._8_4_ = fVar211 * auVar138._8_4_;
  auVar219._12_4_ = fVar212 * auVar138._12_4_;
  auVar160 = vsubps_avx(auVar159,auVar219);
  auVar138 = vshufps_avx(auVar184,auVar184,0xc9);
  fVar233 = auVar280._0_4_;
  auVar220._0_4_ = fVar233 * auVar138._0_4_;
  fVar234 = auVar280._4_4_;
  auVar220._4_4_ = fVar234 * auVar138._4_4_;
  fVar235 = auVar280._8_4_;
  auVar220._8_4_ = fVar235 * auVar138._8_4_;
  fVar236 = auVar280._12_4_;
  auVar220._12_4_ = fVar236 * auVar138._12_4_;
  auVar138 = vshufps_avx(auVar280,auVar280,0xc9);
  auVar185._0_4_ = auVar138._0_4_ * auVar184._0_4_;
  auVar185._4_4_ = auVar138._4_4_ * auVar184._4_4_;
  auVar185._8_4_ = auVar138._8_4_ * auVar184._8_4_;
  auVar185._12_4_ = auVar138._12_4_ * auVar184._12_4_;
  auVar137 = vsubps_avx(auVar185,auVar220);
  auVar38 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar128._0_4_ = auVar138._0_4_ * auVar256._0_4_;
  auVar128._4_4_ = auVar138._4_4_ * auVar256._4_4_;
  auVar128._8_4_ = auVar138._8_4_ * auVar256._8_4_;
  auVar128._12_4_ = auVar138._12_4_ * auVar256._12_4_;
  auVar186 = vshufps_avx(auVar256,auVar256,0xc9);
  auVar138 = vdpps_avx(auVar38,auVar38,0x7f);
  auVar108._0_4_ = fVar233 * auVar186._0_4_;
  auVar108._4_4_ = fVar234 * auVar186._4_4_;
  auVar108._8_4_ = fVar235 * auVar186._8_4_;
  auVar108._12_4_ = fVar236 * auVar186._12_4_;
  auVar12 = vsubps_avx(auVar128,auVar108);
  auVar256 = vshufps_avx(auVar160,auVar160,0xc9);
  fVar152 = auVar138._0_4_;
  auVar160 = ZEXT416((uint)fVar152);
  auVar186 = vrsqrtss_avx(auVar160,auVar160);
  fVar206 = auVar186._0_4_;
  auVar186 = vdpps_avx(auVar38,auVar256,0x7f);
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar109._0_4_ = auVar138._0_4_ * auVar256._0_4_;
  auVar109._4_4_ = auVar138._4_4_ * auVar256._4_4_;
  auVar109._8_4_ = auVar138._8_4_ * auVar256._8_4_;
  auVar109._12_4_ = auVar138._12_4_ * auVar256._12_4_;
  auVar138 = vshufps_avx(auVar186,auVar186,0);
  auVar245._0_4_ = auVar38._0_4_ * auVar138._0_4_;
  auVar245._4_4_ = auVar38._4_4_ * auVar138._4_4_;
  auVar245._8_4_ = auVar38._8_4_ * auVar138._8_4_;
  auVar245._12_4_ = auVar38._12_4_ * auVar138._12_4_;
  auVar13 = vsubps_avx(auVar109,auVar245);
  auVar138 = vrcpss_avx(auVar160,auVar160);
  auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - fVar152 * auVar138._0_4_)));
  auVar256 = vshufps_avx(auVar138,auVar138,0);
  auVar160 = vshufps_avx(auVar137,auVar137,0xc9);
  auVar138 = ZEXT416((uint)(fVar206 * 1.5 - fVar152 * 0.5 * fVar206 * fVar206 * fVar206));
  auVar137 = vshufps_avx(auVar138,auVar138,0);
  auVar138 = vdpps_avx(auVar160,auVar160,0x7f);
  fVar368 = auVar38._0_4_ * auVar137._0_4_;
  fVar208 = auVar38._4_4_ * auVar137._4_4_;
  fVar377 = auVar38._8_4_ * auVar137._8_4_;
  fVar237 = auVar38._12_4_ * auVar137._12_4_;
  auVar38 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar206 = auVar138._0_4_;
  auVar161 = ZEXT416((uint)fVar206);
  auVar186 = vrsqrtss_avx(auVar161,auVar161);
  fVar152 = auVar186._0_4_;
  auVar186 = vdpps_avx(auVar160,auVar38,0x7f);
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar129._0_4_ = auVar138._0_4_ * auVar38._0_4_;
  auVar129._4_4_ = auVar138._4_4_ * auVar38._4_4_;
  auVar129._8_4_ = auVar138._8_4_ * auVar38._8_4_;
  auVar129._12_4_ = auVar138._12_4_ * auVar38._12_4_;
  auVar138 = vshufps_avx(auVar186,auVar186,0);
  auVar246._0_4_ = auVar160._0_4_ * auVar138._0_4_;
  auVar246._4_4_ = auVar160._4_4_ * auVar138._4_4_;
  auVar246._8_4_ = auVar160._8_4_ * auVar138._8_4_;
  auVar246._12_4_ = auVar160._12_4_ * auVar138._12_4_;
  auVar12 = vsubps_avx(auVar129,auVar246);
  auVar138 = vrcpss_avx(auVar161,auVar161);
  auVar138 = ZEXT416((uint)(auVar138._0_4_ * (2.0 - fVar206 * auVar138._0_4_)));
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  auVar186 = ZEXT416((uint)(fVar152 * 1.5 - fVar206 * 0.5 * fVar152 * fVar152 * fVar152));
  auVar186 = vshufps_avx(auVar186,auVar186,0);
  fVar152 = auVar160._0_4_ * auVar186._0_4_;
  fVar206 = auVar160._4_4_ * auVar186._4_4_;
  fVar178 = auVar160._8_4_ * auVar186._8_4_;
  fVar207 = auVar160._12_4_ * auVar186._12_4_;
  auVar38 = vshufps_avx(auVar10,auVar10,0xff);
  auVar160 = vshufps_avx(auVar358,auVar358,0xff);
  auVar221._0_4_ = fVar368 * auVar160._0_4_;
  auVar221._4_4_ = fVar208 * auVar160._4_4_;
  auVar221._8_4_ = fVar377 * auVar160._8_4_;
  auVar221._12_4_ = fVar237 * auVar160._12_4_;
  auVar162._0_4_ =
       fVar368 * auVar38._0_4_ + auVar137._0_4_ * auVar13._0_4_ * auVar256._0_4_ * auVar160._0_4_;
  auVar162._4_4_ =
       fVar208 * auVar38._4_4_ + auVar137._4_4_ * auVar13._4_4_ * auVar256._4_4_ * auVar160._4_4_;
  auVar162._8_4_ =
       fVar377 * auVar38._8_4_ + auVar137._8_4_ * auVar13._8_4_ * auVar256._8_4_ * auVar160._8_4_;
  auVar162._12_4_ =
       fVar237 * auVar38._12_4_ +
       auVar137._12_4_ * auVar13._12_4_ * auVar256._12_4_ * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar358,auVar221);
  auVar137 = vsubps_avx(auVar10,auVar162);
  auVar38 = vshufps_avx(auVar280,auVar280,0xff);
  auVar256 = vshufps_avx(_local_468,_local_468,0xff);
  auVar110._0_4_ = auVar256._0_4_ * fVar152;
  auVar110._4_4_ = auVar256._4_4_ * fVar206;
  auVar110._8_4_ = auVar256._8_4_ * fVar178;
  auVar110._12_4_ = auVar256._12_4_ * fVar207;
  auVar130._0_4_ =
       auVar38._0_4_ * fVar152 + auVar256._0_4_ * auVar186._0_4_ * auVar12._0_4_ * auVar138._0_4_;
  auVar130._4_4_ =
       auVar38._4_4_ * fVar206 + auVar256._4_4_ * auVar186._4_4_ * auVar12._4_4_ * auVar138._4_4_;
  auVar130._8_4_ =
       auVar38._8_4_ * fVar178 + auVar256._8_4_ * auVar186._8_4_ * auVar12._8_4_ * auVar138._8_4_;
  auVar130._12_4_ =
       auVar38._12_4_ * fVar207 +
       auVar256._12_4_ * auVar186._12_4_ * auVar12._12_4_ * auVar138._12_4_;
  auVar38 = vsubps_avx(_local_468,auVar110);
  local_468._0_4_ = (float)local_468._0_4_ + auVar110._0_4_;
  local_468._4_4_ = (float)local_468._4_4_ + auVar110._4_4_;
  fStack_460 = fStack_460 + auVar110._8_4_;
  fStack_45c = fStack_45c + auVar110._12_4_;
  auVar256 = vsubps_avx(auVar280,auVar130);
  local_3b8._0_4_ = auVar194._0_4_;
  local_3b8._4_4_ = auVar194._4_4_;
  fStack_3b0 = auVar194._8_4_;
  fStack_3ac = auVar194._12_4_;
  local_428._0_4_ = auVar11._0_4_;
  local_428._4_4_ = auVar11._4_4_;
  fStack_420 = auVar11._8_4_;
  fStack_41c = auVar11._12_4_;
  auVar138 = vshufps_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar179),0);
  auVar186 = vshufps_avx(ZEXT416((uint)(1.0 - fVar179)),ZEXT416((uint)(1.0 - fVar179)),0);
  fVar207 = auVar138._0_4_;
  fVar368 = auVar138._4_4_;
  fVar208 = auVar138._8_4_;
  fVar377 = auVar138._12_4_;
  fVar179 = auVar186._0_4_;
  fVar152 = auVar186._4_4_;
  fVar206 = auVar186._8_4_;
  fVar178 = auVar186._12_4_;
  local_328._0_4_ = fVar179 * (float)local_428._0_4_ + fVar207 * auVar160._0_4_;
  local_328._4_4_ = fVar152 * (float)local_428._4_4_ + fVar368 * auVar160._4_4_;
  fStack_320 = fVar206 * fStack_420 + fVar208 * auVar160._8_4_;
  fStack_31c = fVar178 * fStack_41c + fVar377 * auVar160._12_4_;
  local_338._0_4_ =
       fVar179 * ((float)local_428._0_4_ + (float)local_3b8._0_4_ * 0.33333334) +
       fVar207 * (auVar160._0_4_ + auVar137._0_4_ * 0.33333334);
  local_338._4_4_ =
       fVar152 * ((float)local_428._4_4_ + (float)local_3b8._4_4_ * 0.33333334) +
       fVar368 * (auVar160._4_4_ + auVar137._4_4_ * 0.33333334);
  fStack_330 = fVar206 * (fStack_420 + fStack_3b0 * 0.33333334) +
               fVar208 * (auVar160._8_4_ + auVar137._8_4_ * 0.33333334);
  fStack_32c = fVar178 * (fStack_41c + fStack_3ac * 0.33333334) +
               fVar377 * (auVar160._12_4_ + auVar137._12_4_ * 0.33333334);
  local_408._0_4_ = auVar165._0_4_;
  local_408._4_4_ = auVar165._4_4_;
  fStack_400 = auVar165._8_4_;
  fStack_3fc = auVar165._12_4_;
  auVar187._0_4_ = (float)local_408._0_4_ * 0.33333334;
  auVar187._4_4_ = (float)local_408._4_4_ * 0.33333334;
  auVar187._8_4_ = fStack_400 * 0.33333334;
  auVar187._12_4_ = fStack_3fc * 0.33333334;
  auVar138 = vsubps_avx(auVar113,auVar187);
  auVar247._0_4_ = (fVar367 + auVar105._0_4_) * 0.33333334;
  auVar247._4_4_ = (fVar375 + auVar105._4_4_) * 0.33333334;
  auVar247._8_4_ = (fVar376 + auVar105._8_4_) * 0.33333334;
  auVar247._12_4_ = (fVar378 + auVar105._12_4_) * 0.33333334;
  auVar186 = vsubps_avx(_local_448,auVar247);
  auVar163._0_4_ = auVar256._0_4_ * 0.33333334;
  auVar163._4_4_ = auVar256._4_4_ * 0.33333334;
  auVar163._8_4_ = auVar256._8_4_ * 0.33333334;
  auVar163._12_4_ = auVar256._12_4_ * 0.33333334;
  auVar256 = vsubps_avx(auVar38,auVar163);
  auVar131._0_4_ = (fVar233 + auVar130._0_4_) * 0.33333334;
  auVar131._4_4_ = (fVar234 + auVar130._4_4_) * 0.33333334;
  auVar131._8_4_ = (fVar235 + auVar130._8_4_) * 0.33333334;
  auVar131._12_4_ = (fVar236 + auVar130._12_4_) * 0.33333334;
  auVar160 = vsubps_avx(_local_468,auVar131);
  local_348._0_4_ = fVar179 * auVar138._0_4_ + fVar207 * auVar256._0_4_;
  local_348._4_4_ = fVar152 * auVar138._4_4_ + fVar368 * auVar256._4_4_;
  fStack_340 = fVar206 * auVar138._8_4_ + fVar208 * auVar256._8_4_;
  fStack_33c = fVar178 * auVar138._12_4_ + fVar377 * auVar256._12_4_;
  local_358._0_4_ = fVar207 * auVar38._0_4_ + auVar113._0_4_ * fVar179;
  local_358._4_4_ = fVar368 * auVar38._4_4_ + auVar113._4_4_ * fVar152;
  fStack_350 = fVar208 * auVar38._8_4_ + auVar113._8_4_ * fVar206;
  fStack_34c = fVar377 * auVar38._12_4_ + auVar113._12_4_ * fVar178;
  local_368._0_4_ = fVar179 * (float)local_4a8._0_4_ + fVar207 * (auVar358._0_4_ + auVar221._0_4_);
  local_368._4_4_ = fVar152 * (float)local_4a8._4_4_ + fVar368 * (auVar358._4_4_ + auVar221._4_4_);
  fStack_360 = fVar206 * fStack_4a0 + fVar208 * (auVar358._8_4_ + auVar221._8_4_);
  fStack_35c = fVar178 * fStack_49c + fVar377 * (auVar358._12_4_ + auVar221._12_4_);
  local_378._0_4_ =
       ((float)local_4a8._0_4_ + (fVar238 + auVar277._0_4_) * 0.33333334) * fVar179 +
       fVar207 * (auVar358._0_4_ + auVar221._0_4_ + (fVar209 + auVar162._0_4_) * 0.33333334);
  local_378._4_4_ =
       ((float)local_4a8._4_4_ + (fVar239 + auVar277._4_4_) * 0.33333334) * fVar152 +
       fVar368 * (auVar358._4_4_ + auVar221._4_4_ + (fVar210 + auVar162._4_4_) * 0.33333334);
  fStack_370 = (fStack_4a0 + (fVar259 + auVar277._8_4_) * 0.33333334) * fVar206 +
               fVar208 * (auVar358._8_4_ + auVar221._8_4_ + (fVar211 + auVar162._8_4_) * 0.33333334)
  ;
  fStack_36c = (fStack_49c + (fVar260 + auVar277._12_4_) * 0.33333334) * fVar178 +
               fVar377 * (auVar358._12_4_ + auVar221._12_4_ +
                         (fVar212 + auVar162._12_4_) * 0.33333334);
  local_498._0_4_ = auVar186._0_4_;
  local_498._4_4_ = auVar186._4_4_;
  fStack_490 = auVar186._8_4_;
  fStack_48c = auVar186._12_4_;
  local_388 = fVar179 * (float)local_498._0_4_ + fVar207 * auVar160._0_4_;
  fStack_384 = fVar152 * (float)local_498._4_4_ + fVar368 * auVar160._4_4_;
  fStack_380 = fVar206 * fStack_490 + fVar208 * auVar160._8_4_;
  fStack_37c = fVar178 * fStack_48c + fVar377 * auVar160._12_4_;
  local_398 = (auVar267._0_4_ + auVar155._0_4_) * fVar179 + fVar207 * (float)local_468._0_4_;
  fStack_394 = (auVar267._4_4_ + auVar155._4_4_) * fVar152 + fVar368 * (float)local_468._4_4_;
  fStack_390 = (auVar267._8_4_ + auVar155._8_4_) * fVar206 + fVar208 * fStack_460;
  fStack_38c = (auVar267._12_4_ + auVar155._12_4_) * fVar178 + fVar377 * fStack_45c;
  aVar9 = (ray->org).field_0;
  auVar38 = vsubps_avx(_local_328,(undefined1  [16])aVar9);
  auVar186 = vmovsldup_avx(auVar38);
  auVar138 = vmovshdup_avx(auVar38);
  auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
  fVar179 = (pre->ray_space).vx.field_0.m128[0];
  fVar152 = (pre->ray_space).vx.field_0.m128[1];
  fVar206 = (pre->ray_space).vx.field_0.m128[2];
  fVar178 = (pre->ray_space).vx.field_0.m128[3];
  fVar207 = (pre->ray_space).vy.field_0.m128[0];
  fVar368 = (pre->ray_space).vy.field_0.m128[1];
  fVar208 = (pre->ray_space).vy.field_0.m128[2];
  fVar377 = (pre->ray_space).vy.field_0.m128[3];
  fVar209 = (pre->ray_space).vz.field_0.m128[0];
  fVar210 = (pre->ray_space).vz.field_0.m128[1];
  fVar211 = (pre->ray_space).vz.field_0.m128[2];
  fVar212 = (pre->ray_space).vz.field_0.m128[3];
  local_498._4_4_ = fVar152 * auVar186._4_4_ + fVar368 * auVar138._4_4_ + fVar210 * auVar38._4_4_;
  local_498._0_4_ = fVar179 * auVar186._0_4_ + fVar207 * auVar138._0_4_ + fVar209 * auVar38._0_4_;
  fStack_490 = fVar206 * auVar186._8_4_ + fVar208 * auVar138._8_4_ + fVar211 * auVar38._8_4_;
  fStack_48c = fVar178 * auVar186._12_4_ + fVar377 * auVar138._12_4_ + fVar212 * auVar38._12_4_;
  auVar38 = vsubps_avx(_local_338,(undefined1  [16])aVar9);
  auVar186 = vmovsldup_avx(auVar38);
  auVar138 = vmovshdup_avx(auVar38);
  auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
  local_4a8._4_4_ = fVar152 * auVar186._4_4_ + fVar368 * auVar138._4_4_ + fVar210 * auVar38._4_4_;
  local_4a8._0_4_ = fVar179 * auVar186._0_4_ + fVar207 * auVar138._0_4_ + fVar209 * auVar38._0_4_;
  fStack_4a0 = fVar206 * auVar186._8_4_ + fVar208 * auVar138._8_4_ + fVar211 * auVar38._8_4_;
  fStack_49c = fVar178 * auVar186._12_4_ + fVar377 * auVar138._12_4_ + fVar212 * auVar38._12_4_;
  auVar186 = vsubps_avx(_local_348,(undefined1  [16])aVar9);
  auVar38 = vshufps_avx(auVar186,auVar186,0xaa);
  auVar138 = vmovshdup_avx(auVar186);
  auVar186 = vmovsldup_avx(auVar186);
  auVar132._0_8_ =
       CONCAT44(fVar152 * auVar186._4_4_ + auVar138._4_4_ * fVar368 + fVar210 * auVar38._4_4_,
                fVar179 * auVar186._0_4_ + auVar138._0_4_ * fVar207 + fVar209 * auVar38._0_4_);
  auVar132._8_4_ = fVar206 * auVar186._8_4_ + auVar138._8_4_ * fVar208 + fVar211 * auVar38._8_4_;
  auVar132._12_4_ = fVar178 * auVar186._12_4_ + auVar138._12_4_ * fVar377 + fVar212 * auVar38._12_4_
  ;
  auVar186 = vsubps_avx(_local_358,(undefined1  [16])aVar9);
  auVar38 = vshufps_avx(auVar186,auVar186,0xaa);
  auVar138 = vmovshdup_avx(auVar186);
  auVar186 = vmovsldup_avx(auVar186);
  auVar278._0_4_ = auVar138._0_4_ * fVar207 + auVar38._0_4_ * fVar209 + fVar179 * auVar186._0_4_;
  auVar278._4_4_ = auVar138._4_4_ * fVar368 + auVar38._4_4_ * fVar210 + fVar152 * auVar186._4_4_;
  auVar278._8_4_ = auVar138._8_4_ * fVar208 + auVar38._8_4_ * fVar211 + fVar206 * auVar186._8_4_;
  auVar278._12_4_ = auVar138._12_4_ * fVar377 + auVar38._12_4_ * fVar212 + fVar178 * auVar186._12_4_
  ;
  auVar186 = vsubps_avx(_local_368,(undefined1  [16])aVar9);
  auVar38 = vshufps_avx(auVar186,auVar186,0xaa);
  auVar138 = vmovshdup_avx(auVar186);
  auVar186 = vmovsldup_avx(auVar186);
  auVar297._0_4_ = auVar186._0_4_ * fVar179 + auVar138._0_4_ * fVar207 + auVar38._0_4_ * fVar209;
  auVar297._4_4_ = auVar186._4_4_ * fVar152 + auVar138._4_4_ * fVar368 + auVar38._4_4_ * fVar210;
  auVar297._8_4_ = auVar186._8_4_ * fVar206 + auVar138._8_4_ * fVar208 + auVar38._8_4_ * fVar211;
  auVar297._12_4_ = auVar186._12_4_ * fVar178 + auVar138._12_4_ * fVar377 + auVar38._12_4_ * fVar212
  ;
  auVar186 = vsubps_avx(_local_378,(undefined1  [16])aVar9);
  auVar38 = vshufps_avx(auVar186,auVar186,0xaa);
  auVar138 = vmovshdup_avx(auVar186);
  auVar186 = vmovsldup_avx(auVar186);
  auVar313._0_4_ = auVar186._0_4_ * fVar179 + auVar138._0_4_ * fVar207 + auVar38._0_4_ * fVar209;
  auVar313._4_4_ = auVar186._4_4_ * fVar152 + auVar138._4_4_ * fVar368 + auVar38._4_4_ * fVar210;
  auVar313._8_4_ = auVar186._8_4_ * fVar206 + auVar138._8_4_ * fVar208 + auVar38._8_4_ * fVar211;
  auVar313._12_4_ = auVar186._12_4_ * fVar178 + auVar138._12_4_ * fVar377 + auVar38._12_4_ * fVar212
  ;
  auVar83._4_4_ = fStack_384;
  auVar83._0_4_ = local_388;
  auVar83._8_4_ = fStack_380;
  auVar83._12_4_ = fStack_37c;
  auVar186 = vsubps_avx(auVar83,(undefined1  [16])aVar9);
  auVar38 = vshufps_avx(auVar186,auVar186,0xaa);
  auVar138 = vmovshdup_avx(auVar186);
  auVar186 = vmovsldup_avx(auVar186);
  auVar328._0_4_ = auVar186._0_4_ * fVar179 + auVar138._0_4_ * fVar207 + auVar38._0_4_ * fVar209;
  auVar328._4_4_ = auVar186._4_4_ * fVar152 + auVar138._4_4_ * fVar368 + auVar38._4_4_ * fVar210;
  auVar328._8_4_ = auVar186._8_4_ * fVar206 + auVar138._8_4_ * fVar208 + auVar38._8_4_ * fVar211;
  auVar328._12_4_ = auVar186._12_4_ * fVar178 + auVar138._12_4_ * fVar377 + auVar38._12_4_ * fVar212
  ;
  auVar80._4_4_ = fStack_394;
  auVar80._0_4_ = local_398;
  auVar80._8_4_ = fStack_390;
  auVar80._12_4_ = fStack_38c;
  auVar186 = vsubps_avx(auVar80,(undefined1  [16])aVar9);
  auVar38 = vshufps_avx(auVar186,auVar186,0xaa);
  auVar138 = vmovshdup_avx(auVar186);
  auVar186 = vmovsldup_avx(auVar186);
  auVar111._0_8_ =
       CONCAT44(fVar152 * auVar186._4_4_ + auVar138._4_4_ * fVar368 + auVar38._4_4_ * fVar210,
                fVar179 * auVar186._0_4_ + auVar138._0_4_ * fVar207 + auVar38._0_4_ * fVar209);
  auVar111._8_4_ = fVar206 * auVar186._8_4_ + auVar138._8_4_ * fVar208 + auVar38._8_4_ * fVar211;
  auVar111._12_4_ = fVar178 * auVar186._12_4_ + auVar138._12_4_ * fVar377 + auVar38._12_4_ * fVar212
  ;
  _local_3e8 = vmovlhps_avx(_local_498,auVar297);
  _local_3f8 = vmovlhps_avx(_local_4a8,auVar313);
  _local_408 = vmovlhps_avx(auVar132,auVar328);
  _local_298 = vmovlhps_avx(auVar278,auVar111);
  auVar138 = vminps_avx(_local_3e8,_local_3f8);
  auVar186 = vminps_avx(_local_408,_local_298);
  auVar38 = vminps_avx(auVar138,auVar186);
  auVar138 = vmaxps_avx(_local_3e8,_local_3f8);
  auVar186 = vmaxps_avx(_local_408,_local_298);
  auVar138 = vmaxps_avx(auVar138,auVar186);
  auVar186 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vminps_avx(auVar38,auVar186);
  auVar186 = vshufpd_avx(auVar138,auVar138,3);
  auVar186 = vmaxps_avx(auVar138,auVar186);
  auVar268._8_4_ = 0x7fffffff;
  auVar268._0_8_ = 0x7fffffff7fffffff;
  auVar268._12_4_ = 0x7fffffff;
  auVar138 = vandps_avx(auVar38,auVar268);
  auVar186 = vandps_avx(auVar186,auVar268);
  auVar138 = vmaxps_avx(auVar138,auVar186);
  auVar186 = vmovshdup_avx(auVar138);
  auVar138 = vmaxss_avx(auVar186,auVar138);
  fVar179 = auVar138._0_4_ * 9.536743e-07;
  register0x00001388 = local_498;
  local_2f8 = local_498;
  register0x00001548 = local_4a8;
  local_288 = local_4a8;
  register0x00001588 = auVar132._0_8_;
  local_308 = auVar132._0_8_;
  register0x000013c8 = auVar111._0_8_;
  local_318 = auVar111._0_8_;
  auVar138 = vshufps_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar179),0);
  local_138._16_16_ = auVar138;
  local_138._0_16_ = auVar138;
  auVar112._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
  auVar112._8_4_ = auVar138._8_4_ ^ 0x80000000;
  auVar112._12_4_ = auVar138._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar112;
  local_158._0_16_ = auVar112;
  bVar86 = false;
  uVar91 = 0;
  _local_1c8 = vsubps_avx(_local_3f8,_local_3e8);
  _local_1d8 = vsubps_avx(_local_408,_local_3f8);
  _local_1e8 = vsubps_avx(_local_298,_local_408);
  _local_208 = vsubps_avx(_local_368,_local_328);
  _local_218 = vsubps_avx(_local_378,_local_338);
  auVar84._4_4_ = fStack_384;
  auVar84._0_4_ = local_388;
  auVar84._8_4_ = fStack_380;
  auVar84._12_4_ = fStack_37c;
  _local_228 = vsubps_avx(auVar84,_local_348);
  auVar81._4_4_ = fStack_394;
  auVar81._0_4_ = local_398;
  auVar81._8_4_ = fStack_390;
  auVar81._12_4_ = fStack_38c;
  _local_238 = vsubps_avx(auVar81,_local_358);
  _local_4a8 = ZEXT816(0x3f80000000000000);
  local_1f8 = _local_4a8;
  do {
    auVar138 = vshufps_avx(_local_4a8,_local_4a8,0x50);
    auVar388._8_4_ = 0x3f800000;
    auVar388._0_8_ = &DAT_3f8000003f800000;
    auVar388._12_4_ = 0x3f800000;
    auVar393._16_4_ = 0x3f800000;
    auVar393._0_16_ = auVar388;
    auVar393._20_4_ = 0x3f800000;
    auVar393._24_4_ = 0x3f800000;
    auVar393._28_4_ = 0x3f800000;
    auVar186 = vsubps_avx(auVar388,auVar138);
    fVar152 = auVar138._0_4_;
    fVar206 = auVar138._4_4_;
    fVar178 = auVar138._8_4_;
    fVar207 = auVar138._12_4_;
    fVar368 = auVar186._0_4_;
    fVar208 = auVar186._4_4_;
    fVar377 = auVar186._8_4_;
    fVar209 = auVar186._12_4_;
    auVar164._0_4_ = auVar297._0_4_ * fVar152 + fVar368 * local_2f8._0_4_;
    auVar164._4_4_ = auVar297._4_4_ * fVar206 + fVar208 * local_2f8._4_4_;
    auVar164._8_4_ = auVar297._0_4_ * fVar178 + fVar377 * local_2f8._8_4_;
    auVar164._12_4_ = auVar297._4_4_ * fVar207 + fVar209 * local_2f8._12_4_;
    auVar133._0_4_ = auVar313._0_4_ * fVar152 + local_288._0_4_ * fVar368;
    auVar133._4_4_ = auVar313._4_4_ * fVar206 + local_288._4_4_ * fVar208;
    auVar133._8_4_ = auVar313._0_4_ * fVar178 + local_288._8_4_ * fVar377;
    auVar133._12_4_ = auVar313._4_4_ * fVar207 + local_288._12_4_ * fVar209;
    auVar279._0_4_ = auVar328._0_4_ * fVar152 + local_308._0_4_ * fVar368;
    auVar279._4_4_ = auVar328._4_4_ * fVar206 + local_308._4_4_ * fVar208;
    auVar279._8_4_ = auVar328._0_4_ * fVar178 + local_308._8_4_ * fVar377;
    auVar279._12_4_ = auVar328._4_4_ * fVar207 + local_308._12_4_ * fVar209;
    auVar188._0_4_ = local_318._0_4_ * fVar152 + auVar278._0_4_ * fVar368;
    auVar188._4_4_ = local_318._4_4_ * fVar206 + auVar278._4_4_ * fVar208;
    auVar188._8_4_ = local_318._8_4_ * fVar178 + auVar278._0_4_ * fVar377;
    auVar188._12_4_ = local_318._12_4_ * fVar207 + auVar278._4_4_ * fVar209;
    auVar138 = vmovshdup_avx(local_1f8);
    auVar186 = vshufps_avx(local_1f8,local_1f8,0);
    auVar311._16_16_ = auVar186;
    auVar311._0_16_ = auVar186;
    auVar38 = vshufps_avx(local_1f8,local_1f8,0x55);
    auVar119._16_16_ = auVar38;
    auVar119._0_16_ = auVar38;
    auVar115 = vsubps_avx(auVar119,auVar311);
    auVar38 = vshufps_avx(auVar164,auVar164,0);
    auVar256 = vshufps_avx(auVar164,auVar164,0x55);
    auVar160 = vshufps_avx(auVar133,auVar133,0);
    auVar137 = vshufps_avx(auVar133,auVar133,0x55);
    auVar194 = vshufps_avx(auVar279,auVar279,0);
    auVar113 = vshufps_avx(auVar279,auVar279,0x55);
    auVar165 = vshufps_avx(auVar188,auVar188,0);
    auVar10 = vshufps_avx(auVar188,auVar188,0x55);
    auVar138 = ZEXT416((uint)((auVar138._0_4_ - local_1f8._0_4_) * 0.04761905));
    auVar138 = vshufps_avx(auVar138,auVar138,0);
    auVar326._0_4_ = auVar186._0_4_ + auVar115._0_4_ * 0.0;
    auVar326._4_4_ = auVar186._4_4_ + auVar115._4_4_ * 0.14285715;
    auVar326._8_4_ = auVar186._8_4_ + auVar115._8_4_ * 0.2857143;
    auVar326._12_4_ = auVar186._12_4_ + auVar115._12_4_ * 0.42857146;
    auVar326._16_4_ = auVar186._0_4_ + auVar115._16_4_ * 0.5714286;
    auVar326._20_4_ = auVar186._4_4_ + auVar115._20_4_ * 0.71428573;
    auVar326._24_4_ = auVar186._8_4_ + auVar115._24_4_ * 0.8571429;
    auVar326._28_4_ = auVar186._12_4_ + auVar115._28_4_;
    auVar31 = vsubps_avx(auVar393,auVar326);
    fVar235 = auVar160._0_4_;
    fVar237 = auVar160._4_4_;
    fVar261 = auVar160._8_4_;
    fVar263 = auVar160._12_4_;
    fVar152 = auVar31._0_4_;
    fVar368 = auVar31._4_4_;
    fVar210 = auVar31._8_4_;
    fVar234 = auVar31._12_4_;
    fVar394 = auVar38._12_4_;
    fVar238 = auVar31._16_4_;
    fVar239 = auVar31._20_4_;
    fVar259 = auVar31._24_4_;
    fVar354 = auVar137._0_4_;
    fVar364 = auVar137._4_4_;
    fVar366 = auVar137._8_4_;
    fVar339 = auVar137._12_4_;
    local_3d8._0_4_ = auVar256._0_4_;
    local_3d8._4_4_ = auVar256._4_4_;
    fStack_3d0 = auVar256._8_4_;
    fStack_3cc = auVar256._12_4_;
    fVar206 = auVar194._0_4_;
    fVar207 = auVar194._4_4_;
    fVar377 = auVar194._8_4_;
    fVar211 = auVar194._12_4_;
    fVar236 = auVar326._0_4_ * fVar206 + fVar235 * fVar152;
    fVar260 = auVar326._4_4_ * fVar207 + fVar237 * fVar368;
    fVar262 = auVar326._8_4_ * fVar377 + fVar261 * fVar210;
    fVar264 = auVar326._12_4_ * fVar211 + fVar263 * fVar234;
    fVar338 = auVar326._16_4_ * fVar206 + fVar235 * fVar238;
    fVar350 = auVar326._20_4_ * fVar207 + fVar237 * fVar239;
    fVar352 = auVar326._24_4_ * fVar377 + fVar261 * fVar259;
    fVar178 = auVar113._0_4_;
    fVar208 = auVar113._4_4_;
    fVar209 = auVar113._8_4_;
    fVar212 = auVar113._12_4_;
    fVar356 = auVar326._0_4_ * fVar178 + fVar354 * fVar152;
    fVar365 = auVar326._4_4_ * fVar208 + fVar364 * fVar368;
    fVar367 = auVar326._8_4_ * fVar209 + fVar366 * fVar210;
    fVar375 = auVar326._12_4_ * fVar212 + fVar339 * fVar234;
    fVar376 = auVar326._16_4_ * fVar178 + fVar354 * fVar238;
    fVar378 = auVar326._20_4_ * fVar208 + fVar364 * fVar239;
    fVar351 = auVar326._24_4_ * fVar209 + fVar366 * fVar259;
    auVar186 = vshufps_avx(auVar164,auVar164,0xaa);
    auVar256 = vshufps_avx(auVar164,auVar164,0xff);
    fVar233 = fVar211 + 0.0;
    auVar160 = vshufps_avx(auVar133,auVar133,0xaa);
    auVar137 = vshufps_avx(auVar133,auVar133,0xff);
    auVar120._0_4_ =
         fVar152 * (fVar235 * auVar326._0_4_ + auVar38._0_4_ * fVar152) + auVar326._0_4_ * fVar236;
    auVar120._4_4_ =
         fVar368 * (fVar237 * auVar326._4_4_ + auVar38._4_4_ * fVar368) + auVar326._4_4_ * fVar260;
    auVar120._8_4_ =
         fVar210 * (fVar261 * auVar326._8_4_ + auVar38._8_4_ * fVar210) + auVar326._8_4_ * fVar262;
    auVar120._12_4_ =
         fVar234 * (fVar263 * auVar326._12_4_ + fVar394 * fVar234) + auVar326._12_4_ * fVar264;
    auVar120._16_4_ =
         fVar238 * (fVar235 * auVar326._16_4_ + auVar38._0_4_ * fVar238) + auVar326._16_4_ * fVar338
    ;
    auVar120._20_4_ =
         fVar239 * (fVar237 * auVar326._20_4_ + auVar38._4_4_ * fVar239) + auVar326._20_4_ * fVar350
    ;
    auVar120._24_4_ =
         fVar259 * (fVar261 * auVar326._24_4_ + auVar38._8_4_ * fVar259) + auVar326._24_4_ * fVar352
    ;
    auVar120._28_4_ = fVar394 + 1.0 + fVar212;
    auVar202._0_4_ =
         fVar152 * (fVar354 * auVar326._0_4_ + fVar152 * (float)local_3d8._0_4_) +
         auVar326._0_4_ * fVar356;
    auVar202._4_4_ =
         fVar368 * (fVar364 * auVar326._4_4_ + fVar368 * (float)local_3d8._4_4_) +
         auVar326._4_4_ * fVar365;
    auVar202._8_4_ =
         fVar210 * (fVar366 * auVar326._8_4_ + fVar210 * fStack_3d0) + auVar326._8_4_ * fVar367;
    auVar202._12_4_ =
         fVar234 * (fVar339 * auVar326._12_4_ + fVar234 * fStack_3cc) + auVar326._12_4_ * fVar375;
    auVar202._16_4_ =
         fVar238 * (fVar354 * auVar326._16_4_ + fVar238 * (float)local_3d8._0_4_) +
         auVar326._16_4_ * fVar376;
    auVar202._20_4_ =
         fVar239 * (fVar364 * auVar326._20_4_ + fVar239 * (float)local_3d8._4_4_) +
         auVar326._20_4_ * fVar378;
    auVar202._24_4_ =
         fVar259 * (fVar366 * auVar326._24_4_ + fVar259 * fStack_3d0) + auVar326._24_4_ * fVar351;
    auVar202._28_4_ = fVar394 + 1.0 + fVar212;
    auVar230._0_4_ =
         fVar152 * fVar236 + auVar326._0_4_ * (auVar165._0_4_ * auVar326._0_4_ + fVar152 * fVar206);
    auVar230._4_4_ =
         fVar368 * fVar260 + auVar326._4_4_ * (auVar165._4_4_ * auVar326._4_4_ + fVar368 * fVar207);
    auVar230._8_4_ =
         fVar210 * fVar262 + auVar326._8_4_ * (auVar165._8_4_ * auVar326._8_4_ + fVar210 * fVar377);
    auVar230._12_4_ =
         fVar234 * fVar264 +
         auVar326._12_4_ * (auVar165._12_4_ * auVar326._12_4_ + fVar234 * fVar211);
    auVar230._16_4_ =
         fVar238 * fVar338 +
         auVar326._16_4_ * (auVar165._0_4_ * auVar326._16_4_ + fVar238 * fVar206);
    auVar230._20_4_ =
         fVar239 * fVar350 +
         auVar326._20_4_ * (auVar165._4_4_ * auVar326._20_4_ + fVar239 * fVar207);
    auVar230._24_4_ =
         fVar259 * fVar352 +
         auVar326._24_4_ * (auVar165._8_4_ * auVar326._24_4_ + fVar259 * fVar377);
    auVar230._28_4_ = fVar212 + fVar233;
    auVar337._0_4_ =
         fVar152 * fVar356 + auVar326._0_4_ * (auVar10._0_4_ * auVar326._0_4_ + fVar152 * fVar178);
    auVar337._4_4_ =
         fVar368 * fVar365 + auVar326._4_4_ * (auVar10._4_4_ * auVar326._4_4_ + fVar368 * fVar208);
    auVar337._8_4_ =
         fVar210 * fVar367 + auVar326._8_4_ * (auVar10._8_4_ * auVar326._8_4_ + fVar210 * fVar209);
    auVar337._12_4_ =
         fVar234 * fVar375 +
         auVar326._12_4_ * (auVar10._12_4_ * auVar326._12_4_ + fVar234 * fVar212);
    auVar337._16_4_ =
         fVar238 * fVar376 + auVar326._16_4_ * (auVar10._0_4_ * auVar326._16_4_ + fVar238 * fVar178)
    ;
    auVar337._20_4_ =
         fVar239 * fVar378 + auVar326._20_4_ * (auVar10._4_4_ * auVar326._20_4_ + fVar239 * fVar208)
    ;
    auVar337._24_4_ =
         fVar259 * fVar351 + auVar326._24_4_ * (auVar10._8_4_ * auVar326._24_4_ + fVar259 * fVar209)
    ;
    auVar337._28_4_ = fVar233 + fVar212 + 0.0;
    local_78._0_4_ = fVar152 * auVar120._0_4_ + auVar326._0_4_ * auVar230._0_4_;
    local_78._4_4_ = fVar368 * auVar120._4_4_ + auVar326._4_4_ * auVar230._4_4_;
    local_78._8_4_ = fVar210 * auVar120._8_4_ + auVar326._8_4_ * auVar230._8_4_;
    local_78._12_4_ = fVar234 * auVar120._12_4_ + auVar326._12_4_ * auVar230._12_4_;
    local_78._16_4_ = fVar238 * auVar120._16_4_ + auVar326._16_4_ * auVar230._16_4_;
    local_78._20_4_ = fVar239 * auVar120._20_4_ + auVar326._20_4_ * auVar230._20_4_;
    local_78._24_4_ = fVar259 * auVar120._24_4_ + auVar326._24_4_ * auVar230._24_4_;
    local_78._28_4_ = fVar394 + fVar263 + fVar212 + 0.0;
    local_98._0_4_ = fVar152 * auVar202._0_4_ + auVar326._0_4_ * auVar337._0_4_;
    local_98._4_4_ = fVar368 * auVar202._4_4_ + auVar326._4_4_ * auVar337._4_4_;
    local_98._8_4_ = fVar210 * auVar202._8_4_ + auVar326._8_4_ * auVar337._8_4_;
    local_98._12_4_ = fVar234 * auVar202._12_4_ + auVar326._12_4_ * auVar337._12_4_;
    local_98._16_4_ = fVar238 * auVar202._16_4_ + auVar326._16_4_ * auVar337._16_4_;
    local_98._20_4_ = fVar239 * auVar202._20_4_ + auVar326._20_4_ * auVar337._20_4_;
    local_98._24_4_ = fVar259 * auVar202._24_4_ + auVar326._24_4_ * auVar337._24_4_;
    local_98._28_4_ = fVar394 + fVar263 + fVar233;
    auVar32 = vsubps_avx(auVar230,auVar120);
    auVar115 = vsubps_avx(auVar337,auVar202);
    local_468._0_4_ = auVar138._0_4_;
    local_468._4_4_ = auVar138._4_4_;
    fStack_460 = auVar138._8_4_;
    fStack_45c = auVar138._12_4_;
    local_d8 = (float)local_468._0_4_ * auVar32._0_4_ * 3.0;
    fStack_d4 = (float)local_468._4_4_ * auVar32._4_4_ * 3.0;
    auVar41._4_4_ = fStack_d4;
    auVar41._0_4_ = local_d8;
    fStack_d0 = fStack_460 * auVar32._8_4_ * 3.0;
    auVar41._8_4_ = fStack_d0;
    fStack_cc = fStack_45c * auVar32._12_4_ * 3.0;
    auVar41._12_4_ = fStack_cc;
    fStack_c8 = (float)local_468._0_4_ * auVar32._16_4_ * 3.0;
    auVar41._16_4_ = fStack_c8;
    fStack_c4 = (float)local_468._4_4_ * auVar32._20_4_ * 3.0;
    auVar41._20_4_ = fStack_c4;
    fStack_c0 = fStack_460 * auVar32._24_4_ * 3.0;
    auVar41._24_4_ = fStack_c0;
    auVar41._28_4_ = auVar32._28_4_;
    fVar260 = (float)local_468._0_4_ * auVar115._0_4_ * 3.0;
    fVar261 = (float)local_468._4_4_ * auVar115._4_4_ * 3.0;
    auVar42._4_4_ = fVar261;
    auVar42._0_4_ = fVar260;
    fVar262 = fStack_460 * auVar115._8_4_ * 3.0;
    auVar42._8_4_ = fVar262;
    fVar263 = fStack_45c * auVar115._12_4_ * 3.0;
    auVar42._12_4_ = fVar263;
    fVar264 = (float)local_468._0_4_ * auVar115._16_4_ * 3.0;
    auVar42._16_4_ = fVar264;
    fVar338 = (float)local_468._4_4_ * auVar115._20_4_ * 3.0;
    auVar42._20_4_ = fVar338;
    fVar350 = fStack_460 * auVar115._24_4_ * 3.0;
    auVar42._24_4_ = fVar350;
    auVar42._28_4_ = auVar230._28_4_;
    auVar30 = vsubps_avx(local_78,auVar41);
    auVar115 = vperm2f128_avx(auVar30,auVar30,1);
    auVar115 = vshufps_avx(auVar115,auVar30,0x30);
    auVar115 = vshufps_avx(auVar30,auVar115,0x29);
    auVar33 = vsubps_avx(local_98,auVar42);
    auVar30 = vperm2f128_avx(auVar33,auVar33,1);
    auVar30 = vshufps_avx(auVar30,auVar33,0x30);
    _local_428 = vshufps_avx(auVar33,auVar30,0x29);
    fVar396 = auVar160._0_4_;
    fVar384 = auVar160._4_4_;
    fVar385 = auVar160._8_4_;
    fVar206 = auVar137._0_4_;
    fVar208 = auVar137._4_4_;
    fVar211 = auVar137._8_4_;
    fVar235 = auVar137._12_4_;
    fVar395 = auVar256._12_4_;
    auVar138 = vshufps_avx(auVar279,auVar279,0xaa);
    fVar178 = auVar138._0_4_;
    fVar377 = auVar138._4_4_;
    fVar212 = auVar138._8_4_;
    fVar236 = auVar138._12_4_;
    fVar375 = auVar326._0_4_ * fVar178 + fVar396 * fVar152;
    fVar376 = auVar326._4_4_ * fVar377 + fVar384 * fVar368;
    fVar378 = auVar326._8_4_ * fVar212 + fVar385 * fVar210;
    fVar351 = auVar326._12_4_ * fVar236 + auVar160._12_4_ * fVar234;
    fVar353 = auVar326._16_4_ * fVar178 + fVar396 * fVar238;
    fVar355 = auVar326._20_4_ * fVar377 + fVar384 * fVar239;
    fVar386 = auVar326._24_4_ * fVar212 + fVar385 * fVar259;
    fVar339 = fVar395 + fVar394 + fVar339;
    auVar138 = vshufps_avx(auVar279,auVar279,0xff);
    fVar207 = auVar138._0_4_;
    fVar209 = auVar138._4_4_;
    fVar233 = auVar138._8_4_;
    fVar237 = auVar138._12_4_;
    fVar352 = auVar326._0_4_ * fVar207 + fVar152 * fVar206;
    fVar354 = auVar326._4_4_ * fVar209 + fVar368 * fVar208;
    fVar356 = auVar326._8_4_ * fVar233 + fVar210 * fVar211;
    fVar364 = auVar326._12_4_ * fVar237 + fVar234 * fVar235;
    fVar365 = auVar326._16_4_ * fVar207 + fVar238 * fVar206;
    fVar366 = auVar326._20_4_ * fVar209 + fVar239 * fVar208;
    fVar367 = auVar326._24_4_ * fVar233 + fVar259 * fVar211;
    auVar138 = vshufps_avx(auVar188,auVar188,0xaa);
    auVar38 = vshufps_avx(auVar188,auVar188,0xff);
    fVar394 = auVar38._12_4_;
    auVar121._0_4_ =
         auVar326._0_4_ * fVar375 + fVar152 * (fVar396 * auVar326._0_4_ + auVar186._0_4_ * fVar152);
    auVar121._4_4_ =
         auVar326._4_4_ * fVar376 + fVar368 * (fVar384 * auVar326._4_4_ + auVar186._4_4_ * fVar368);
    auVar121._8_4_ =
         auVar326._8_4_ * fVar378 + fVar210 * (fVar385 * auVar326._8_4_ + auVar186._8_4_ * fVar210);
    auVar121._12_4_ =
         auVar326._12_4_ * fVar351 +
         fVar234 * (auVar160._12_4_ * auVar326._12_4_ + auVar186._12_4_ * fVar234);
    auVar121._16_4_ =
         auVar326._16_4_ * fVar353 +
         fVar238 * (fVar396 * auVar326._16_4_ + auVar186._0_4_ * fVar238);
    auVar121._20_4_ =
         auVar326._20_4_ * fVar355 +
         fVar239 * (fVar384 * auVar326._20_4_ + auVar186._4_4_ * fVar239);
    auVar121._24_4_ =
         auVar326._24_4_ * fVar386 +
         fVar259 * (fVar385 * auVar326._24_4_ + auVar186._8_4_ * fVar259);
    auVar121._28_4_ = fVar394 + auVar33._28_4_ + auVar30._28_4_;
    auVar374._0_4_ =
         auVar326._0_4_ * fVar352 + fVar152 * (auVar326._0_4_ * fVar206 + auVar256._0_4_ * fVar152);
    auVar374._4_4_ =
         auVar326._4_4_ * fVar354 + fVar368 * (auVar326._4_4_ * fVar208 + auVar256._4_4_ * fVar368);
    auVar374._8_4_ =
         auVar326._8_4_ * fVar356 + fVar210 * (auVar326._8_4_ * fVar211 + auVar256._8_4_ * fVar210);
    auVar374._12_4_ =
         auVar326._12_4_ * fVar364 + fVar234 * (auVar326._12_4_ * fVar235 + fVar395 * fVar234);
    auVar374._16_4_ =
         auVar326._16_4_ * fVar365 +
         fVar238 * (auVar326._16_4_ * fVar206 + auVar256._0_4_ * fVar238);
    auVar374._20_4_ =
         auVar326._20_4_ * fVar366 +
         fVar239 * (auVar326._20_4_ * fVar208 + auVar256._4_4_ * fVar239);
    auVar374._24_4_ =
         auVar326._24_4_ * fVar367 +
         fVar259 * (auVar326._24_4_ * fVar211 + auVar256._8_4_ * fVar259);
    auVar374._28_4_ = fVar394 + auVar30._28_4_ + auVar230._28_4_;
    auVar30 = vperm2f128_avx(local_78,local_78,1);
    auVar30 = vshufps_avx(auVar30,local_78,0x30);
    _local_3b8 = vshufps_avx(local_78,auVar30,0x29);
    auVar231._0_4_ =
         fVar152 * fVar375 + auVar326._0_4_ * (auVar138._0_4_ * auVar326._0_4_ + fVar152 * fVar178);
    auVar231._4_4_ =
         fVar368 * fVar376 + auVar326._4_4_ * (auVar138._4_4_ * auVar326._4_4_ + fVar368 * fVar377);
    auVar231._8_4_ =
         fVar210 * fVar378 + auVar326._8_4_ * (auVar138._8_4_ * auVar326._8_4_ + fVar210 * fVar212);
    auVar231._12_4_ =
         fVar234 * fVar351 +
         auVar326._12_4_ * (auVar138._12_4_ * auVar326._12_4_ + fVar234 * fVar236);
    auVar231._16_4_ =
         fVar238 * fVar353 +
         auVar326._16_4_ * (auVar138._0_4_ * auVar326._16_4_ + fVar238 * fVar178);
    auVar231._20_4_ =
         fVar239 * fVar355 +
         auVar326._20_4_ * (auVar138._4_4_ * auVar326._20_4_ + fVar239 * fVar377);
    auVar231._24_4_ =
         fVar259 * fVar386 +
         auVar326._24_4_ * (auVar138._8_4_ * auVar326._24_4_ + fVar259 * fVar212);
    auVar231._28_4_ = fVar339 + auVar138._12_4_ + fVar236;
    auVar274._0_4_ =
         fVar152 * fVar352 + auVar326._0_4_ * (auVar38._0_4_ * auVar326._0_4_ + fVar152 * fVar207);
    auVar274._4_4_ =
         fVar368 * fVar354 + auVar326._4_4_ * (auVar38._4_4_ * auVar326._4_4_ + fVar368 * fVar209);
    auVar274._8_4_ =
         fVar210 * fVar356 + auVar326._8_4_ * (auVar38._8_4_ * auVar326._8_4_ + fVar210 * fVar233);
    auVar274._12_4_ =
         fVar234 * fVar364 + auVar326._12_4_ * (fVar394 * auVar326._12_4_ + fVar234 * fVar237);
    auVar274._16_4_ =
         fVar238 * fVar365 + auVar326._16_4_ * (auVar38._0_4_ * auVar326._16_4_ + fVar238 * fVar207)
    ;
    auVar274._20_4_ =
         fVar239 * fVar366 + auVar326._20_4_ * (auVar38._4_4_ * auVar326._20_4_ + fVar239 * fVar209)
    ;
    auVar274._24_4_ =
         fVar259 * fVar367 + auVar326._24_4_ * (auVar38._8_4_ * auVar326._24_4_ + fVar259 * fVar233)
    ;
    auVar274._28_4_ = fVar395 + fVar235 + fVar394 + fVar237;
    auVar287._0_4_ = fVar152 * auVar121._0_4_ + auVar326._0_4_ * auVar231._0_4_;
    auVar287._4_4_ = fVar368 * auVar121._4_4_ + auVar326._4_4_ * auVar231._4_4_;
    auVar287._8_4_ = fVar210 * auVar121._8_4_ + auVar326._8_4_ * auVar231._8_4_;
    auVar287._12_4_ = fVar234 * auVar121._12_4_ + auVar326._12_4_ * auVar231._12_4_;
    auVar287._16_4_ = fVar238 * auVar121._16_4_ + auVar326._16_4_ * auVar231._16_4_;
    auVar287._20_4_ = fVar239 * auVar121._20_4_ + auVar326._20_4_ * auVar231._20_4_;
    auVar287._24_4_ = fVar259 * auVar121._24_4_ + auVar326._24_4_ * auVar231._24_4_;
    auVar287._28_4_ = fVar339 + fVar394 + fVar237;
    auVar312._0_4_ = fVar152 * auVar374._0_4_ + auVar326._0_4_ * auVar274._0_4_;
    auVar312._4_4_ = fVar368 * auVar374._4_4_ + auVar326._4_4_ * auVar274._4_4_;
    auVar312._8_4_ = fVar210 * auVar374._8_4_ + auVar326._8_4_ * auVar274._8_4_;
    auVar312._12_4_ = fVar234 * auVar374._12_4_ + auVar326._12_4_ * auVar274._12_4_;
    auVar312._16_4_ = fVar238 * auVar374._16_4_ + auVar326._16_4_ * auVar274._16_4_;
    auVar312._20_4_ = fVar239 * auVar374._20_4_ + auVar326._20_4_ * auVar274._20_4_;
    auVar312._24_4_ = fVar259 * auVar374._24_4_ + auVar326._24_4_ * auVar274._24_4_;
    auVar312._28_4_ = auVar31._28_4_ + auVar326._28_4_;
    auVar30 = vsubps_avx(auVar231,auVar121);
    auVar31 = vsubps_avx(auVar274,auVar374);
    local_f8 = (float)local_468._0_4_ * auVar30._0_4_ * 3.0;
    fStack_f4 = (float)local_468._4_4_ * auVar30._4_4_ * 3.0;
    auVar43._4_4_ = fStack_f4;
    auVar43._0_4_ = local_f8;
    fStack_f0 = fStack_460 * auVar30._8_4_ * 3.0;
    auVar43._8_4_ = fStack_f0;
    fStack_ec = fStack_45c * auVar30._12_4_ * 3.0;
    auVar43._12_4_ = fStack_ec;
    fStack_e8 = (float)local_468._0_4_ * auVar30._16_4_ * 3.0;
    auVar43._16_4_ = fStack_e8;
    fStack_e4 = (float)local_468._4_4_ * auVar30._20_4_ * 3.0;
    auVar43._20_4_ = fStack_e4;
    fStack_e0 = fStack_460 * auVar30._24_4_ * 3.0;
    auVar43._24_4_ = fStack_e0;
    auVar43._28_4_ = auVar274._28_4_;
    local_118 = (float)local_468._0_4_ * auVar31._0_4_ * 3.0;
    fStack_114 = (float)local_468._4_4_ * auVar31._4_4_ * 3.0;
    auVar44._4_4_ = fStack_114;
    auVar44._0_4_ = local_118;
    fStack_110 = fStack_460 * auVar31._8_4_ * 3.0;
    auVar44._8_4_ = fStack_110;
    fStack_10c = fStack_45c * auVar31._12_4_ * 3.0;
    auVar44._12_4_ = fStack_10c;
    local_468._0_4_ = (float)local_468._0_4_ * auVar31._16_4_ * 3.0;
    auVar44._16_4_ = local_468._0_4_;
    local_468._4_4_ = (float)local_468._4_4_ * auVar31._20_4_ * 3.0;
    auVar44._20_4_ = local_468._4_4_;
    fStack_460 = fStack_460 * auVar31._24_4_ * 3.0;
    auVar44._24_4_ = fStack_460;
    auVar44._28_4_ = fStack_45c;
    auVar30 = vperm2f128_avx(auVar287,auVar287,1);
    auVar30 = vshufps_avx(auVar30,auVar287,0x30);
    auVar34 = vshufps_avx(auVar287,auVar30,0x29);
    auVar31 = vsubps_avx(auVar287,auVar43);
    auVar30 = vperm2f128_avx(auVar31,auVar31,1);
    auVar30 = vshufps_avx(auVar30,auVar31,0x30);
    _local_448 = vshufps_avx(auVar31,auVar30,0x29);
    auVar31 = vsubps_avx(auVar312,auVar44);
    auVar30 = vperm2f128_avx(auVar31,auVar31,1);
    auVar30 = vshufps_avx(auVar30,auVar31,0x30);
    auVar35 = vshufps_avx(auVar31,auVar30,0x29);
    auVar33 = vsubps_avx(auVar287,local_78);
    auVar37 = vsubps_avx(auVar34,_local_3b8);
    fVar152 = auVar37._0_4_ + auVar33._0_4_;
    fVar206 = auVar37._4_4_ + auVar33._4_4_;
    fVar178 = auVar37._8_4_ + auVar33._8_4_;
    fVar207 = auVar37._12_4_ + auVar33._12_4_;
    fVar368 = auVar37._16_4_ + auVar33._16_4_;
    fVar208 = auVar37._20_4_ + auVar33._20_4_;
    fVar377 = auVar37._24_4_ + auVar33._24_4_;
    auVar31 = vperm2f128_avx(local_98,local_98,1);
    auVar31 = vshufps_avx(auVar31,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar31,0x29);
    auVar31 = vperm2f128_avx(auVar312,auVar312,1);
    auVar31 = vshufps_avx(auVar31,auVar312,0x30);
    auVar36 = vshufps_avx(auVar312,auVar31,0x29);
    auVar31 = vsubps_avx(auVar312,local_98);
    auVar39 = vsubps_avx(auVar36,local_b8);
    fVar209 = auVar31._0_4_ + auVar39._0_4_;
    fVar210 = auVar31._4_4_ + auVar39._4_4_;
    fVar211 = auVar31._8_4_ + auVar39._8_4_;
    fVar212 = auVar31._12_4_ + auVar39._12_4_;
    fVar233 = auVar31._16_4_ + auVar39._16_4_;
    fVar234 = auVar31._20_4_ + auVar39._20_4_;
    fVar235 = auVar31._24_4_ + auVar39._24_4_;
    fVar236 = auVar31._28_4_;
    auVar45._4_4_ = local_98._4_4_ * fVar206;
    auVar45._0_4_ = local_98._0_4_ * fVar152;
    auVar45._8_4_ = local_98._8_4_ * fVar178;
    auVar45._12_4_ = local_98._12_4_ * fVar207;
    auVar45._16_4_ = local_98._16_4_ * fVar368;
    auVar45._20_4_ = local_98._20_4_ * fVar208;
    auVar45._24_4_ = local_98._24_4_ * fVar377;
    auVar45._28_4_ = fVar236;
    auVar46._4_4_ = fVar210 * local_78._4_4_;
    auVar46._0_4_ = fVar209 * local_78._0_4_;
    auVar46._8_4_ = fVar211 * local_78._8_4_;
    auVar46._12_4_ = fVar212 * local_78._12_4_;
    auVar46._16_4_ = fVar233 * local_78._16_4_;
    auVar46._20_4_ = fVar234 * local_78._20_4_;
    auVar46._24_4_ = fVar235 * local_78._24_4_;
    auVar46._28_4_ = auVar30._28_4_;
    auVar31 = vsubps_avx(auVar45,auVar46);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar32._28_4_;
    fVar260 = local_98._0_4_ + fVar260;
    fVar261 = local_98._4_4_ + fVar261;
    fVar262 = local_98._8_4_ + fVar262;
    fVar263 = local_98._12_4_ + fVar263;
    fVar264 = local_98._16_4_ + fVar264;
    fVar338 = local_98._20_4_ + fVar338;
    fVar350 = local_98._24_4_ + fVar350;
    auVar47._4_4_ = fVar261 * fVar206;
    auVar47._0_4_ = fVar260 * fVar152;
    auVar47._8_4_ = fVar262 * fVar178;
    auVar47._12_4_ = fVar263 * fVar207;
    auVar47._16_4_ = fVar264 * fVar368;
    auVar47._20_4_ = fVar338 * fVar208;
    auVar47._24_4_ = fVar350 * fVar377;
    auVar47._28_4_ = fVar236;
    auVar48._4_4_ = fVar210 * fStack_d4;
    auVar48._0_4_ = fVar209 * local_d8;
    auVar48._8_4_ = fVar211 * fStack_d0;
    auVar48._12_4_ = fVar212 * fStack_cc;
    auVar48._16_4_ = fVar233 * fStack_c8;
    auVar48._20_4_ = fVar234 * fStack_c4;
    auVar48._24_4_ = fVar235 * fStack_c0;
    auVar48._28_4_ = fStack_bc;
    auVar32 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = local_428._4_4_ * fVar206;
    auVar49._0_4_ = local_428._0_4_ * fVar152;
    auVar49._8_4_ = local_428._8_4_ * fVar178;
    auVar49._12_4_ = local_428._12_4_ * fVar207;
    auVar49._16_4_ = local_428._16_4_ * fVar368;
    auVar49._20_4_ = local_428._20_4_ * fVar208;
    auVar49._24_4_ = local_428._24_4_ * fVar377;
    auVar49._28_4_ = fVar236;
    local_3d8._0_4_ = auVar115._0_4_;
    local_3d8._4_4_ = auVar115._4_4_;
    fStack_3d0 = auVar115._8_4_;
    fStack_3cc = auVar115._12_4_;
    fStack_3c8 = auVar115._16_4_;
    fStack_3c4 = auVar115._20_4_;
    fStack_3c0 = auVar115._24_4_;
    auVar50._4_4_ = fVar210 * (float)local_3d8._4_4_;
    auVar50._0_4_ = fVar209 * (float)local_3d8._0_4_;
    auVar50._8_4_ = fVar211 * fStack_3d0;
    auVar50._12_4_ = fVar212 * fStack_3cc;
    auVar50._16_4_ = fVar233 * fStack_3c8;
    auVar50._20_4_ = fVar234 * fStack_3c4;
    auVar50._24_4_ = fVar235 * fStack_3c0;
    auVar50._28_4_ = 0x40400000;
    auVar40 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = local_b8._4_4_ * fVar206;
    auVar51._0_4_ = local_b8._0_4_ * fVar152;
    auVar51._8_4_ = local_b8._8_4_ * fVar178;
    auVar51._12_4_ = local_b8._12_4_ * fVar207;
    auVar51._16_4_ = local_b8._16_4_ * fVar368;
    auVar51._20_4_ = local_b8._20_4_ * fVar208;
    auVar51._24_4_ = local_b8._24_4_ * fVar377;
    auVar51._28_4_ = fVar236;
    auVar52._4_4_ = local_3b8._4_4_ * fVar210;
    auVar52._0_4_ = local_3b8._0_4_ * fVar209;
    auVar52._8_4_ = local_3b8._8_4_ * fVar211;
    auVar52._12_4_ = local_3b8._12_4_ * fVar212;
    auVar52._16_4_ = local_3b8._16_4_ * fVar233;
    auVar52._20_4_ = local_3b8._20_4_ * fVar234;
    auVar52._24_4_ = local_3b8._24_4_ * fVar235;
    auVar52._28_4_ = local_b8._28_4_;
    auVar116 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = auVar312._4_4_ * fVar206;
    auVar53._0_4_ = auVar312._0_4_ * fVar152;
    auVar53._8_4_ = auVar312._8_4_ * fVar178;
    auVar53._12_4_ = auVar312._12_4_ * fVar207;
    auVar53._16_4_ = auVar312._16_4_ * fVar368;
    auVar53._20_4_ = auVar312._20_4_ * fVar208;
    auVar53._24_4_ = auVar312._24_4_ * fVar377;
    auVar53._28_4_ = fVar236;
    auVar54._4_4_ = fVar210 * auVar287._4_4_;
    auVar54._0_4_ = fVar209 * auVar287._0_4_;
    auVar54._8_4_ = fVar211 * auVar287._8_4_;
    auVar54._12_4_ = fVar212 * auVar287._12_4_;
    auVar54._16_4_ = fVar233 * auVar287._16_4_;
    auVar54._20_4_ = fVar234 * auVar287._20_4_;
    auVar54._24_4_ = fVar235 * auVar287._24_4_;
    auVar54._28_4_ = local_428._28_4_;
    auVar117 = vsubps_avx(auVar53,auVar54);
    local_f8 = auVar287._0_4_ + local_f8;
    fStack_f4 = auVar287._4_4_ + fStack_f4;
    fStack_f0 = auVar287._8_4_ + fStack_f0;
    fStack_ec = auVar287._12_4_ + fStack_ec;
    fStack_e8 = auVar287._16_4_ + fStack_e8;
    fStack_e4 = auVar287._20_4_ + fStack_e4;
    fStack_e0 = auVar287._24_4_ + fStack_e0;
    fStack_dc = auVar287._28_4_ + auVar274._28_4_;
    local_118 = auVar312._0_4_ + local_118;
    fStack_114 = auVar312._4_4_ + fStack_114;
    fStack_110 = auVar312._8_4_ + fStack_110;
    fStack_10c = auVar312._12_4_ + fStack_10c;
    fStack_108 = auVar312._16_4_ + (float)local_468._0_4_;
    fStack_104 = auVar312._20_4_ + (float)local_468._4_4_;
    fStack_100 = auVar312._24_4_ + fStack_460;
    fStack_fc = auVar312._28_4_ + fStack_45c;
    auVar55._4_4_ = fStack_114 * fVar206;
    auVar55._0_4_ = local_118 * fVar152;
    auVar55._8_4_ = fStack_110 * fVar178;
    auVar55._12_4_ = fStack_10c * fVar207;
    auVar55._16_4_ = fStack_108 * fVar368;
    auVar55._20_4_ = fStack_104 * fVar208;
    auVar55._24_4_ = fStack_100 * fVar377;
    auVar55._28_4_ = auVar312._28_4_ + fStack_45c;
    auVar56._4_4_ = fStack_f4 * fVar210;
    auVar56._0_4_ = local_f8 * fVar209;
    auVar56._8_4_ = fStack_f0 * fVar211;
    auVar56._12_4_ = fStack_ec * fVar212;
    auVar56._16_4_ = fStack_e8 * fVar233;
    auVar56._20_4_ = fStack_e4 * fVar234;
    auVar56._24_4_ = fStack_e0 * fVar235;
    auVar56._28_4_ = fStack_dc;
    auVar147 = vsubps_avx(auVar55,auVar56);
    auVar57._4_4_ = auVar35._4_4_ * fVar206;
    auVar57._0_4_ = auVar35._0_4_ * fVar152;
    auVar57._8_4_ = auVar35._8_4_ * fVar178;
    auVar57._12_4_ = auVar35._12_4_ * fVar207;
    auVar57._16_4_ = auVar35._16_4_ * fVar368;
    auVar57._20_4_ = auVar35._20_4_ * fVar208;
    auVar57._24_4_ = auVar35._24_4_ * fVar377;
    auVar57._28_4_ = fStack_dc;
    auVar58._4_4_ = fVar210 * local_448._4_4_;
    auVar58._0_4_ = fVar209 * local_448._0_4_;
    auVar58._8_4_ = fVar211 * local_448._8_4_;
    auVar58._12_4_ = fVar212 * local_448._12_4_;
    auVar58._16_4_ = fVar233 * local_448._16_4_;
    auVar58._20_4_ = fVar234 * local_448._20_4_;
    auVar58._24_4_ = fVar235 * local_448._24_4_;
    auVar58._28_4_ = local_448._28_4_;
    auVar148 = vsubps_avx(auVar57,auVar58);
    auVar59._4_4_ = auVar36._4_4_ * fVar206;
    auVar59._0_4_ = auVar36._0_4_ * fVar152;
    auVar59._8_4_ = auVar36._8_4_ * fVar178;
    auVar59._12_4_ = auVar36._12_4_ * fVar207;
    auVar59._16_4_ = auVar36._16_4_ * fVar368;
    auVar59._20_4_ = auVar36._20_4_ * fVar208;
    auVar59._24_4_ = auVar36._24_4_ * fVar377;
    auVar59._28_4_ = auVar37._28_4_ + auVar33._28_4_;
    auVar60._4_4_ = auVar34._4_4_ * fVar210;
    auVar60._0_4_ = auVar34._0_4_ * fVar209;
    auVar60._8_4_ = auVar34._8_4_ * fVar211;
    auVar60._12_4_ = auVar34._12_4_ * fVar212;
    auVar60._16_4_ = auVar34._16_4_ * fVar233;
    auVar60._20_4_ = auVar34._20_4_ * fVar234;
    auVar60._24_4_ = auVar34._24_4_ * fVar235;
    auVar60._28_4_ = fVar236 + auVar39._28_4_;
    auVar37 = vsubps_avx(auVar59,auVar60);
    auVar30 = vminps_avx(auVar31,auVar32);
    auVar115 = vmaxps_avx(auVar31,auVar32);
    auVar31 = vminps_avx(auVar40,auVar116);
    auVar31 = vminps_avx(auVar30,auVar31);
    auVar30 = vmaxps_avx(auVar40,auVar116);
    auVar115 = vmaxps_avx(auVar115,auVar30);
    auVar32 = vminps_avx(auVar117,auVar147);
    auVar30 = vmaxps_avx(auVar117,auVar147);
    auVar33 = vminps_avx(auVar148,auVar37);
    auVar32 = vminps_avx(auVar32,auVar33);
    auVar32 = vminps_avx(auVar31,auVar32);
    auVar31 = vmaxps_avx(auVar148,auVar37);
    auVar30 = vmaxps_avx(auVar30,auVar31);
    auVar30 = vmaxps_avx(auVar115,auVar30);
    auVar115 = vcmpps_avx(auVar32,local_138,2);
    auVar30 = vcmpps_avx(auVar30,local_158,5);
    auVar115 = vandps_avx(auVar30,auVar115);
    auVar30 = local_1b8 & auVar115;
    uVar89 = 0;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0x7f,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar30 >> 0xbf,0) != '\0') ||
        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar30[0x1f] < '\0')
    {
      auVar30 = vsubps_avx(_local_3b8,local_78);
      auVar31 = vsubps_avx(auVar34,auVar287);
      fVar206 = auVar30._0_4_ + auVar31._0_4_;
      fVar178 = auVar30._4_4_ + auVar31._4_4_;
      fVar207 = auVar30._8_4_ + auVar31._8_4_;
      fVar368 = auVar30._12_4_ + auVar31._12_4_;
      fVar208 = auVar30._16_4_ + auVar31._16_4_;
      fVar377 = auVar30._20_4_ + auVar31._20_4_;
      fVar209 = auVar30._24_4_ + auVar31._24_4_;
      auVar32 = vsubps_avx(local_b8,local_98);
      auVar33 = vsubps_avx(auVar36,auVar312);
      fVar210 = auVar32._0_4_ + auVar33._0_4_;
      fVar211 = auVar32._4_4_ + auVar33._4_4_;
      fVar212 = auVar32._8_4_ + auVar33._8_4_;
      fVar233 = auVar32._12_4_ + auVar33._12_4_;
      fVar234 = auVar32._16_4_ + auVar33._16_4_;
      fVar235 = auVar32._20_4_ + auVar33._20_4_;
      fVar236 = auVar32._24_4_ + auVar33._24_4_;
      fVar152 = auVar33._28_4_;
      auVar61._4_4_ = local_98._4_4_ * fVar178;
      auVar61._0_4_ = local_98._0_4_ * fVar206;
      auVar61._8_4_ = local_98._8_4_ * fVar207;
      auVar61._12_4_ = local_98._12_4_ * fVar368;
      auVar61._16_4_ = local_98._16_4_ * fVar208;
      auVar61._20_4_ = local_98._20_4_ * fVar377;
      auVar61._24_4_ = local_98._24_4_ * fVar209;
      auVar61._28_4_ = local_98._28_4_;
      auVar62._4_4_ = local_78._4_4_ * fVar211;
      auVar62._0_4_ = local_78._0_4_ * fVar210;
      auVar62._8_4_ = local_78._8_4_ * fVar212;
      auVar62._12_4_ = local_78._12_4_ * fVar233;
      auVar62._16_4_ = local_78._16_4_ * fVar234;
      auVar62._20_4_ = local_78._20_4_ * fVar235;
      auVar62._24_4_ = local_78._24_4_ * fVar236;
      auVar62._28_4_ = local_78._28_4_;
      auVar33 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = fVar261 * fVar178;
      auVar63._0_4_ = fVar260 * fVar206;
      auVar63._8_4_ = fVar262 * fVar207;
      auVar63._12_4_ = fVar263 * fVar368;
      auVar63._16_4_ = fVar264 * fVar208;
      auVar63._20_4_ = fVar338 * fVar377;
      auVar63._24_4_ = fVar350 * fVar209;
      auVar63._28_4_ = local_98._28_4_;
      auVar64._4_4_ = fVar211 * fStack_d4;
      auVar64._0_4_ = fVar210 * local_d8;
      auVar64._8_4_ = fVar212 * fStack_d0;
      auVar64._12_4_ = fVar233 * fStack_cc;
      auVar64._16_4_ = fVar234 * fStack_c8;
      auVar64._20_4_ = fVar235 * fStack_c4;
      auVar64._24_4_ = fVar236 * fStack_c0;
      auVar64._28_4_ = fVar152;
      auVar37 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = fVar178 * local_428._4_4_;
      auVar65._0_4_ = fVar206 * local_428._0_4_;
      auVar65._8_4_ = fVar207 * local_428._8_4_;
      auVar65._12_4_ = fVar368 * local_428._12_4_;
      auVar65._16_4_ = fVar208 * local_428._16_4_;
      auVar65._20_4_ = fVar377 * local_428._20_4_;
      auVar65._24_4_ = fVar209 * local_428._24_4_;
      auVar65._28_4_ = fVar152;
      auVar66._4_4_ = fVar211 * (float)local_3d8._4_4_;
      auVar66._0_4_ = fVar210 * (float)local_3d8._0_4_;
      auVar66._8_4_ = fVar212 * fStack_3d0;
      auVar66._12_4_ = fVar233 * fStack_3cc;
      auVar66._16_4_ = fVar234 * fStack_3c8;
      auVar66._20_4_ = fVar235 * fStack_3c4;
      auVar66._24_4_ = fVar236 * fStack_3c0;
      auVar66._28_4_ = local_98._28_4_ + auVar230._28_4_;
      auVar39 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = local_b8._4_4_ * fVar178;
      auVar67._0_4_ = local_b8._0_4_ * fVar206;
      auVar67._8_4_ = local_b8._8_4_ * fVar207;
      auVar67._12_4_ = local_b8._12_4_ * fVar368;
      auVar67._16_4_ = local_b8._16_4_ * fVar208;
      auVar67._20_4_ = local_b8._20_4_ * fVar377;
      auVar67._24_4_ = local_b8._24_4_ * fVar209;
      auVar67._28_4_ = local_98._28_4_ + auVar230._28_4_;
      auVar68._4_4_ = local_3b8._4_4_ * fVar211;
      auVar68._0_4_ = local_3b8._0_4_ * fVar210;
      auVar68._8_4_ = local_3b8._8_4_ * fVar212;
      auVar68._12_4_ = local_3b8._12_4_ * fVar233;
      auVar68._16_4_ = local_3b8._16_4_ * fVar234;
      auVar68._20_4_ = local_3b8._20_4_ * fVar235;
      uVar7 = local_3b8._28_4_;
      auVar68._24_4_ = local_3b8._24_4_ * fVar236;
      auVar68._28_4_ = uVar7;
      auVar40 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = auVar312._4_4_ * fVar178;
      auVar69._0_4_ = auVar312._0_4_ * fVar206;
      auVar69._8_4_ = auVar312._8_4_ * fVar207;
      auVar69._12_4_ = auVar312._12_4_ * fVar368;
      auVar69._16_4_ = auVar312._16_4_ * fVar208;
      auVar69._20_4_ = auVar312._20_4_ * fVar377;
      auVar69._24_4_ = auVar312._24_4_ * fVar209;
      auVar69._28_4_ = auVar312._28_4_;
      auVar70._4_4_ = auVar287._4_4_ * fVar211;
      auVar70._0_4_ = auVar287._0_4_ * fVar210;
      auVar70._8_4_ = auVar287._8_4_ * fVar212;
      auVar70._12_4_ = auVar287._12_4_ * fVar233;
      auVar70._16_4_ = auVar287._16_4_ * fVar234;
      auVar70._20_4_ = auVar287._20_4_ * fVar235;
      auVar70._24_4_ = auVar287._24_4_ * fVar236;
      auVar70._28_4_ = auVar287._28_4_;
      auVar116 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = fVar178 * fStack_114;
      auVar71._0_4_ = fVar206 * local_118;
      auVar71._8_4_ = fVar207 * fStack_110;
      auVar71._12_4_ = fVar368 * fStack_10c;
      auVar71._16_4_ = fVar208 * fStack_108;
      auVar71._20_4_ = fVar377 * fStack_104;
      auVar71._24_4_ = fVar209 * fStack_100;
      auVar71._28_4_ = auVar312._28_4_;
      auVar72._4_4_ = fVar211 * fStack_f4;
      auVar72._0_4_ = fVar210 * local_f8;
      auVar72._8_4_ = fVar212 * fStack_f0;
      auVar72._12_4_ = fVar233 * fStack_ec;
      auVar72._16_4_ = fVar234 * fStack_e8;
      auVar72._20_4_ = fVar235 * fStack_e4;
      auVar72._24_4_ = fVar236 * fStack_e0;
      auVar72._28_4_ = uVar7;
      auVar117 = vsubps_avx(auVar71,auVar72);
      auVar73._4_4_ = fVar178 * auVar35._4_4_;
      auVar73._0_4_ = fVar206 * auVar35._0_4_;
      auVar73._8_4_ = fVar207 * auVar35._8_4_;
      auVar73._12_4_ = fVar368 * auVar35._12_4_;
      auVar73._16_4_ = fVar208 * auVar35._16_4_;
      auVar73._20_4_ = fVar377 * auVar35._20_4_;
      auVar73._24_4_ = fVar209 * auVar35._24_4_;
      auVar73._28_4_ = uVar7;
      auVar74._4_4_ = fVar211 * local_448._4_4_;
      auVar74._0_4_ = fVar210 * local_448._0_4_;
      auVar74._8_4_ = fVar212 * local_448._8_4_;
      auVar74._12_4_ = fVar233 * local_448._12_4_;
      auVar74._16_4_ = fVar234 * local_448._16_4_;
      auVar74._20_4_ = fVar235 * local_448._20_4_;
      auVar74._24_4_ = fVar236 * local_448._24_4_;
      auVar74._28_4_ = local_b8._28_4_;
      auVar147 = vsubps_avx(auVar73,auVar74);
      auVar75._4_4_ = auVar36._4_4_ * fVar178;
      auVar75._0_4_ = auVar36._0_4_ * fVar206;
      auVar75._8_4_ = auVar36._8_4_ * fVar207;
      auVar75._12_4_ = auVar36._12_4_ * fVar368;
      auVar75._16_4_ = auVar36._16_4_ * fVar208;
      auVar75._20_4_ = auVar36._20_4_ * fVar377;
      auVar75._24_4_ = auVar36._24_4_ * fVar209;
      auVar75._28_4_ = auVar30._28_4_ + auVar31._28_4_;
      auVar76._4_4_ = auVar34._4_4_ * fVar211;
      auVar76._0_4_ = auVar34._0_4_ * fVar210;
      auVar76._8_4_ = auVar34._8_4_ * fVar212;
      auVar76._12_4_ = auVar34._12_4_ * fVar233;
      auVar76._16_4_ = auVar34._16_4_ * fVar234;
      auVar76._20_4_ = auVar34._20_4_ * fVar235;
      auVar76._24_4_ = auVar34._24_4_ * fVar236;
      auVar76._28_4_ = auVar32._28_4_ + fVar152;
      auVar36 = vsubps_avx(auVar75,auVar76);
      auVar31 = vminps_avx(auVar33,auVar37);
      auVar30 = vmaxps_avx(auVar33,auVar37);
      auVar32 = vminps_avx(auVar39,auVar40);
      auVar32 = vminps_avx(auVar31,auVar32);
      auVar31 = vmaxps_avx(auVar39,auVar40);
      auVar30 = vmaxps_avx(auVar30,auVar31);
      auVar33 = vminps_avx(auVar116,auVar117);
      auVar31 = vmaxps_avx(auVar116,auVar117);
      auVar34 = vminps_avx(auVar147,auVar36);
      auVar33 = vminps_avx(auVar33,auVar34);
      auVar33 = vminps_avx(auVar32,auVar33);
      auVar32 = vmaxps_avx(auVar147,auVar36);
      auVar31 = vmaxps_avx(auVar31,auVar32);
      auVar31 = vmaxps_avx(auVar30,auVar31);
      auVar30 = vcmpps_avx(auVar33,local_138,2);
      auVar31 = vcmpps_avx(auVar31,local_158,5);
      auVar30 = vandps_avx(auVar31,auVar30);
      auVar115 = vandps_avx(auVar115,local_1b8);
      auVar31 = auVar115 & auVar30;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar31 >> 0x7f,0) != '\0') ||
            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0xbf,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar31[0x1f] < '\0') {
        auVar115 = vandps_avx(auVar30,auVar115);
        uVar89 = vmovmskps_avx(auVar115);
      }
    }
    _local_468 = auVar35;
    if (uVar89 != 0) {
      auStack_278[uVar91] = uVar89;
      uVar8 = vmovlps_avx(local_1f8);
      *(undefined8 *)(afStack_198 + uVar91 * 2) = uVar8;
      uVar97 = vmovlps_avx(_local_4a8);
      auStack_58[uVar91] = uVar97;
      uVar91 = (ulong)((int)uVar91 + 1);
    }
    do {
      if ((int)uVar91 == 0) {
        if (bVar86) {
          return local_4e9;
        }
        fVar179 = ray->tfar;
        auVar122._4_4_ = fVar179;
        auVar122._0_4_ = fVar179;
        auVar122._8_4_ = fVar179;
        auVar122._12_4_ = fVar179;
        auVar122._16_4_ = fVar179;
        auVar122._20_4_ = fVar179;
        auVar122._24_4_ = fVar179;
        auVar122._28_4_ = fVar179;
        auVar115 = vcmpps_avx(local_178,auVar122,2);
        uVar90 = vmovmskps_avx(auVar115);
        uVar88 = SUB84(auVar98,0) & uVar88 + 0xff & uVar90;
        local_4e9 = uVar88 != 0;
        if (!local_4e9) {
          return local_4e9;
        }
        goto LAB_0120517d;
      }
      uVar92 = (int)uVar91 - 1;
      uVar93 = (ulong)uVar92;
      uVar89 = auStack_278[uVar93];
      fVar152 = afStack_198[uVar93 * 2];
      fVar206 = afStack_198[uVar93 * 2 + 1];
      register0x00001588 = 0;
      local_4a8 = (undefined1  [8])auStack_58[uVar93];
      uVar97 = 0;
      if (uVar89 != 0) {
        for (; (uVar89 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
        }
      }
      uVar89 = uVar89 - 1 & uVar89;
      auStack_278[uVar93] = uVar89;
      if (uVar89 == 0) {
        uVar91 = (ulong)uVar92;
      }
      auVar248._8_4_ = 0x3f800000;
      auVar248._0_8_ = &DAT_3f8000003f800000;
      auVar248._12_4_ = 0x3f800000;
      fVar207 = (float)(uVar97 + 1) * 0.14285715;
      fVar178 = (1.0 - (float)uVar97 * 0.14285715) * fVar152 + fVar206 * (float)uVar97 * 0.14285715;
      fVar152 = (1.0 - fVar207) * fVar152 + fVar206 * fVar207;
      fVar206 = fVar152 - fVar178;
      _local_3d8 = ZEXT432((uint)fVar178);
      auVar186 = ZEXT416((uint)fVar178);
      _local_448 = ZEXT416((uint)fVar152);
      auVar138 = ZEXT416((uint)fVar178);
      if (0.16666667 <= fVar206) break;
      auVar138 = vshufps_avx(_local_4a8,_local_4a8,0x50);
      auVar38 = vsubps_avx(auVar248,auVar138);
      fVar207 = auVar138._0_4_;
      fVar368 = auVar138._4_4_;
      fVar208 = auVar138._8_4_;
      fVar377 = auVar138._12_4_;
      fVar209 = auVar38._0_4_;
      fVar210 = auVar38._4_4_;
      fVar211 = auVar38._8_4_;
      fVar212 = auVar38._12_4_;
      auVar189._0_4_ = auVar297._0_4_ * fVar207 + fVar209 * (float)local_2f8._0_4_;
      auVar189._4_4_ = auVar297._4_4_ * fVar368 + fVar210 * (float)local_2f8._4_4_;
      auVar189._8_4_ = auVar297._0_4_ * fVar208 + fVar211 * fStack_2f0;
      auVar189._12_4_ = auVar297._4_4_ * fVar377 + fVar212 * fStack_2ec;
      auVar222._0_4_ = auVar313._0_4_ * fVar207 + fVar209 * (float)local_288._0_4_;
      auVar222._4_4_ = auVar313._4_4_ * fVar368 + fVar210 * (float)local_288._4_4_;
      auVar222._8_4_ = auVar313._0_4_ * fVar208 + fVar211 * fStack_280;
      auVar222._12_4_ = auVar313._4_4_ * fVar377 + fVar212 * fStack_27c;
      auVar249._0_4_ = auVar328._0_4_ * fVar207 + fVar209 * (float)local_308._0_4_;
      auVar249._4_4_ = auVar328._4_4_ * fVar368 + fVar210 * (float)local_308._4_4_;
      auVar249._8_4_ = auVar328._0_4_ * fVar208 + fVar211 * fStack_300;
      auVar249._12_4_ = auVar328._4_4_ * fVar377 + fVar212 * fStack_2fc;
      auVar134._0_4_ = (float)local_318._0_4_ * fVar207 + auVar278._0_4_ * fVar209;
      auVar134._4_4_ = (float)local_318._4_4_ * fVar368 + auVar278._4_4_ * fVar210;
      auVar134._8_4_ = fStack_310 * fVar208 + auVar278._0_4_ * fVar211;
      auVar134._12_4_ = fStack_30c * fVar377 + auVar278._4_4_ * fVar212;
      auVar175._16_16_ = auVar189;
      auVar175._0_16_ = auVar189;
      auVar203._16_16_ = auVar222;
      auVar203._0_16_ = auVar222;
      auVar232._16_16_ = auVar249;
      auVar232._0_16_ = auVar249;
      auVar115 = vshufps_avx(ZEXT2032(CONCAT416(fVar152,ZEXT416((uint)fVar178))),
                             ZEXT2032(CONCAT416(fVar152,ZEXT416((uint)fVar178))),0);
      auVar30 = vsubps_avx(auVar203,auVar175);
      fVar207 = auVar115._0_4_;
      fVar368 = auVar115._4_4_;
      fVar208 = auVar115._8_4_;
      fVar377 = auVar115._12_4_;
      fVar209 = auVar115._16_4_;
      fVar210 = auVar115._20_4_;
      fVar211 = auVar115._24_4_;
      auVar176._0_4_ = auVar189._0_4_ + auVar30._0_4_ * fVar207;
      auVar176._4_4_ = auVar189._4_4_ + auVar30._4_4_ * fVar368;
      auVar176._8_4_ = auVar189._8_4_ + auVar30._8_4_ * fVar208;
      auVar176._12_4_ = auVar189._12_4_ + auVar30._12_4_ * fVar377;
      auVar176._16_4_ = auVar189._0_4_ + auVar30._16_4_ * fVar209;
      auVar176._20_4_ = auVar189._4_4_ + auVar30._20_4_ * fVar210;
      auVar176._24_4_ = auVar189._8_4_ + auVar30._24_4_ * fVar211;
      auVar176._28_4_ = auVar189._12_4_ + auVar30._28_4_;
      auVar30 = vsubps_avx(auVar232,auVar203);
      auVar204._0_4_ = auVar222._0_4_ + auVar30._0_4_ * fVar207;
      auVar204._4_4_ = auVar222._4_4_ + auVar30._4_4_ * fVar368;
      auVar204._8_4_ = auVar222._8_4_ + auVar30._8_4_ * fVar208;
      auVar204._12_4_ = auVar222._12_4_ + auVar30._12_4_ * fVar377;
      auVar204._16_4_ = auVar222._0_4_ + auVar30._16_4_ * fVar209;
      auVar204._20_4_ = auVar222._4_4_ + auVar30._20_4_ * fVar210;
      auVar204._24_4_ = auVar222._8_4_ + auVar30._24_4_ * fVar211;
      auVar204._28_4_ = auVar222._12_4_ + auVar30._28_4_;
      auVar138 = vsubps_avx(auVar134,auVar249);
      auVar150._0_4_ = auVar249._0_4_ + auVar138._0_4_ * fVar207;
      auVar150._4_4_ = auVar249._4_4_ + auVar138._4_4_ * fVar368;
      auVar150._8_4_ = auVar249._8_4_ + auVar138._8_4_ * fVar208;
      auVar150._12_4_ = auVar249._12_4_ + auVar138._12_4_ * fVar377;
      auVar150._16_4_ = auVar249._0_4_ + auVar138._0_4_ * fVar209;
      auVar150._20_4_ = auVar249._4_4_ + auVar138._4_4_ * fVar210;
      auVar150._24_4_ = auVar249._8_4_ + auVar138._8_4_ * fVar211;
      auVar150._28_4_ = auVar249._12_4_ + auVar138._12_4_;
      auVar30 = vsubps_avx(auVar204,auVar176);
      auVar177._0_4_ = auVar176._0_4_ + fVar207 * auVar30._0_4_;
      auVar177._4_4_ = auVar176._4_4_ + fVar368 * auVar30._4_4_;
      auVar177._8_4_ = auVar176._8_4_ + fVar208 * auVar30._8_4_;
      auVar177._12_4_ = auVar176._12_4_ + fVar377 * auVar30._12_4_;
      auVar177._16_4_ = auVar176._16_4_ + fVar209 * auVar30._16_4_;
      auVar177._20_4_ = auVar176._20_4_ + fVar210 * auVar30._20_4_;
      auVar177._24_4_ = auVar176._24_4_ + fVar211 * auVar30._24_4_;
      auVar177._28_4_ = auVar176._28_4_ + auVar30._28_4_;
      auVar30 = vsubps_avx(auVar150,auVar204);
      auVar151._0_4_ = auVar204._0_4_ + fVar207 * auVar30._0_4_;
      auVar151._4_4_ = auVar204._4_4_ + fVar368 * auVar30._4_4_;
      auVar151._8_4_ = auVar204._8_4_ + fVar208 * auVar30._8_4_;
      auVar151._12_4_ = auVar204._12_4_ + fVar377 * auVar30._12_4_;
      auVar151._16_4_ = auVar204._16_4_ + fVar209 * auVar30._16_4_;
      auVar151._20_4_ = auVar204._20_4_ + fVar210 * auVar30._20_4_;
      auVar151._24_4_ = auVar204._24_4_ + fVar211 * auVar30._24_4_;
      auVar151._28_4_ = auVar204._28_4_ + auVar30._28_4_;
      auVar30 = vsubps_avx(auVar151,auVar177);
      auVar190._0_4_ = auVar177._0_4_ + fVar207 * auVar30._0_4_;
      auVar190._4_4_ = auVar177._4_4_ + fVar368 * auVar30._4_4_;
      auVar190._8_4_ = auVar177._8_4_ + fVar208 * auVar30._8_4_;
      auVar190._12_4_ = auVar177._12_4_ + fVar377 * auVar30._12_4_;
      auVar205._16_4_ = auVar177._16_4_ + fVar209 * auVar30._16_4_;
      auVar205._0_16_ = auVar190;
      auVar205._20_4_ = auVar177._20_4_ + fVar210 * auVar30._20_4_;
      auVar205._24_4_ = auVar177._24_4_ + fVar211 * auVar30._24_4_;
      auVar205._28_4_ = auVar177._28_4_ + auVar204._28_4_;
      fVar207 = auVar30._4_4_ * 3.0;
      auVar165 = auVar205._16_16_;
      auVar137 = vshufps_avx(ZEXT416((uint)(fVar206 * 0.33333334)),
                             ZEXT416((uint)(fVar206 * 0.33333334)),0);
      auVar314._0_4_ = auVar190._0_4_ + auVar137._0_4_ * auVar30._0_4_ * 3.0;
      auVar314._4_4_ = auVar190._4_4_ + auVar137._4_4_ * fVar207;
      auVar314._8_4_ = auVar190._8_4_ + auVar137._8_4_ * auVar30._8_4_ * 3.0;
      auVar314._12_4_ = auVar190._12_4_ + auVar137._12_4_ * auVar30._12_4_ * 3.0;
      auVar256 = vshufpd_avx(auVar190,auVar190,3);
      auVar160 = vshufpd_avx(auVar165,auVar165,3);
      _local_3b8 = auVar256;
      auVar31 = _local_3b8;
      auVar138 = vsubps_avx(auVar256,auVar190);
      _local_428 = auVar160;
      auVar38 = vsubps_avx(auVar160,auVar165);
      auVar135._0_4_ = auVar138._0_4_ + auVar38._0_4_;
      auVar135._4_4_ = auVar138._4_4_ + auVar38._4_4_;
      auVar135._8_4_ = auVar138._8_4_ + auVar38._8_4_;
      auVar135._12_4_ = auVar138._12_4_ + auVar38._12_4_;
      auVar138 = vmovshdup_avx(auVar190);
      auVar38 = vmovshdup_avx(auVar314);
      auVar194 = vshufps_avx(auVar135,auVar135,0);
      auVar113 = vshufps_avx(auVar135,auVar135,0x55);
      fVar210 = auVar113._0_4_;
      fVar211 = auVar113._4_4_;
      fVar212 = auVar113._8_4_;
      fVar233 = auVar113._12_4_;
      fVar368 = auVar194._0_4_;
      fVar208 = auVar194._4_4_;
      fVar377 = auVar194._8_4_;
      fVar209 = auVar194._12_4_;
      auVar298._0_4_ = fVar368 * auVar190._0_4_ + fVar210 * auVar138._0_4_;
      auVar298._4_4_ = fVar208 * auVar190._4_4_ + fVar211 * auVar138._4_4_;
      auVar298._8_4_ = fVar377 * auVar190._8_4_ + fVar212 * auVar138._8_4_;
      auVar298._12_4_ = fVar209 * auVar190._12_4_ + fVar233 * auVar138._12_4_;
      _local_468 = auVar314;
      auVar315._0_4_ = auVar314._0_4_ * fVar368 + fVar210 * auVar38._0_4_;
      auVar315._4_4_ = auVar314._4_4_ * fVar208 + fVar211 * auVar38._4_4_;
      auVar315._8_4_ = auVar314._8_4_ * fVar377 + fVar212 * auVar38._8_4_;
      auVar315._12_4_ = auVar314._12_4_ * fVar209 + fVar233 * auVar38._12_4_;
      auVar38 = vshufps_avx(auVar298,auVar298,0xe8);
      auVar194 = vshufps_avx(auVar315,auVar315,0xe8);
      auVar138 = vcmpps_avx(auVar38,auVar194,1);
      uVar89 = vextractps_avx(auVar138,0);
      auVar113 = auVar315;
      if ((uVar89 & 1) == 0) {
        auVar113 = auVar298;
      }
      auVar136._0_4_ = auVar137._0_4_ * auVar30._16_4_ * 3.0;
      auVar136._4_4_ = auVar137._4_4_ * fVar207;
      auVar136._8_4_ = auVar137._8_4_ * auVar30._24_4_ * 3.0;
      auVar136._12_4_ = auVar137._12_4_ * auVar115._28_4_;
      auVar11 = vsubps_avx(auVar165,auVar136);
      auVar137 = vmovshdup_avx(auVar11);
      auVar165 = vmovshdup_avx(auVar165);
      fVar207 = auVar11._0_4_;
      fVar234 = auVar11._4_4_;
      auVar389._0_4_ = fVar368 * fVar207 + fVar210 * auVar137._0_4_;
      auVar389._4_4_ = fVar208 * fVar234 + fVar211 * auVar137._4_4_;
      auVar389._8_4_ = fVar377 * auVar11._8_4_ + fVar212 * auVar137._8_4_;
      auVar389._12_4_ = fVar209 * auVar11._12_4_ + fVar233 * auVar137._12_4_;
      auVar369._0_4_ = fVar368 * auVar205._16_4_ + fVar210 * auVar165._0_4_;
      auVar369._4_4_ = fVar208 * auVar205._20_4_ + fVar211 * auVar165._4_4_;
      auVar369._8_4_ = fVar377 * auVar205._24_4_ + fVar212 * auVar165._8_4_;
      auVar369._12_4_ = fVar209 * auVar205._28_4_ + fVar233 * auVar165._12_4_;
      auVar165 = vshufps_avx(auVar389,auVar389,0xe8);
      auVar10 = vshufps_avx(auVar369,auVar369,0xe8);
      auVar137 = vcmpps_avx(auVar165,auVar10,1);
      uVar89 = vextractps_avx(auVar137,0);
      auVar280 = auVar369;
      if ((uVar89 & 1) == 0) {
        auVar280 = auVar389;
      }
      auVar113 = vmaxss_avx(auVar280,auVar113);
      auVar38 = vminps_avx(auVar38,auVar194);
      auVar194 = vminps_avx(auVar165,auVar10);
      auVar194 = vminps_avx(auVar38,auVar194);
      auVar138 = vshufps_avx(auVar138,auVar138,0x55);
      auVar138 = vblendps_avx(auVar138,auVar137,2);
      auVar137 = vpslld_avx(auVar138,0x1f);
      auVar138 = vshufpd_avx(auVar315,auVar315,1);
      auVar138 = vinsertps_avx(auVar138,auVar369,0x9c);
      auVar38 = vshufpd_avx(auVar298,auVar298,1);
      auVar38 = vinsertps_avx(auVar38,auVar389,0x9c);
      auVar138 = vblendvps_avx(auVar38,auVar138,auVar137);
      auVar38 = vmovshdup_avx(auVar138);
      auVar138 = vmaxss_avx(auVar38,auVar138);
      fVar377 = auVar194._0_4_;
      auVar38 = vmovshdup_avx(auVar194);
      fVar208 = auVar138._0_4_;
      fVar209 = auVar38._0_4_;
      fVar368 = auVar113._0_4_;
      _local_3b8 = auVar31;
      if ((0.0001 <= fVar377) || (fVar208 <= -0.0001)) {
        if ((-0.0001 < fVar368 && fVar209 < 0.0001) ||
           ((fVar377 < 0.0001 && -0.0001 < fVar368 || (fVar209 < 0.0001 && -0.0001 < fVar208))))
        goto LAB_01206743;
LAB_0120734a:
        bVar77 = true;
      }
      else {
LAB_01206743:
        auVar137 = vcmpps_avx(auVar194,ZEXT816(0) << 0x20,1);
        auVar38 = vcmpss_avx(auVar113,ZEXT416(0),1);
        auVar390._8_4_ = 0x3f800000;
        auVar390._0_8_ = &DAT_3f8000003f800000;
        auVar390._12_4_ = 0x3f800000;
        auVar250._8_4_ = 0xbf800000;
        auVar250._0_8_ = 0xbf800000bf800000;
        auVar250._12_4_ = 0xbf800000;
        auVar38 = vblendvps_avx(auVar390,auVar250,auVar38);
        auVar137 = vblendvps_avx(auVar390,auVar250,auVar137);
        auVar165 = vcmpss_avx(auVar38,auVar137,4);
        auVar165 = vpshufd_avx(ZEXT416(auVar165._0_4_ & 1),0x50);
        auVar165 = vpslld_avx(auVar165,0x1f);
        auVar165 = vpsrad_avx(auVar165,0x1f);
        auVar165 = vpandn_avx(auVar165,_DAT_02020eb0);
        auVar10 = vmovshdup_avx(auVar137);
        fVar210 = auVar10._0_4_;
        if ((auVar137._0_4_ != fVar210) || (NAN(auVar137._0_4_) || NAN(fVar210))) {
          if ((fVar209 != fVar377) || (NAN(fVar209) || NAN(fVar377))) {
            fVar377 = -fVar377 / (fVar209 - fVar377);
            auVar137 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar377) * 0.0 + fVar377)));
          }
          else {
            auVar137 = vcmpss_avx(auVar194,ZEXT416(0),0);
            auVar137 = vpshufd_avx(ZEXT416(auVar137._0_4_ & 1),0x50);
            auVar137 = vpslld_avx(auVar137,0x1f);
            auVar137 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar137);
          }
          auVar10 = vcmpps_avx(auVar165,auVar137,1);
          auVar194 = vblendps_avx(auVar165,auVar137,2);
          auVar137 = vblendps_avx(auVar137,auVar165,2);
          auVar165 = vblendvps_avx(auVar137,auVar194,auVar10);
        }
        auVar138 = vcmpss_avx(auVar138,ZEXT416(0),1);
        auVar166._8_4_ = 0xbf800000;
        auVar166._0_8_ = 0xbf800000bf800000;
        auVar166._12_4_ = 0xbf800000;
        auVar138 = vblendvps_avx(auVar390,auVar166,auVar138);
        fVar377 = auVar138._0_4_;
        if ((auVar38._0_4_ != fVar377) || (NAN(auVar38._0_4_) || NAN(fVar377))) {
          if ((fVar208 != fVar368) || (NAN(fVar208) || NAN(fVar368))) {
            fVar368 = -fVar368 / (fVar208 - fVar368);
            auVar138 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar368) * 0.0 + fVar368)));
          }
          else {
            auVar138 = vcmpss_avx(auVar113,ZEXT416(0),0);
            auVar138 = vpshufd_avx(ZEXT416(auVar138._0_4_ & 1),0x50);
            auVar138 = vpslld_avx(auVar138,0x1f);
            auVar138 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar138);
          }
          auVar137 = vcmpps_avx(auVar165,auVar138,1);
          auVar38 = vblendps_avx(auVar165,auVar138,2);
          auVar138 = vblendps_avx(auVar138,auVar165,2);
          auVar165 = vblendvps_avx(auVar138,auVar38,auVar137);
        }
        if ((fVar210 != fVar377) || (NAN(fVar210) || NAN(fVar377))) {
          auVar138 = vcmpps_avx(auVar165,auVar390,1);
          auVar38 = vinsertps_avx(auVar165,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar251._4_12_ = auVar165._4_12_;
          auVar251._0_4_ = 0x3f800000;
          auVar165 = vblendvps_avx(auVar251,auVar38,auVar138);
        }
        auVar138 = vcmpps_avx(auVar165,_DAT_01fec6f0,1);
        auVar78._12_4_ = 0;
        auVar78._0_12_ = auVar165._4_12_;
        auVar38 = vinsertps_avx(auVar165,ZEXT416(0x3f800000),0x10);
        auVar138 = vblendvps_avx(auVar38,auVar78 << 0x20,auVar138);
        auVar38 = vmovshdup_avx(auVar138);
        bVar77 = true;
        if (auVar138._0_4_ <= auVar38._0_4_) {
          auVar139._0_4_ = auVar138._0_4_ + -0.1;
          auVar139._4_4_ = auVar138._4_4_ + 0.1;
          auVar139._8_4_ = auVar138._8_4_ + 0.0;
          auVar139._12_4_ = auVar138._12_4_ + 0.0;
          auVar137 = vshufpd_avx(auVar314,auVar314,3);
          register0x000012c8 = 0x3f80000000000000;
          local_468 = (undefined1  [8])0x3f80000000000000;
          auVar138 = vcmpps_avx(auVar139,_local_468,1);
          auVar79._12_4_ = 0;
          auVar79._0_12_ = auVar139._4_12_;
          auVar38 = vinsertps_avx(auVar139,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar138 = vblendvps_avx(auVar38,auVar79 << 0x20,auVar138);
          auVar38 = vshufpd_avx(auVar11,auVar11,3);
          auVar194 = vshufps_avx(auVar138,auVar138,0x50);
          auVar113 = vsubps_avx(auVar390,auVar194);
          local_3b8._0_4_ = auVar256._0_4_;
          local_3b8._4_4_ = auVar256._4_4_;
          fStack_3b0 = auVar256._8_4_;
          fStack_3ac = auVar256._12_4_;
          fVar368 = auVar194._0_4_;
          fVar208 = auVar194._4_4_;
          fVar377 = auVar194._8_4_;
          fVar209 = auVar194._12_4_;
          local_428._0_4_ = auVar160._0_4_;
          local_428._4_4_ = auVar160._4_4_;
          fStack_420 = auVar160._8_4_;
          fStack_41c = auVar160._12_4_;
          fVar210 = auVar113._0_4_;
          fVar211 = auVar113._4_4_;
          fVar212 = auVar113._8_4_;
          fVar233 = auVar113._12_4_;
          auVar167._0_4_ = fVar368 * (float)local_3b8._0_4_ + fVar210 * auVar190._0_4_;
          auVar167._4_4_ = fVar208 * (float)local_3b8._4_4_ + fVar211 * auVar190._4_4_;
          auVar167._8_4_ = fVar377 * fStack_3b0 + fVar212 * auVar190._0_4_;
          auVar167._12_4_ = fVar209 * fStack_3ac + fVar233 * auVar190._4_4_;
          auVar223._0_4_ = fVar368 * auVar137._0_4_ + fVar210 * auVar314._0_4_;
          auVar223._4_4_ = fVar208 * auVar137._4_4_ + fVar211 * auVar314._4_4_;
          auVar223._8_4_ = fVar377 * auVar137._8_4_ + fVar212 * auVar314._0_4_;
          auVar223._12_4_ = fVar209 * auVar137._12_4_ + fVar233 * auVar314._4_4_;
          auVar281._0_4_ = fVar368 * auVar38._0_4_ + fVar210 * fVar207;
          auVar281._4_4_ = fVar208 * auVar38._4_4_ + fVar211 * fVar234;
          auVar281._8_4_ = fVar377 * auVar38._8_4_ + fVar212 * fVar207;
          auVar281._12_4_ = fVar209 * auVar38._12_4_ + fVar233 * fVar234;
          auVar299._0_4_ = fVar368 * (float)local_428._0_4_ + fVar210 * auVar205._16_4_;
          auVar299._4_4_ = fVar208 * (float)local_428._4_4_ + fVar211 * auVar205._20_4_;
          auVar299._8_4_ = fVar377 * fStack_420 + fVar212 * auVar205._16_4_;
          auVar299._12_4_ = fVar209 * fStack_41c + fVar233 * auVar205._20_4_;
          auVar160 = vsubps_avx(auVar390,auVar138);
          auVar38 = vmovshdup_avx(_local_4a8);
          auVar256 = vmovsldup_avx(_local_4a8);
          local_4a8._0_4_ = auVar160._0_4_ * auVar256._0_4_ + auVar38._0_4_ * auVar138._0_4_;
          local_4a8._4_4_ = auVar160._4_4_ * auVar256._4_4_ + auVar38._4_4_ * auVar138._4_4_;
          fStack_4a0 = auVar160._8_4_ * auVar256._8_4_ + auVar38._8_4_ * auVar138._8_4_;
          fStack_49c = auVar160._12_4_ * auVar256._12_4_ + auVar38._12_4_ * auVar138._12_4_;
          _local_428 = vmovshdup_avx(_local_4a8);
          auVar138 = vsubps_avx(auVar223,auVar167);
          auVar252._0_4_ = auVar138._0_4_ * 3.0;
          auVar252._4_4_ = auVar138._4_4_ * 3.0;
          auVar252._8_4_ = auVar138._8_4_ * 3.0;
          auVar252._12_4_ = auVar138._12_4_ * 3.0;
          auVar138 = vsubps_avx(auVar281,auVar223);
          auVar269._0_4_ = auVar138._0_4_ * 3.0;
          auVar269._4_4_ = auVar138._4_4_ * 3.0;
          auVar269._8_4_ = auVar138._8_4_ * 3.0;
          auVar269._12_4_ = auVar138._12_4_ * 3.0;
          auVar138 = vsubps_avx(auVar299,auVar281);
          auVar316._0_4_ = auVar138._0_4_ * 3.0;
          auVar316._4_4_ = auVar138._4_4_ * 3.0;
          auVar316._8_4_ = auVar138._8_4_ * 3.0;
          auVar316._12_4_ = auVar138._12_4_ * 3.0;
          auVar38 = vminps_avx(auVar269,auVar316);
          auVar138 = vmaxps_avx(auVar269,auVar316);
          auVar38 = vminps_avx(auVar252,auVar38);
          auVar138 = vmaxps_avx(auVar252,auVar138);
          auVar256 = vshufpd_avx(auVar38,auVar38,3);
          auVar160 = vshufpd_avx(auVar138,auVar138,3);
          auVar38 = vminps_avx(auVar38,auVar256);
          auVar138 = vmaxps_avx(auVar138,auVar160);
          auVar256 = vshufps_avx(ZEXT416((uint)(1.0 / fVar206)),ZEXT416((uint)(1.0 / fVar206)),0);
          auVar253._0_4_ = auVar256._0_4_ * auVar38._0_4_;
          auVar253._4_4_ = auVar256._4_4_ * auVar38._4_4_;
          auVar253._8_4_ = auVar256._8_4_ * auVar38._8_4_;
          auVar253._12_4_ = auVar256._12_4_ * auVar38._12_4_;
          auVar270._0_4_ = auVar138._0_4_ * auVar256._0_4_;
          auVar270._4_4_ = auVar138._4_4_ * auVar256._4_4_;
          auVar270._8_4_ = auVar138._8_4_ * auVar256._8_4_;
          auVar270._12_4_ = auVar138._12_4_ * auVar256._12_4_;
          auVar113 = ZEXT416((uint)(1.0 / (local_428._0_4_ - (float)local_4a8._0_4_)));
          auVar138 = vshufpd_avx(auVar167,auVar167,3);
          auVar38 = vshufpd_avx(auVar223,auVar223,3);
          auVar256 = vshufpd_avx(auVar281,auVar281,3);
          auVar160 = vshufpd_avx(auVar299,auVar299,3);
          auVar138 = vsubps_avx(auVar138,auVar167);
          auVar137 = vsubps_avx(auVar38,auVar223);
          auVar194 = vsubps_avx(auVar256,auVar281);
          auVar160 = vsubps_avx(auVar160,auVar299);
          auVar38 = vminps_avx(auVar138,auVar137);
          auVar138 = vmaxps_avx(auVar138,auVar137);
          auVar256 = vminps_avx(auVar194,auVar160);
          auVar256 = vminps_avx(auVar38,auVar256);
          auVar38 = vmaxps_avx(auVar194,auVar160);
          auVar138 = vmaxps_avx(auVar138,auVar38);
          auVar38 = vshufps_avx(auVar113,auVar113,0);
          auVar329._0_4_ = auVar38._0_4_ * auVar256._0_4_;
          auVar329._4_4_ = auVar38._4_4_ * auVar256._4_4_;
          auVar329._8_4_ = auVar38._8_4_ * auVar256._8_4_;
          auVar329._12_4_ = auVar38._12_4_ * auVar256._12_4_;
          auVar340._0_4_ = auVar38._0_4_ * auVar138._0_4_;
          auVar340._4_4_ = auVar38._4_4_ * auVar138._4_4_;
          auVar340._8_4_ = auVar38._8_4_ * auVar138._8_4_;
          auVar340._12_4_ = auVar38._12_4_ * auVar138._12_4_;
          auVar138 = vmovsldup_avx(_local_4a8);
          auVar282._4_12_ = auVar138._4_12_;
          auVar282._0_4_ = fVar178;
          auVar300._4_12_ = local_4a8._4_12_;
          auVar300._0_4_ = fVar152;
          auVar114._0_4_ = (fVar152 + fVar178) * 0.5;
          auVar114._4_4_ = ((float)local_4a8._4_4_ + auVar138._4_4_) * 0.5;
          auVar114._8_4_ = (fStack_4a0 + auVar138._8_4_) * 0.5;
          auVar114._12_4_ = (fStack_49c + auVar138._12_4_) * 0.5;
          auVar138 = vshufps_avx(auVar114,auVar114,0);
          fVar207 = auVar138._0_4_;
          fVar368 = auVar138._4_4_;
          fVar208 = auVar138._8_4_;
          fVar377 = auVar138._12_4_;
          auVar224._0_4_ = fVar207 * (float)local_1c8._0_4_ + (float)local_3e8._0_4_;
          auVar224._4_4_ = fVar368 * (float)local_1c8._4_4_ + (float)local_3e8._4_4_;
          auVar224._8_4_ = fVar208 * fStack_1c0 + fStack_3e0;
          auVar224._12_4_ = fVar377 * fStack_1bc + fStack_3dc;
          auVar317._0_4_ = fVar207 * (float)local_1d8._0_4_ + (float)local_3f8._0_4_;
          auVar317._4_4_ = fVar368 * (float)local_1d8._4_4_ + (float)local_3f8._4_4_;
          auVar317._8_4_ = fVar208 * fStack_1d0 + fStack_3f0;
          auVar317._12_4_ = fVar377 * fStack_1cc + fStack_3ec;
          auVar359._0_4_ = fVar207 * (float)local_1e8._0_4_ + (float)local_408._0_4_;
          auVar359._4_4_ = fVar368 * (float)local_1e8._4_4_ + (float)local_408._4_4_;
          auVar359._8_4_ = fVar208 * fStack_1e0 + fStack_400;
          auVar359._12_4_ = fVar377 * fStack_1dc + fStack_3fc;
          auVar138 = vsubps_avx(auVar317,auVar224);
          auVar225._0_4_ = auVar138._0_4_ * fVar207 + auVar224._0_4_;
          auVar225._4_4_ = auVar138._4_4_ * fVar368 + auVar224._4_4_;
          auVar225._8_4_ = auVar138._8_4_ * fVar208 + auVar224._8_4_;
          auVar225._12_4_ = auVar138._12_4_ * fVar377 + auVar224._12_4_;
          auVar138 = vsubps_avx(auVar359,auVar317);
          auVar318._0_4_ = auVar317._0_4_ + auVar138._0_4_ * fVar207;
          auVar318._4_4_ = auVar317._4_4_ + auVar138._4_4_ * fVar368;
          auVar318._8_4_ = auVar317._8_4_ + auVar138._8_4_ * fVar208;
          auVar318._12_4_ = auVar317._12_4_ + auVar138._12_4_ * fVar377;
          auVar138 = vsubps_avx(auVar318,auVar225);
          fVar207 = auVar225._0_4_ + auVar138._0_4_ * fVar207;
          fVar368 = auVar225._4_4_ + auVar138._4_4_ * fVar368;
          auVar168._0_8_ = CONCAT44(fVar368,fVar207);
          auVar168._8_4_ = auVar225._8_4_ + auVar138._8_4_ * fVar208;
          auVar168._12_4_ = auVar225._12_4_ + auVar138._12_4_ * fVar377;
          fVar208 = auVar138._0_4_ * 3.0;
          fVar377 = auVar138._4_4_ * 3.0;
          auVar226._0_8_ = CONCAT44(fVar377,fVar208);
          auVar226._8_4_ = auVar138._8_4_ * 3.0;
          auVar226._12_4_ = auVar138._12_4_ * 3.0;
          auVar319._8_8_ = auVar168._0_8_;
          auVar319._0_8_ = auVar168._0_8_;
          auVar138 = vshufpd_avx(auVar168,auVar168,3);
          auVar38 = vshufps_avx(auVar114,auVar114,0x55);
          auVar194 = vsubps_avx(auVar138,auVar319);
          auVar320._0_4_ = auVar38._0_4_ * auVar194._0_4_ + fVar207;
          auVar320._4_4_ = auVar38._4_4_ * auVar194._4_4_ + fVar368;
          auVar320._8_4_ = auVar38._8_4_ * auVar194._8_4_ + fVar207;
          auVar320._12_4_ = auVar38._12_4_ * auVar194._12_4_ + fVar368;
          auVar370._8_8_ = auVar226._0_8_;
          auVar370._0_8_ = auVar226._0_8_;
          auVar138 = vshufpd_avx(auVar226,auVar226,1);
          auVar138 = vsubps_avx(auVar138,auVar370);
          auVar227._0_4_ = fVar208 + auVar38._0_4_ * auVar138._0_4_;
          auVar227._4_4_ = fVar377 + auVar38._4_4_ * auVar138._4_4_;
          auVar227._8_4_ = fVar208 + auVar38._8_4_ * auVar138._8_4_;
          auVar227._12_4_ = fVar377 + auVar38._12_4_ * auVar138._12_4_;
          auVar38 = vmovshdup_avx(auVar227);
          auVar371._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
          auVar371._8_4_ = auVar38._8_4_ ^ 0x80000000;
          auVar371._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar256 = vmovshdup_avx(auVar194);
          auVar138 = vunpcklps_avx(auVar256,auVar371);
          auVar160 = vshufps_avx(auVar138,auVar371,4);
          auVar169._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
          auVar169._8_4_ = -auVar194._8_4_;
          auVar169._12_4_ = -auVar194._12_4_;
          auVar138 = vmovlhps_avx(auVar169,auVar227);
          auVar137 = vshufps_avx(auVar138,auVar227,8);
          auVar138 = ZEXT416((uint)(auVar256._0_4_ * auVar227._0_4_ - auVar38._0_4_ * auVar194._0_4_
                                   ));
          auVar38 = vshufps_avx(auVar138,auVar138,0);
          auVar138 = vdivps_avx(auVar160,auVar38);
          auVar38 = vdivps_avx(auVar137,auVar38);
          auVar137 = vinsertps_avx(auVar253,auVar329,0x1c);
          auVar194 = vinsertps_avx(auVar270,auVar340,0x1c);
          auVar113 = vinsertps_avx(auVar329,auVar253,0x4c);
          auVar165 = vinsertps_avx(auVar340,auVar270,0x4c);
          auVar256 = vmovsldup_avx(auVar138);
          auVar341._0_4_ = auVar256._0_4_ * auVar137._0_4_;
          auVar341._4_4_ = auVar256._4_4_ * auVar137._4_4_;
          auVar341._8_4_ = auVar256._8_4_ * auVar137._8_4_;
          auVar341._12_4_ = auVar256._12_4_ * auVar137._12_4_;
          auVar330._0_4_ = auVar256._0_4_ * auVar194._0_4_;
          auVar330._4_4_ = auVar256._4_4_ * auVar194._4_4_;
          auVar330._8_4_ = auVar256._8_4_ * auVar194._8_4_;
          auVar330._12_4_ = auVar256._12_4_ * auVar194._12_4_;
          auVar160 = vminps_avx(auVar341,auVar330);
          auVar256 = vmaxps_avx(auVar330,auVar341);
          auVar10 = vmovsldup_avx(auVar38);
          auVar391._0_4_ = auVar10._0_4_ * auVar113._0_4_;
          auVar391._4_4_ = auVar10._4_4_ * auVar113._4_4_;
          auVar391._8_4_ = auVar10._8_4_ * auVar113._8_4_;
          auVar391._12_4_ = auVar10._12_4_ * auVar113._12_4_;
          auVar331._0_4_ = auVar10._0_4_ * auVar165._0_4_;
          auVar331._4_4_ = auVar10._4_4_ * auVar165._4_4_;
          auVar331._8_4_ = auVar10._8_4_ * auVar165._8_4_;
          auVar331._12_4_ = auVar10._12_4_ * auVar165._12_4_;
          auVar10 = vminps_avx(auVar391,auVar331);
          auVar140._0_4_ = auVar160._0_4_ + auVar10._0_4_;
          auVar140._4_4_ = auVar160._4_4_ + auVar10._4_4_;
          auVar140._8_4_ = auVar160._8_4_ + auVar10._8_4_;
          auVar140._12_4_ = auVar160._12_4_ + auVar10._12_4_;
          auVar160 = vmaxps_avx(auVar331,auVar391);
          auVar10 = vsubps_avx(auVar282,auVar114);
          auVar11 = vsubps_avx(auVar300,auVar114);
          auVar301._0_4_ = auVar256._0_4_ + auVar160._0_4_;
          auVar301._4_4_ = auVar256._4_4_ + auVar160._4_4_;
          auVar301._8_4_ = auVar256._8_4_ + auVar160._8_4_;
          auVar301._12_4_ = auVar256._12_4_ + auVar160._12_4_;
          auVar342._8_8_ = 0x3f800000;
          auVar342._0_8_ = 0x3f800000;
          auVar256 = vsubps_avx(auVar342,auVar301);
          auVar160 = vsubps_avx(auVar342,auVar140);
          fVar211 = auVar10._0_4_;
          auVar343._0_4_ = fVar211 * auVar256._0_4_;
          fVar212 = auVar10._4_4_;
          auVar343._4_4_ = fVar212 * auVar256._4_4_;
          fVar233 = auVar10._8_4_;
          auVar343._8_4_ = fVar233 * auVar256._8_4_;
          fVar234 = auVar10._12_4_;
          auVar343._12_4_ = fVar234 * auVar256._12_4_;
          fVar208 = auVar11._0_4_;
          auVar302._0_4_ = auVar256._0_4_ * fVar208;
          fVar377 = auVar11._4_4_;
          auVar302._4_4_ = auVar256._4_4_ * fVar377;
          fVar209 = auVar11._8_4_;
          auVar302._8_4_ = auVar256._8_4_ * fVar209;
          fVar210 = auVar11._12_4_;
          auVar302._12_4_ = auVar256._12_4_ * fVar210;
          auVar382._0_4_ = fVar211 * auVar160._0_4_;
          auVar382._4_4_ = fVar212 * auVar160._4_4_;
          auVar382._8_4_ = fVar233 * auVar160._8_4_;
          auVar382._12_4_ = fVar234 * auVar160._12_4_;
          auVar141._0_4_ = fVar208 * auVar160._0_4_;
          auVar141._4_4_ = fVar377 * auVar160._4_4_;
          auVar141._8_4_ = fVar209 * auVar160._8_4_;
          auVar141._12_4_ = fVar210 * auVar160._12_4_;
          auVar256 = vminps_avx(auVar343,auVar382);
          auVar160 = vminps_avx(auVar302,auVar141);
          auVar10 = vminps_avx(auVar256,auVar160);
          auVar256 = vmaxps_avx(auVar382,auVar343);
          auVar160 = vmaxps_avx(auVar141,auVar302);
          auVar11 = vshufps_avx(auVar114,auVar114,0x54);
          auVar160 = vmaxps_avx(auVar160,auVar256);
          auVar280 = vshufps_avx(auVar320,auVar320,0);
          auVar12 = vshufps_avx(auVar320,auVar320,0x55);
          auVar256 = vhaddps_avx(auVar10,auVar10);
          auVar160 = vhaddps_avx(auVar160,auVar160);
          auVar303._0_4_ = auVar280._0_4_ * auVar138._0_4_ + auVar12._0_4_ * auVar38._0_4_;
          auVar303._4_4_ = auVar280._4_4_ * auVar138._4_4_ + auVar12._4_4_ * auVar38._4_4_;
          auVar303._8_4_ = auVar280._8_4_ * auVar138._8_4_ + auVar12._8_4_ * auVar38._8_4_;
          auVar303._12_4_ = auVar280._12_4_ * auVar138._12_4_ + auVar12._12_4_ * auVar38._12_4_;
          auVar10 = vsubps_avx(auVar11,auVar303);
          fVar207 = auVar10._0_4_ + auVar256._0_4_;
          fVar368 = auVar10._0_4_ + auVar160._0_4_;
          auVar256 = vmaxss_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar207));
          auVar160 = vminss_avx(ZEXT416((uint)fVar368),ZEXT416((uint)fVar152));
          if (auVar256._0_4_ <= auVar160._0_4_) {
            auVar256 = vmovshdup_avx(auVar138);
            auVar191._0_4_ = auVar137._0_4_ * auVar256._0_4_;
            auVar191._4_4_ = auVar137._4_4_ * auVar256._4_4_;
            auVar191._8_4_ = auVar137._8_4_ * auVar256._8_4_;
            auVar191._12_4_ = auVar137._12_4_ * auVar256._12_4_;
            auVar142._0_4_ = auVar194._0_4_ * auVar256._0_4_;
            auVar142._4_4_ = auVar194._4_4_ * auVar256._4_4_;
            auVar142._8_4_ = auVar194._8_4_ * auVar256._8_4_;
            auVar142._12_4_ = auVar194._12_4_ * auVar256._12_4_;
            auVar160 = vminps_avx(auVar191,auVar142);
            auVar256 = vmaxps_avx(auVar142,auVar191);
            auVar137 = vmovshdup_avx(auVar38);
            auVar254._0_4_ = auVar137._0_4_ * auVar113._0_4_;
            auVar254._4_4_ = auVar137._4_4_ * auVar113._4_4_;
            auVar254._8_4_ = auVar137._8_4_ * auVar113._8_4_;
            auVar254._12_4_ = auVar137._12_4_ * auVar113._12_4_;
            auVar192._0_4_ = auVar137._0_4_ * auVar165._0_4_;
            auVar192._4_4_ = auVar137._4_4_ * auVar165._4_4_;
            auVar192._8_4_ = auVar137._8_4_ * auVar165._8_4_;
            auVar192._12_4_ = auVar137._12_4_ * auVar165._12_4_;
            auVar137 = vminps_avx(auVar254,auVar192);
            auVar271._0_4_ = auVar160._0_4_ + auVar137._0_4_;
            auVar271._4_4_ = auVar160._4_4_ + auVar137._4_4_;
            auVar271._8_4_ = auVar160._8_4_ + auVar137._8_4_;
            auVar271._12_4_ = auVar160._12_4_ + auVar137._12_4_;
            auVar160 = vmaxps_avx(auVar192,auVar254);
            auVar143._0_4_ = auVar256._0_4_ + auVar160._0_4_;
            auVar143._4_4_ = auVar256._4_4_ + auVar160._4_4_;
            auVar143._8_4_ = auVar256._8_4_ + auVar160._8_4_;
            auVar143._12_4_ = auVar256._12_4_ + auVar160._12_4_;
            auVar256 = vsubps_avx(_local_468,auVar143);
            auVar160 = vsubps_avx(_local_468,auVar271);
            auVar255._0_4_ = fVar211 * auVar256._0_4_;
            auVar255._4_4_ = fVar212 * auVar256._4_4_;
            auVar255._8_4_ = fVar233 * auVar256._8_4_;
            auVar255._12_4_ = fVar234 * auVar256._12_4_;
            auVar272._0_4_ = fVar211 * auVar160._0_4_;
            auVar272._4_4_ = fVar212 * auVar160._4_4_;
            auVar272._8_4_ = fVar233 * auVar160._8_4_;
            auVar272._12_4_ = fVar234 * auVar160._12_4_;
            auVar144._0_4_ = fVar208 * auVar256._0_4_;
            auVar144._4_4_ = fVar377 * auVar256._4_4_;
            auVar144._8_4_ = fVar209 * auVar256._8_4_;
            auVar144._12_4_ = fVar210 * auVar256._12_4_;
            auVar193._0_4_ = fVar208 * auVar160._0_4_;
            auVar193._4_4_ = fVar377 * auVar160._4_4_;
            auVar193._8_4_ = fVar209 * auVar160._8_4_;
            auVar193._12_4_ = fVar210 * auVar160._12_4_;
            auVar256 = vminps_avx(auVar255,auVar272);
            auVar160 = vminps_avx(auVar144,auVar193);
            auVar256 = vminps_avx(auVar256,auVar160);
            auVar160 = vmaxps_avx(auVar272,auVar255);
            auVar137 = vmaxps_avx(auVar193,auVar144);
            auVar256 = vhaddps_avx(auVar256,auVar256);
            auVar160 = vmaxps_avx(auVar137,auVar160);
            auVar160 = vhaddps_avx(auVar160,auVar160);
            auVar137 = vmovshdup_avx(auVar10);
            auVar194 = ZEXT416((uint)(auVar137._0_4_ + auVar256._0_4_));
            auVar256 = vmaxss_avx(_local_4a8,auVar194);
            auVar137 = ZEXT416((uint)(auVar137._0_4_ + auVar160._0_4_));
            auVar160 = vminss_avx(auVar137,_local_428);
            auVar392._8_4_ = 0x7fffffff;
            auVar392._0_8_ = 0x7fffffff7fffffff;
            auVar392._12_4_ = 0x7fffffff;
            if (auVar256._0_4_ <= auVar160._0_4_) {
              uVar89 = 0;
              if ((fVar178 < fVar207) && (fVar368 < fVar152)) {
                auVar256 = vcmpps_avx(auVar137,_local_428,1);
                auVar160 = vcmpps_avx(_local_4a8,auVar194,1);
                auVar256 = vandps_avx(auVar160,auVar256);
                uVar89 = auVar256._0_4_;
              }
              if (((uint)uVar91 < 4 && 0.001 <= fVar206) && (uVar89 & 1) == 0) {
                bVar77 = false;
              }
              else {
                lVar96 = 200;
                do {
                  fVar206 = auVar10._0_4_;
                  fVar152 = 1.0 - fVar206;
                  auVar256 = ZEXT416((uint)(fVar152 * fVar152 * fVar152));
                  auVar256 = vshufps_avx(auVar256,auVar256,0);
                  auVar160 = ZEXT416((uint)(fVar206 * 3.0 * fVar152 * fVar152));
                  auVar160 = vshufps_avx(auVar160,auVar160,0);
                  auVar137 = ZEXT416((uint)(fVar152 * fVar206 * fVar206 * 3.0));
                  auVar137 = vshufps_avx(auVar137,auVar137,0);
                  auVar194 = ZEXT416((uint)(fVar206 * fVar206 * fVar206));
                  auVar194 = vshufps_avx(auVar194,auVar194,0);
                  fVar152 = (float)local_3e8._0_4_ * auVar256._0_4_ +
                            (float)local_3f8._0_4_ * auVar160._0_4_ +
                            (float)local_298._0_4_ * auVar194._0_4_ +
                            (float)local_408._0_4_ * auVar137._0_4_;
                  fVar206 = (float)local_3e8._4_4_ * auVar256._4_4_ +
                            (float)local_3f8._4_4_ * auVar160._4_4_ +
                            (float)local_298._4_4_ * auVar194._4_4_ +
                            (float)local_408._4_4_ * auVar137._4_4_;
                  auVar145._0_8_ = CONCAT44(fVar206,fVar152);
                  auVar145._8_4_ =
                       fStack_3e0 * auVar256._8_4_ +
                       fStack_3f0 * auVar160._8_4_ +
                       fStack_290 * auVar194._8_4_ + fStack_400 * auVar137._8_4_;
                  auVar145._12_4_ =
                       fStack_3dc * auVar256._12_4_ +
                       fStack_3ec * auVar160._12_4_ +
                       fStack_28c * auVar194._12_4_ + fStack_3fc * auVar137._12_4_;
                  auVar195._8_8_ = auVar145._0_8_;
                  auVar195._0_8_ = auVar145._0_8_;
                  auVar160 = vshufpd_avx(auVar145,auVar145,1);
                  auVar256 = vmovshdup_avx(auVar10);
                  auVar160 = vsubps_avx(auVar160,auVar195);
                  auVar146._0_4_ = auVar256._0_4_ * auVar160._0_4_ + fVar152;
                  auVar146._4_4_ = auVar256._4_4_ * auVar160._4_4_ + fVar206;
                  auVar146._8_4_ = auVar256._8_4_ * auVar160._8_4_ + fVar152;
                  auVar146._12_4_ = auVar256._12_4_ * auVar160._12_4_ + fVar206;
                  auVar256 = vshufps_avx(auVar146,auVar146,0);
                  auVar160 = vshufps_avx(auVar146,auVar146,0x55);
                  auVar196._0_4_ = auVar138._0_4_ * auVar256._0_4_ + auVar38._0_4_ * auVar160._0_4_;
                  auVar196._4_4_ = auVar138._4_4_ * auVar256._4_4_ + auVar38._4_4_ * auVar160._4_4_;
                  auVar196._8_4_ = auVar138._8_4_ * auVar256._8_4_ + auVar38._8_4_ * auVar160._8_4_;
                  auVar196._12_4_ =
                       auVar138._12_4_ * auVar256._12_4_ + auVar38._12_4_ * auVar160._12_4_;
                  auVar10 = vsubps_avx(auVar10,auVar196);
                  auVar256 = vandps_avx(auVar392,auVar146);
                  auVar160 = vshufps_avx(auVar256,auVar256,0xf5);
                  auVar256 = vmaxss_avx(auVar160,auVar256);
                  if (auVar256._0_4_ < fVar179) {
                    fVar152 = auVar10._0_4_;
                    if ((0.0 <= fVar152) && (fVar152 <= 1.0)) {
                      auVar138 = vmovshdup_avx(auVar10);
                      fVar206 = auVar138._0_4_;
                      if ((0.0 <= fVar206) && (fVar206 <= 1.0)) {
                        auVar138 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                 ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                 0x1c);
                        auVar165 = vinsertps_avx(auVar138,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                        aVar9 = (ray->org).field_0;
                        auVar138 = vsubps_avx(_local_328,(undefined1  [16])aVar9);
                        auVar138 = vdpps_avx(auVar138,auVar165,0x7f);
                        auVar38 = vsubps_avx(_local_338,(undefined1  [16])aVar9);
                        auVar38 = vdpps_avx(auVar38,auVar165,0x7f);
                        auVar256 = vsubps_avx(_local_348,(undefined1  [16])aVar9);
                        auVar256 = vdpps_avx(auVar256,auVar165,0x7f);
                        auVar160 = vsubps_avx(_local_358,(undefined1  [16])aVar9);
                        auVar160 = vdpps_avx(auVar160,auVar165,0x7f);
                        auVar137 = vsubps_avx(_local_368,(undefined1  [16])aVar9);
                        auVar137 = vdpps_avx(auVar137,auVar165,0x7f);
                        auVar194 = vsubps_avx(_local_378,(undefined1  [16])aVar9);
                        auVar194 = vdpps_avx(auVar194,auVar165,0x7f);
                        auVar85._4_4_ = fStack_384;
                        auVar85._0_4_ = local_388;
                        auVar85._8_4_ = fStack_380;
                        auVar85._12_4_ = fStack_37c;
                        auVar113 = vsubps_avx(auVar85,(undefined1  [16])aVar9);
                        auVar113 = vdpps_avx(auVar113,auVar165,0x7f);
                        auVar82._4_4_ = fStack_394;
                        auVar82._0_4_ = local_398;
                        auVar82._8_4_ = fStack_390;
                        auVar82._12_4_ = fStack_38c;
                        auVar11 = vsubps_avx(auVar82,(undefined1  [16])aVar9);
                        auVar165 = vdpps_avx(auVar11,auVar165,0x7f);
                        fVar209 = 1.0 - fVar206;
                        fVar210 = 1.0 - fVar152;
                        fVar207 = auVar10._4_4_;
                        fVar368 = auVar10._8_4_;
                        fVar208 = auVar10._12_4_;
                        fVar377 = fVar210 * fVar152 * fVar152 * 3.0;
                        auVar257._0_4_ = fVar152 * fVar152 * fVar152;
                        auVar257._4_4_ = fVar207 * fVar207 * fVar207;
                        auVar257._8_4_ = fVar368 * fVar368 * fVar368;
                        auVar257._12_4_ = fVar208 * fVar208 * fVar208;
                        fVar207 = fVar152 * 3.0 * fVar210 * fVar210;
                        fVar368 = fVar210 * fVar210 * fVar210;
                        fVar152 = (fVar209 * auVar138._0_4_ + auVar137._0_4_ * fVar206) * fVar368 +
                                  fVar207 * (auVar194._0_4_ * fVar206 + fVar209 * auVar38._0_4_) +
                                  fVar377 * (auVar113._0_4_ * fVar206 + fVar209 * auVar256._0_4_) +
                                  auVar257._0_4_ *
                                  (fVar209 * auVar160._0_4_ + fVar206 * auVar165._0_4_);
                        if (((ray->org).field_0.m128[3] <= fVar152) &&
                           (fVar206 = ray->tfar, fVar152 <= fVar206)) {
                          local_428 = auVar98;
                          pGVar24 = (context->scene->geometries).items[uVar90].ptr;
                          auVar138 = ZEXT416((uint)fVar178);
                          if ((pGVar24->mask & ray->mask) == 0) {
                            bVar87 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar87 = true,
                                  pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar138 = vshufps_avx(auVar10,auVar10,0x55);
                            auVar304._8_4_ = 0x3f800000;
                            auVar304._0_8_ = &DAT_3f8000003f800000;
                            auVar304._12_4_ = 0x3f800000;
                            auVar186 = vsubps_avx(auVar304,auVar138);
                            fVar178 = auVar138._0_4_;
                            fVar208 = auVar138._4_4_;
                            fVar209 = auVar138._8_4_;
                            fVar211 = auVar138._12_4_;
                            fVar212 = auVar186._0_4_;
                            fVar233 = auVar186._4_4_;
                            fVar234 = auVar186._8_4_;
                            fVar235 = auVar186._12_4_;
                            auVar321._0_4_ =
                                 fVar178 * (float)local_368._0_4_ + fVar212 * (float)local_328._0_4_
                            ;
                            auVar321._4_4_ =
                                 fVar208 * (float)local_368._4_4_ + fVar233 * (float)local_328._4_4_
                            ;
                            auVar321._8_4_ = fVar209 * fStack_360 + fVar234 * fStack_320;
                            auVar321._12_4_ = fVar211 * fStack_35c + fVar235 * fStack_31c;
                            auVar332._0_4_ =
                                 fVar178 * (float)local_378._0_4_ + fVar212 * (float)local_338._0_4_
                            ;
                            auVar332._4_4_ =
                                 fVar208 * (float)local_378._4_4_ + fVar233 * (float)local_338._4_4_
                            ;
                            auVar332._8_4_ = fVar209 * fStack_370 + fVar234 * fStack_330;
                            auVar332._12_4_ = fVar211 * fStack_36c + fVar235 * fStack_32c;
                            auVar344._0_4_ = fVar178 * local_388 + fVar212 * (float)local_348._0_4_;
                            auVar344._4_4_ = fVar208 * fStack_384 + fVar233 * (float)local_348._4_4_
                            ;
                            auVar344._8_4_ = fVar209 * fStack_380 + fVar234 * fStack_340;
                            auVar344._12_4_ = fVar211 * fStack_37c + fVar235 * fStack_33c;
                            auVar283._0_4_ = fVar212 * (float)local_358._0_4_ + fVar178 * local_398;
                            auVar283._4_4_ = fVar233 * (float)local_358._4_4_ + fVar208 * fStack_394
                            ;
                            auVar283._8_4_ = fVar234 * fStack_350 + fVar209 * fStack_390;
                            auVar283._12_4_ = fVar235 * fStack_34c + fVar211 * fStack_38c;
                            auVar256 = vsubps_avx(auVar332,auVar321);
                            auVar160 = vsubps_avx(auVar344,auVar332);
                            auVar137 = vsubps_avx(auVar283,auVar344);
                            auVar138 = vshufps_avx(auVar10,auVar10,0);
                            fVar211 = auVar138._0_4_;
                            fVar212 = auVar138._4_4_;
                            fVar233 = auVar138._8_4_;
                            fVar234 = auVar138._12_4_;
                            auVar138 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
                            fVar178 = auVar138._0_4_;
                            fVar208 = auVar138._4_4_;
                            fVar209 = auVar138._8_4_;
                            fVar210 = auVar138._12_4_;
                            auVar138 = vshufps_avx(auVar257,auVar257,0);
                            auVar186 = vshufps_avx(ZEXT416((uint)fVar377),ZEXT416((uint)fVar377),0);
                            auVar38 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
                            auVar228._0_4_ =
                                 ((auVar256._0_4_ * fVar178 + fVar211 * auVar160._0_4_) * fVar178 +
                                 fVar211 * (auVar160._0_4_ * fVar178 + fVar211 * auVar137._0_4_)) *
                                 3.0;
                            auVar228._4_4_ =
                                 ((auVar256._4_4_ * fVar208 + fVar212 * auVar160._4_4_) * fVar208 +
                                 fVar212 * (auVar160._4_4_ * fVar208 + fVar212 * auVar137._4_4_)) *
                                 3.0;
                            auVar228._8_4_ =
                                 ((auVar256._8_4_ * fVar209 + fVar233 * auVar160._8_4_) * fVar209 +
                                 fVar233 * (auVar160._8_4_ * fVar209 + fVar233 * auVar137._8_4_)) *
                                 3.0;
                            auVar228._12_4_ =
                                 ((auVar256._12_4_ * fVar210 + fVar234 * auVar160._12_4_) * fVar210
                                 + fVar234 * (auVar160._12_4_ * fVar210 + fVar234 * auVar137._12_4_)
                                 ) * 3.0;
                            auVar256 = vshufps_avx(ZEXT416((uint)fVar368),ZEXT416((uint)fVar368),0);
                            auVar170._0_4_ =
                                 auVar256._0_4_ * (float)local_208._0_4_ +
                                 auVar38._0_4_ * (float)local_218._0_4_ +
                                 auVar138._0_4_ * (float)local_238._0_4_ +
                                 auVar186._0_4_ * (float)local_228._0_4_;
                            auVar170._4_4_ =
                                 auVar256._4_4_ * (float)local_208._4_4_ +
                                 auVar38._4_4_ * (float)local_218._4_4_ +
                                 auVar138._4_4_ * (float)local_238._4_4_ +
                                 auVar186._4_4_ * (float)local_228._4_4_;
                            auVar170._8_4_ =
                                 auVar256._8_4_ * fStack_200 +
                                 auVar38._8_4_ * fStack_210 +
                                 auVar138._8_4_ * fStack_230 + auVar186._8_4_ * fStack_220;
                            auVar170._12_4_ =
                                 auVar256._12_4_ * fStack_1fc +
                                 auVar38._12_4_ * fStack_20c +
                                 auVar138._12_4_ * fStack_22c + auVar186._12_4_ * fStack_21c;
                            auVar138 = vshufps_avx(auVar228,auVar228,0xc9);
                            auVar197._0_4_ = auVar170._0_4_ * auVar138._0_4_;
                            auVar197._4_4_ = auVar170._4_4_ * auVar138._4_4_;
                            auVar197._8_4_ = auVar170._8_4_ * auVar138._8_4_;
                            auVar197._12_4_ = auVar170._12_4_ * auVar138._12_4_;
                            auVar138 = vshufps_avx(auVar170,auVar170,0xc9);
                            auVar171._0_4_ = auVar228._0_4_ * auVar138._0_4_;
                            auVar171._4_4_ = auVar228._4_4_ * auVar138._4_4_;
                            auVar171._8_4_ = auVar228._8_4_ * auVar138._8_4_;
                            auVar171._12_4_ = auVar228._12_4_ * auVar138._12_4_;
                            auVar186 = vsubps_avx(auVar171,auVar197);
                            auVar138 = vshufps_avx(auVar186,auVar186,0xe9);
                            local_268 = vmovlps_avx(auVar138);
                            local_260 = auVar186._0_4_;
                            local_25c = vmovlps_avx(auVar10);
                            local_254 = (int)local_2e0;
                            local_250 = uVar90;
                            local_24c = context->user->instID[0];
                            local_248 = context->user->instPrimID[0];
                            ray->tfar = fVar152;
                            local_46c = -1;
                            local_2c8.valid = &local_46c;
                            local_2c8.geometryUserPtr = pGVar24->userPtr;
                            local_2c8.context = context->user;
                            local_2c8.hit = (RTCHitN *)&local_268;
                            local_2c8.N = 1;
                            stack0xfffffffffffffc4c = auVar31._4_28_;
                            local_3b8._0_4_ = fVar206;
                            local_2c8.ray = (RTCRayN *)ray;
                            if (pGVar24->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01207297:
                              p_Var29 = context->args->filter;
                              if (p_Var29 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar24->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var29)(&local_2c8);
                                  fVar206 = (float)local_3b8._0_4_;
                                }
                                if (*local_2c8.valid == 0) {
                                  bVar87 = false;
                                  goto LAB_0120737a;
                                }
                              }
                              bVar87 = true;
                            }
                            else {
                              (*pGVar24->occlusionFilterN)(&local_2c8);
                              fVar206 = (float)local_3b8._0_4_;
                              if (*local_2c8.valid != 0) goto LAB_01207297;
                              bVar87 = false;
                            }
LAB_0120737a:
                            auVar138 = _local_3d8;
                            if (!bVar87) {
                              ray->tfar = fVar206;
                            }
                          }
                          _local_3d8 = auVar138;
                          bVar86 = (bool)(bVar86 | bVar87);
                          pre = local_2d8;
                          auVar98 = local_428;
                          auVar186 = _local_3d8;
                        }
                      }
                    }
                    break;
                  }
                  lVar96 = lVar96 + -1;
                } while (lVar96 != 0);
              }
              goto LAB_01207017;
            }
          }
          goto LAB_0120734a;
        }
      }
LAB_01207017:
      _local_3d8 = auVar186;
      auVar138 = _local_3d8;
    } while (bVar77);
    _local_3d8 = auVar138;
    local_1f8 = vinsertps_avx(_local_3d8,ZEXT416((uint)local_448._0_4_),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }